

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  uint uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  uint uVar86;
  long lVar87;
  long lVar88;
  undefined4 uVar89;
  undefined8 unaff_R13;
  uint uVar90;
  uint uVar91;
  bool bVar92;
  float fVar93;
  vint4 bi_2;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  vint4 ai;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar147;
  undefined1 auVar132 [32];
  float fVar145;
  float fVar146;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar148;
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar165;
  float fVar169;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar155 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar163;
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar162 [64];
  vint4 bi_1;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar211;
  float fVar212;
  vint4 bi;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar215;
  float fVar216;
  undefined1 auVar204 [28];
  undefined1 auVar205 [32];
  float fVar213;
  float fVar214;
  float fVar217;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar218;
  float fVar234;
  float fVar235;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [28];
  float fVar237;
  float fVar238;
  undefined1 auVar226 [32];
  float fVar236;
  float fVar239;
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar240;
  float fVar241;
  float fVar251;
  float fVar253;
  vint4 ai_1;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar255;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar252;
  float fVar254;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar248 [28];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar260;
  float fVar270;
  float fVar271;
  vint4 ai_2;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar274;
  undefined1 auVar263 [16];
  undefined1 auVar264 [28];
  float fVar272;
  float fVar273;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar283 [16];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [64];
  float s;
  float fVar294;
  float fVar296;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  float fVar288;
  float fVar289;
  float fVar295;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar310;
  float fVar311;
  float fVar315;
  float fVar317;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float fVar316;
  float fVar318;
  float fVar319;
  float fVar320;
  undefined1 auVar314 [16];
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar335;
  float fVar336;
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar337;
  float fVar341;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar334 [64];
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar349;
  float fVar352;
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar350;
  float fVar351;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  float fVar368;
  float fVar371;
  float fVar372;
  undefined1 auVar369 [16];
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  undefined1 auVar370 [32];
  undefined1 auVar377 [16];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  float fVar380;
  float fVar382;
  float fVar383;
  float fVar384;
  undefined1 auVar381 [16];
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c88;
  float local_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_be4;
  undefined1 local_bc0 [8];
  float fStack_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float fStack_ba8;
  float local_b40;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  float local_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float local_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  RTCFilterFunctionNArguments local_aa0;
  undefined1 (*local_a70) [16];
  ulong local_a68;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 auStack_a30 [16];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  float local_980;
  float fStack_97c;
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  Primitive *local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  RTCHitN local_7e0 [16];
  undefined1 auStack_7d0 [16];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  undefined8 local_790;
  undefined8 uStack_788;
  undefined1 local_780 [16];
  uint local_770;
  uint uStack_76c;
  uint uStack_768;
  uint uStack_764;
  undefined1 auStack_760 [16];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined4 uStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  
  PVar8 = prim[1];
  uVar83 = (ulong)(byte)PVar8;
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  lVar87 = uVar83 * 0x25;
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xf + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + 6)));
  auVar178 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x11 + 6)));
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1a + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1b + 6)));
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1c + 6)));
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar260 = *(float *)(prim + lVar87 + 0x12);
  auVar14 = vsubps_avx(auVar14,*(undefined1 (*) [16])(prim + lVar87 + 6));
  auVar191._0_4_ = fVar260 * auVar14._0_4_;
  auVar191._4_4_ = fVar260 * auVar14._4_4_;
  auVar191._8_4_ = fVar260 * auVar14._8_4_;
  auVar191._12_4_ = fVar260 * auVar14._12_4_;
  auVar94._0_4_ = fVar260 * auVar15._0_4_;
  auVar94._4_4_ = fVar260 * auVar15._4_4_;
  auVar94._8_4_ = fVar260 * auVar15._8_4_;
  auVar94._12_4_ = fVar260 * auVar15._12_4_;
  auVar120 = vcvtdq2ps_avx(auVar17);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar175 = vcvtdq2ps_avx(auVar175);
  auVar14 = vshufps_avx(auVar94,auVar94,0);
  auVar15 = vshufps_avx(auVar94,auVar94,0x55);
  auVar17 = vshufps_avx(auVar94,auVar94,0xaa);
  fVar260 = auVar17._0_4_;
  fVar145 = auVar17._4_4_;
  fVar315 = auVar17._8_4_;
  fVar271 = auVar17._12_4_;
  fVar310 = auVar15._0_4_;
  fVar270 = auVar15._4_4_;
  fVar149 = auVar15._8_4_;
  fVar317 = auVar15._12_4_;
  fVar93 = auVar14._0_4_;
  fVar274 = auVar14._4_4_;
  fVar319 = auVar14._8_4_;
  fVar212 = auVar14._12_4_;
  auVar261._0_4_ = fVar93 * auVar120._0_4_ + auVar18._0_4_ * fVar310 + auVar19._0_4_ * fVar260;
  auVar261._4_4_ = fVar274 * auVar120._4_4_ + auVar18._4_4_ * fVar270 + auVar19._4_4_ * fVar145;
  auVar261._8_4_ = fVar319 * auVar120._8_4_ + auVar18._8_4_ * fVar149 + auVar19._8_4_ * fVar315;
  auVar261._12_4_ = fVar212 * auVar120._12_4_ + auVar18._12_4_ * fVar317 + auVar19._12_4_ * fVar271;
  auVar242._0_4_ = auVar21._0_4_ * fVar310 + auVar178._0_4_ * fVar260 + fVar93 * auVar20._0_4_;
  auVar242._4_4_ = auVar21._4_4_ * fVar270 + auVar178._4_4_ * fVar145 + fVar274 * auVar20._4_4_;
  auVar242._8_4_ = auVar21._8_4_ * fVar149 + auVar178._8_4_ * fVar315 + fVar319 * auVar20._8_4_;
  auVar242._12_4_ = auVar21._12_4_ * fVar317 + auVar178._12_4_ * fVar271 + fVar212 * auVar20._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar94 = vpmovsxwd_avx(auVar14);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar312._0_4_ = fVar93 * auVar100._0_4_ + fVar310 * auVar195._0_4_ + auVar175._0_4_ * fVar260;
  auVar312._4_4_ = fVar274 * auVar100._4_4_ + fVar270 * auVar195._4_4_ + auVar175._4_4_ * fVar145;
  auVar312._8_4_ = fVar319 * auVar100._8_4_ + fVar149 * auVar195._8_4_ + auVar175._8_4_ * fVar315;
  auVar312._12_4_ =
       fVar212 * auVar100._12_4_ + fVar317 * auVar195._12_4_ + auVar175._12_4_ * fVar271;
  auVar14 = vshufps_avx(auVar191,auVar191,0xaa);
  fVar260 = auVar14._0_4_;
  fVar145 = auVar14._4_4_;
  fVar315 = auVar14._8_4_;
  fVar271 = auVar14._12_4_;
  auVar14 = vshufps_avx(auVar191,auVar191,0x55);
  fVar310 = auVar14._0_4_;
  fVar270 = auVar14._4_4_;
  fVar149 = auVar14._8_4_;
  fVar317 = auVar14._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar95 = vpmovsxwd_avx(auVar15);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar96 = vpmovsxwd_avx(auVar17);
  auVar14 = vshufps_avx(auVar191,auVar191,0);
  fVar93 = auVar14._0_4_;
  fVar274 = auVar14._4_4_;
  fVar319 = auVar14._8_4_;
  fVar212 = auVar14._12_4_;
  auVar192._0_4_ = auVar18._0_4_ * fVar310 + auVar19._0_4_ * fVar260 + fVar93 * auVar120._0_4_;
  auVar192._4_4_ = auVar18._4_4_ * fVar270 + auVar19._4_4_ * fVar145 + fVar274 * auVar120._4_4_;
  auVar192._8_4_ = auVar18._8_4_ * fVar149 + auVar19._8_4_ * fVar315 + fVar319 * auVar120._8_4_;
  auVar192._12_4_ = auVar18._12_4_ * fVar317 + auVar19._12_4_ * fVar271 + fVar212 * auVar120._12_4_;
  auVar170._0_4_ = auVar21._0_4_ * fVar310 + auVar178._0_4_ * fVar260 + fVar93 * auVar20._0_4_;
  auVar170._4_4_ = auVar21._4_4_ * fVar270 + auVar178._4_4_ * fVar145 + fVar274 * auVar20._4_4_;
  auVar170._8_4_ = auVar21._8_4_ * fVar149 + auVar178._8_4_ * fVar315 + fVar319 * auVar20._8_4_;
  auVar170._12_4_ = auVar21._12_4_ * fVar317 + auVar178._12_4_ * fVar271 + fVar212 * auVar20._12_4_;
  auVar377._8_4_ = 0x7fffffff;
  auVar377._0_8_ = 0x7fffffff7fffffff;
  auVar377._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx(auVar377,auVar261);
  auVar326._8_4_ = 0x219392ef;
  auVar326._0_8_ = 0x219392ef219392ef;
  auVar326._12_4_ = 0x219392ef;
  auVar14 = vcmpps_avx(auVar14,auVar326,1);
  auVar15 = vblendvps_avx(auVar261,auVar326,auVar14);
  auVar14 = vandps_avx(auVar377,auVar242);
  auVar14 = vcmpps_avx(auVar14,auVar326,1);
  auVar17 = vblendvps_avx(auVar242,auVar326,auVar14);
  auVar14 = vandps_avx(auVar312,auVar377);
  auVar14 = vcmpps_avx(auVar14,auVar326,1);
  auVar14 = vblendvps_avx(auVar312,auVar326,auVar14);
  auVar219._0_4_ = fVar310 * auVar195._0_4_ + auVar175._0_4_ * fVar260 + auVar100._0_4_ * fVar93;
  auVar219._4_4_ = fVar270 * auVar195._4_4_ + auVar175._4_4_ * fVar145 + auVar100._4_4_ * fVar274;
  auVar219._8_4_ = fVar149 * auVar195._8_4_ + auVar175._8_4_ * fVar315 + auVar100._8_4_ * fVar319;
  auVar219._12_4_ =
       fVar317 * auVar195._12_4_ + auVar175._12_4_ * fVar271 + auVar100._12_4_ * fVar212;
  auVar120 = vrcpps_avx(auVar15);
  fVar240 = auVar120._0_4_;
  auVar243._0_4_ = fVar240 * auVar15._0_4_;
  fVar251 = auVar120._4_4_;
  auVar243._4_4_ = fVar251 * auVar15._4_4_;
  fVar253 = auVar120._8_4_;
  auVar243._8_4_ = fVar253 * auVar15._8_4_;
  fVar255 = auVar120._12_4_;
  auVar243._12_4_ = fVar255 * auVar15._12_4_;
  auVar327._8_4_ = 0x3f800000;
  auVar327._0_8_ = 0x3f8000003f800000;
  auVar327._12_4_ = 0x3f800000;
  auVar15 = vsubps_avx(auVar327,auVar243);
  fVar240 = fVar240 + fVar240 * auVar15._0_4_;
  fVar251 = fVar251 + fVar251 * auVar15._4_4_;
  fVar253 = fVar253 + fVar253 * auVar15._8_4_;
  fVar255 = fVar255 + fVar255 * auVar15._12_4_;
  auVar15 = vrcpps_avx(auVar17);
  fVar260 = auVar15._0_4_;
  auVar262._0_4_ = auVar17._0_4_ * fVar260;
  fVar270 = auVar15._4_4_;
  auVar262._4_4_ = auVar17._4_4_ * fVar270;
  fVar271 = auVar15._8_4_;
  auVar262._8_4_ = auVar17._8_4_ * fVar271;
  fVar274 = auVar15._12_4_;
  auVar262._12_4_ = auVar17._12_4_ * fVar274;
  auVar15 = vsubps_avx(auVar327,auVar262);
  fVar260 = fVar260 + fVar260 * auVar15._0_4_;
  fVar270 = fVar270 + fVar270 * auVar15._4_4_;
  fVar271 = fVar271 + fVar271 * auVar15._8_4_;
  fVar274 = fVar274 + fVar274 * auVar15._12_4_;
  auVar15 = vrcpps_avx(auVar14);
  fVar310 = auVar15._0_4_;
  auVar313._0_4_ = auVar14._0_4_ * fVar310;
  fVar315 = auVar15._4_4_;
  auVar313._4_4_ = auVar14._4_4_ * fVar315;
  fVar317 = auVar15._8_4_;
  auVar313._8_4_ = auVar14._8_4_ * fVar317;
  fVar319 = auVar15._12_4_;
  auVar313._12_4_ = auVar14._12_4_ * fVar319;
  auVar14 = vsubps_avx(auVar327,auVar313);
  fVar310 = auVar14._0_4_ * fVar310 + fVar310;
  fVar315 = auVar14._4_4_ * fVar315 + fVar315;
  fVar317 = auVar14._8_4_ * fVar317 + fVar317;
  fVar319 = auVar14._12_4_ * fVar319 + fVar319;
  auVar17 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) -
                                         *(float *)(prim + lVar87 + 0x16)) *
                                        *(float *)(prim + lVar87 + 0x1a))),0);
  auVar14 = vcvtdq2ps_avx(auVar94);
  auVar15 = vcvtdq2ps_avx(auVar95);
  auVar15 = vsubps_avx(auVar15,auVar14);
  fVar145 = auVar17._0_4_;
  fVar149 = auVar17._4_4_;
  fVar93 = auVar17._8_4_;
  fVar212 = auVar17._12_4_;
  auVar118._0_4_ = auVar15._0_4_ * fVar145 + auVar14._0_4_;
  auVar118._4_4_ = auVar15._4_4_ * fVar149 + auVar14._4_4_;
  auVar118._8_4_ = auVar15._8_4_ * fVar93 + auVar14._8_4_;
  auVar118._12_4_ = auVar15._12_4_ * fVar212 + auVar14._12_4_;
  auVar14 = vcvtdq2ps_avx(auVar96);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + uVar83 * 0xd + 6);
  auVar15 = vpmovsxwd_avx(auVar120);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar283._0_4_ = auVar15._0_4_ * fVar145 + auVar14._0_4_;
  auVar283._4_4_ = auVar15._4_4_ * fVar149 + auVar14._4_4_;
  auVar283._8_4_ = auVar15._8_4_ * fVar93 + auVar14._8_4_;
  auVar283._12_4_ = auVar15._12_4_ * fVar212 + auVar14._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar83 * 0x12 + 6);
  auVar14 = vpmovsxwd_avx(auVar18);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar83 * 0x16 + 6);
  auVar15 = vpmovsxwd_avx(auVar19);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar17 = vsubps_avx(auVar15,auVar14);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar83 * 0x14 + 6);
  auVar15 = vpmovsxwd_avx(auVar20);
  auVar290._0_4_ = auVar17._0_4_ * fVar145 + auVar14._0_4_;
  auVar290._4_4_ = auVar17._4_4_ * fVar149 + auVar14._4_4_;
  auVar290._8_4_ = auVar17._8_4_ * fVar93 + auVar14._8_4_;
  auVar290._12_4_ = auVar17._12_4_ * fVar212 + auVar14._12_4_;
  auVar14 = vcvtdq2ps_avx(auVar15);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar83 * 0x18 + 6);
  auVar15 = vpmovsxwd_avx(auVar21);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar328._0_4_ = auVar15._0_4_ * fVar145 + auVar14._0_4_;
  auVar328._4_4_ = auVar15._4_4_ * fVar149 + auVar14._4_4_;
  auVar328._8_4_ = auVar15._8_4_ * fVar93 + auVar14._8_4_;
  auVar328._12_4_ = auVar15._12_4_ * fVar212 + auVar14._12_4_;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *(ulong *)(prim + uVar83 * 0x1d + 6);
  auVar14 = vpmovsxwd_avx(auVar178);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + uVar83 * 0x21 + 6);
  auVar15 = vpmovsxwd_avx(auVar195);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar345._0_4_ = auVar15._0_4_ * fVar145 + auVar14._0_4_;
  auVar345._4_4_ = auVar15._4_4_ * fVar149 + auVar14._4_4_;
  auVar345._8_4_ = auVar15._8_4_ * fVar93 + auVar14._8_4_;
  auVar345._12_4_ = auVar15._12_4_ * fVar212 + auVar14._12_4_;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + uVar83 * 0x1f + 6);
  auVar14 = vpmovsxwd_avx(auVar175);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar83 * 0x23 + 6);
  auVar15 = vpmovsxwd_avx(auVar100);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar95._0_4_ = auVar14._0_4_ + auVar15._0_4_ * fVar145;
  auVar95._4_4_ = auVar14._4_4_ + auVar15._4_4_ * fVar149;
  auVar95._8_4_ = auVar14._8_4_ + auVar15._8_4_ * fVar93;
  auVar95._12_4_ = auVar14._12_4_ + auVar15._12_4_ * fVar212;
  auVar14 = vsubps_avx(auVar118,auVar192);
  auVar102._0_4_ = fVar240 * auVar14._0_4_;
  auVar102._4_4_ = fVar251 * auVar14._4_4_;
  auVar102._8_4_ = fVar253 * auVar14._8_4_;
  auVar102._12_4_ = fVar255 * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar283,auVar192);
  auVar193._0_4_ = fVar240 * auVar14._0_4_;
  auVar193._4_4_ = fVar251 * auVar14._4_4_;
  auVar193._8_4_ = fVar253 * auVar14._8_4_;
  auVar193._12_4_ = fVar255 * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar290,auVar170);
  auVar244._0_4_ = fVar260 * auVar14._0_4_;
  auVar244._4_4_ = fVar270 * auVar14._4_4_;
  auVar244._8_4_ = fVar271 * auVar14._8_4_;
  auVar244._12_4_ = fVar274 * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar328,auVar170);
  auVar171._0_4_ = fVar260 * auVar14._0_4_;
  auVar171._4_4_ = fVar270 * auVar14._4_4_;
  auVar171._8_4_ = fVar271 * auVar14._8_4_;
  auVar171._12_4_ = fVar274 * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar345,auVar219);
  auVar263._0_4_ = fVar310 * auVar14._0_4_;
  auVar263._4_4_ = fVar315 * auVar14._4_4_;
  auVar263._8_4_ = fVar317 * auVar14._8_4_;
  auVar263._12_4_ = fVar319 * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar95,auVar219);
  auVar96._0_4_ = fVar310 * auVar14._0_4_;
  auVar96._4_4_ = fVar315 * auVar14._4_4_;
  auVar96._8_4_ = fVar317 * auVar14._8_4_;
  auVar96._12_4_ = fVar319 * auVar14._12_4_;
  auVar14 = vpminsd_avx(auVar102,auVar193);
  auVar15 = vpminsd_avx(auVar244,auVar171);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vpminsd_avx(auVar263,auVar96);
  uVar89 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar291._4_4_ = uVar89;
  auVar291._0_4_ = uVar89;
  auVar291._8_4_ = uVar89;
  auVar291._12_4_ = uVar89;
  auVar15 = vmaxps_avx(auVar15,auVar291);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  local_660._0_4_ = auVar14._0_4_ * 0.99999964;
  local_660._4_4_ = auVar14._4_4_ * 0.99999964;
  local_660._8_4_ = auVar14._8_4_ * 0.99999964;
  local_660._12_4_ = auVar14._12_4_ * 0.99999964;
  auVar14 = vpmaxsd_avx(auVar102,auVar193);
  auVar15 = vpmaxsd_avx(auVar244,auVar171);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar15 = vpmaxsd_avx(auVar263,auVar96);
  uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar172._4_4_ = uVar89;
  auVar172._0_4_ = uVar89;
  auVar172._8_4_ = uVar89;
  auVar172._12_4_ = uVar89;
  auVar15 = vminps_avx(auVar15,auVar172);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar97._0_4_ = auVar14._0_4_ * 1.0000004;
  auVar97._4_4_ = auVar14._4_4_ * 1.0000004;
  auVar97._8_4_ = auVar14._8_4_ * 1.0000004;
  auVar97._12_4_ = auVar14._12_4_ * 1.0000004;
  auVar14 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar15 = vpcmpgtd_avx(auVar14,_DAT_01f4ad30);
  auVar14 = vcmpps_avx(local_660,auVar97,2);
  auVar14 = vandps_avx(auVar14,auVar15);
  auVar132._16_16_ = mm_lookupmask_ps._240_16_;
  auVar132._0_16_ = mm_lookupmask_ps._240_16_;
  uVar89 = vmovmskps_avx(auVar14);
  uVar83 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar89);
  local_5c0 = vblendps_avx(auVar132,ZEXT832(0) << 0x20,0x80);
  local_a70 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_908 = prim;
LAB_00927260:
  auVar108._8_4_ = 0x7fffffff;
  auVar108._0_8_ = 0x7fffffff7fffffff;
  auVar108._12_4_ = 0x7fffffff;
  auVar108._16_4_ = 0x7fffffff;
  auVar108._20_4_ = 0x7fffffff;
  auVar108._24_4_ = 0x7fffffff;
  auVar108._28_4_ = 0x7fffffff;
  if (uVar83 == 0) {
    return;
  }
  lVar87 = 0;
  if (uVar83 != 0) {
    for (; (uVar83 >> lVar87 & 1) == 0; lVar87 = lVar87 + 1) {
    }
  }
  uVar86 = *(uint *)(local_908 + 2);
  local_a68 = (ulong)*(uint *)(local_908 + lVar87 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar86].ptr;
  uVar84 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           local_a68 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar260 = (pGVar9->time_range).lower;
  fVar260 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar260) / ((pGVar9->time_range).upper - fVar260));
  auVar14 = vroundss_avx(ZEXT416((uint)fVar260),ZEXT416((uint)fVar260),9);
  auVar14 = vminss_avx(auVar14,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar14 = vmaxss_avx(ZEXT816(0) << 0x20,auVar14);
  fVar260 = fVar260 - auVar14._0_4_;
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar88 = (long)(int)auVar14._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar88);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar88);
  auVar14 = vshufps_avx(ZEXT416((uint)(1.0 - fVar260)),ZEXT416((uint)(1.0 - fVar260)),0);
  pfVar1 = (float *)(lVar11 + lVar12 * uVar84);
  fVar315 = auVar14._0_4_;
  fVar149 = auVar14._4_4_;
  fVar271 = auVar14._8_4_;
  fVar317 = auVar14._12_4_;
  pfVar2 = (float *)(lVar11 + lVar12 * (uVar84 + 1));
  pfVar3 = (float *)(lVar11 + lVar12 * (uVar84 + 2));
  pfVar4 = (float *)(lVar11 + lVar12 * (uVar84 + 3));
  lVar11 = *(long *)(_Var10 + 0x38 + lVar88);
  lVar12 = *(long *)(_Var10 + 0x48 + lVar88);
  auVar14 = vshufps_avx(ZEXT416((uint)fVar260),ZEXT416((uint)fVar260),0);
  pfVar5 = (float *)(lVar11 + uVar84 * lVar12);
  fVar93 = auVar14._0_4_;
  fVar274 = auVar14._4_4_;
  fVar319 = auVar14._8_4_;
  fVar212 = auVar14._12_4_;
  pfVar6 = (float *)(lVar11 + (uVar84 + 1) * lVar12);
  pfVar7 = (float *)(lVar11 + (uVar84 + 2) * lVar12);
  auVar194._0_4_ = fVar93 * *pfVar5 + fVar315 * *pfVar1;
  auVar194._4_4_ = fVar274 * pfVar5[1] + fVar149 * pfVar1[1];
  auVar194._8_4_ = fVar319 * pfVar5[2] + fVar271 * pfVar1[2];
  auVar194._12_4_ = fVar212 * pfVar5[3] + fVar317 * pfVar1[3];
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar15 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar260 = *(float *)(ray + k * 4 + 0x40);
  auVar346._4_4_ = fVar260;
  auVar346._0_4_ = fVar260;
  auVar346._8_4_ = fVar260;
  auVar346._12_4_ = fVar260;
  fStack_8d0 = fVar260;
  _local_8e0 = auVar346;
  fStack_8cc = fVar260;
  fStack_8c8 = fVar260;
  fStack_8c4 = fVar260;
  fVar310 = *(float *)(ray + k * 4 + 0x50);
  auVar369._4_4_ = fVar310;
  auVar369._0_4_ = fVar310;
  auVar369._8_4_ = fVar310;
  auVar369._12_4_ = fVar310;
  fStack_710 = fVar310;
  _local_720 = auVar369;
  fStack_70c = fVar310;
  fStack_708 = fVar310;
  fStack_704 = fVar310;
  auVar220._0_4_ = fVar315 * *pfVar2 + fVar93 * *pfVar6;
  auVar220._4_4_ = fVar149 * pfVar2[1] + fVar274 * pfVar6[1];
  auVar220._8_4_ = fVar271 * pfVar2[2] + fVar319 * pfVar6[2];
  auVar220._12_4_ = fVar317 * pfVar2[3] + fVar212 * pfVar6[3];
  auVar14 = vunpcklps_avx(auVar346,auVar369);
  fVar145 = *(float *)(ray + k * 4 + 0x60);
  auVar381._4_4_ = fVar145;
  auVar381._0_4_ = fVar145;
  auVar381._8_4_ = fVar145;
  auVar381._12_4_ = fVar145;
  fStack_730 = fVar145;
  _local_740 = auVar381;
  fStack_72c = fVar145;
  fStack_728 = fVar145;
  fStack_724 = fVar145;
  _local_9b0 = vinsertps_avx(auVar14,auVar381,0x28);
  auVar98._0_4_ = (auVar194._0_4_ + auVar220._0_4_) * 0.5;
  auVar98._4_4_ = (auVar194._4_4_ + auVar220._4_4_) * 0.5;
  auVar98._8_4_ = (auVar194._8_4_ + auVar220._8_4_) * 0.5;
  auVar98._12_4_ = (auVar194._12_4_ + auVar220._12_4_) * 0.5;
  auVar14 = vsubps_avx(auVar98,auVar15);
  auVar14 = vdpps_avx(auVar14,_local_9b0,0x7f);
  local_9c0 = vdpps_avx(_local_9b0,_local_9b0,0x7f);
  auVar334 = ZEXT1664(local_9c0);
  auVar173._0_4_ = fVar315 * *pfVar3 + fVar93 * *pfVar7;
  auVar173._4_4_ = fVar149 * pfVar3[1] + fVar274 * pfVar7[1];
  auVar173._8_4_ = fVar271 * pfVar3[2] + fVar319 * pfVar7[2];
  auVar173._12_4_ = fVar317 * pfVar3[3] + fVar212 * pfVar7[3];
  auVar17 = vrcpss_avx(local_9c0,local_9c0);
  fVar270 = auVar14._0_4_ * auVar17._0_4_ * (2.0 - local_9c0._0_4_ * auVar17._0_4_);
  auVar17 = vshufps_avx(ZEXT416((uint)fVar270),ZEXT416((uint)fVar270),0);
  auVar245._0_4_ = auVar15._0_4_ + local_9b0._0_4_ * auVar17._0_4_;
  auVar245._4_4_ = auVar15._4_4_ + local_9b0._4_4_ * auVar17._4_4_;
  auVar245._8_4_ = auVar15._8_4_ + local_9b0._8_4_ * auVar17._8_4_;
  auVar245._12_4_ = auVar15._12_4_ + local_9b0._12_4_ * auVar17._12_4_;
  auVar14 = vblendps_avx(auVar245,_DAT_01f45a50,8);
  auVar18 = vsubps_avx(auVar194,auVar14);
  auVar287 = ZEXT1664(auVar18);
  auVar19 = vsubps_avx(auVar173,auVar14);
  pfVar1 = (float *)(lVar11 + lVar12 * (uVar84 + 3));
  auVar119._0_4_ = fVar315 * *pfVar4 + fVar93 * *pfVar1;
  auVar119._4_4_ = fVar149 * pfVar4[1] + fVar274 * pfVar1[1];
  auVar119._8_4_ = fVar271 * pfVar4[2] + fVar319 * pfVar1[2];
  auVar119._12_4_ = fVar317 * pfVar4[3] + fVar212 * pfVar1[3];
  auVar20 = vsubps_avx(auVar220,auVar14);
  auVar21 = vsubps_avx(auVar119,auVar14);
  auVar14 = vshufps_avx(auVar18,auVar18,0);
  register0x00001250 = auVar14;
  _local_4a0 = auVar14;
  auVar14 = vshufps_avx(auVar18,auVar18,0x55);
  register0x00001250 = auVar14;
  _local_1e0 = auVar14;
  auVar14 = vshufps_avx(auVar18,auVar18,0xaa);
  register0x00001250 = auVar14;
  _local_200 = auVar14;
  auVar14 = vshufps_avx(auVar18,auVar18,0xff);
  register0x00001290 = auVar14;
  _local_220 = auVar14;
  auVar14 = vshufps_avx(auVar20,auVar20,0);
  register0x00001290 = auVar14;
  _local_4c0 = auVar14;
  auVar14 = vshufps_avx(auVar20,auVar20,0x55);
  register0x00001290 = auVar14;
  _local_4e0 = auVar14;
  auVar14 = vshufps_avx(auVar20,auVar20,0xaa);
  register0x00001290 = auVar14;
  _local_500 = auVar14;
  auVar14 = vshufps_avx(auVar20,auVar20,0xff);
  register0x00001290 = auVar14;
  _local_520 = auVar14;
  auVar14 = vshufps_avx(auVar19,auVar19,0);
  auVar15 = vshufps_avx(auVar19,auVar19,0x55);
  register0x00001290 = auVar15;
  _local_540 = auVar15;
  auVar15 = vshufps_avx(auVar19,auVar19,0xaa);
  register0x00001290 = auVar15;
  _local_560 = auVar15;
  auVar15 = vshufps_avx(auVar19,auVar19,0xff);
  register0x00001290 = auVar15;
  _local_580 = auVar15;
  auVar15 = vshufps_avx(auVar21,auVar21,0);
  local_320._16_16_ = auVar15;
  local_320._0_16_ = auVar15;
  auVar15 = vshufps_avx(auVar21,auVar21,0x55);
  auVar120 = vshufps_avx(auVar21,auVar21,0xaa);
  register0x00001290 = auVar120;
  _local_5a0 = auVar120;
  auVar120 = vshufps_avx(auVar21,auVar21,0xff);
  register0x00001290 = auVar120;
  _local_240 = auVar120;
  auVar120 = ZEXT416((uint)(fVar260 * fVar260 + fVar310 * fVar310 + fVar145 * fVar145));
  auVar120 = vshufps_avx(auVar120,auVar120,0);
  local_260._16_16_ = auVar120;
  local_260._0_16_ = auVar120;
  fVar260 = *(float *)(ray + k * 4 + 0x30);
  local_930 = ZEXT416((uint)fVar270);
  auVar120 = vshufps_avx(ZEXT416((uint)(fVar260 - fVar270)),ZEXT416((uint)(fVar260 - fVar270)),0);
  local_340._16_16_ = auVar120;
  local_340._0_16_ = auVar120;
  local_7f0 = vpshufd_avx(ZEXT416(uVar86),0);
  local_800 = vpshufd_avx(ZEXT416(*(uint *)(local_908 + lVar87 * 4 + 6)),0);
  register0x00001210 = auVar17;
  _local_9a0 = auVar17;
  uVar90 = 0;
  local_c88 = 1;
  local_600 = vandps_avx(auVar108,local_260);
  auVar17 = vsqrtss_avx(local_9c0,local_9c0);
  auVar120 = vsqrtss_avx(local_9c0,local_9c0);
  auVar162 = ZEXT1664(ZEXT816(0x3f80000000000000));
  do {
    auVar226._8_4_ = 0x3f800000;
    auVar226._0_8_ = 0x3f8000003f800000;
    auVar226._12_4_ = 0x3f800000;
    auVar226._16_4_ = 0x3f800000;
    auVar226._20_4_ = 0x3f800000;
    auVar226._24_4_ = 0x3f800000;
    auVar226._28_4_ = 0x3f800000;
    local_650 = auVar162._0_16_;
    auVar178 = vmovshdup_avx(local_650);
    auVar175 = vsubps_avx(auVar178,local_650);
    auVar178 = vshufps_avx(local_650,local_650,0);
    local_820._16_16_ = auVar178;
    local_820._0_16_ = auVar178;
    auVar195 = vshufps_avx(auVar175,auVar175,0);
    local_840._16_16_ = auVar195;
    local_840._0_16_ = auVar195;
    fVar213 = auVar195._0_4_;
    fVar214 = auVar195._4_4_;
    fVar215 = auVar195._8_4_;
    fVar216 = auVar195._12_4_;
    fVar147 = auVar178._0_4_;
    auVar186._0_4_ = fVar147 + fVar213 * 0.0;
    fVar190 = auVar178._4_4_;
    auVar186._4_4_ = fVar190 + fVar214 * 0.14285715;
    fVar211 = auVar178._8_4_;
    auVar186._8_4_ = fVar211 + fVar215 * 0.2857143;
    fStack_a44 = auVar178._12_4_;
    auVar186._12_4_ = fStack_a44 + fVar216 * 0.42857146;
    auVar186._16_4_ = fVar147 + fVar213 * 0.5714286;
    auVar186._20_4_ = fVar190 + fVar214 * 0.71428573;
    auVar186._24_4_ = fVar211 + fVar215 * 0.8571429;
    auVar186._28_4_ = fStack_a44 + fVar216;
    auVar132 = vsubps_avx(auVar226,auVar186);
    local_a60._4_4_ = auVar186._4_4_ * auVar186._4_4_;
    local_a60._0_4_ = auVar186._0_4_ * auVar186._0_4_;
    fStack_a58 = auVar186._8_4_ * auVar186._8_4_;
    fStack_a54 = auVar186._12_4_ * auVar186._12_4_;
    fStack_a50 = auVar186._16_4_ * auVar186._16_4_;
    fStack_a4c = auVar186._20_4_ * auVar186._20_4_;
    fStack_a48 = auVar186._24_4_ * auVar186._24_4_;
    fVar274 = auVar186._0_4_ * 3.0;
    fVar319 = auVar186._4_4_ * 3.0;
    fVar212 = auVar186._8_4_ * 3.0;
    fVar240 = auVar186._12_4_ * 3.0;
    fVar251 = auVar186._16_4_ * 3.0;
    fVar253 = auVar186._20_4_ * 3.0;
    fVar255 = auVar186._24_4_ * 3.0;
    fVar310 = auVar132._0_4_;
    auVar162._0_4_ = fVar310 * fVar310;
    fVar145 = auVar132._4_4_;
    auVar162._4_4_ = fVar145 * fVar145;
    fVar270 = auVar132._8_4_;
    auVar162._8_4_ = fVar270 * fVar270;
    fVar315 = auVar132._12_4_;
    auVar162._12_4_ = fVar315 * fVar315;
    fVar149 = auVar132._16_4_;
    auVar162._16_4_ = fVar149 * fVar149;
    fVar271 = auVar132._20_4_;
    auVar162._20_4_ = fVar271 * fVar271;
    fVar317 = auVar132._24_4_;
    auVar162._28_36_ = auVar287._28_36_;
    auVar162._24_4_ = fVar317 * fVar317;
    fVar93 = auVar132._28_4_;
    fVar218 = (auVar162._0_4_ * (fVar310 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar234 = (auVar162._4_4_ * (fVar145 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar235 = (auVar162._8_4_ * (fVar270 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar236 = (auVar162._12_4_ * (fVar315 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar237 = (auVar162._16_4_ * (fVar149 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar238 = (auVar162._20_4_ * (fVar271 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar239 = (auVar162._24_4_ * (fVar317 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar288 = -fVar310 * auVar186._0_4_ * auVar186._0_4_ * 0.5;
    fVar294 = -fVar145 * auVar186._4_4_ * auVar186._4_4_ * 0.5;
    fVar296 = -fVar270 * auVar186._8_4_ * auVar186._8_4_ * 0.5;
    fVar298 = -fVar315 * auVar186._12_4_ * auVar186._12_4_ * 0.5;
    fVar300 = -fVar149 * auVar186._16_4_ * auVar186._16_4_ * 0.5;
    fVar303 = -fVar271 * auVar186._20_4_ * auVar186._20_4_ * 0.5;
    fVar306 = -fVar317 * auVar186._24_4_ * auVar186._24_4_ * 0.5;
    fVar302 = auVar15._0_4_;
    fVar305 = auVar15._4_4_;
    fVar308 = auVar15._8_4_;
    fVar146 = auVar15._12_4_;
    fVar217 = auVar14._0_4_;
    fVar383 = auVar14._4_4_;
    fVar386 = auVar14._8_4_;
    fVar389 = auVar14._12_4_;
    fVar324 = local_320._28_4_ + fVar389;
    fVar341 = auVar334._28_4_ + fVar389;
    fVar368 = (auVar186._0_4_ * auVar186._0_4_ * (fVar274 + -5.0) + 2.0) * 0.5;
    fVar371 = (auVar186._4_4_ * auVar186._4_4_ * (fVar319 + -5.0) + 2.0) * 0.5;
    fVar372 = (auVar186._8_4_ * auVar186._8_4_ * (fVar212 + -5.0) + 2.0) * 0.5;
    fVar373 = (auVar186._12_4_ * auVar186._12_4_ * (fVar240 + -5.0) + 2.0) * 0.5;
    fVar374 = (auVar186._16_4_ * auVar186._16_4_ * (fVar251 + -5.0) + 2.0) * 0.5;
    fVar375 = (auVar186._20_4_ * auVar186._20_4_ * (fVar253 + -5.0) + 2.0) * 0.5;
    fVar376 = (auVar186._24_4_ * auVar186._24_4_ * (fVar255 + -5.0) + 2.0) * 0.5;
    fVar367 = -auVar186._28_4_;
    fVar342 = -auVar186._0_4_ * fVar310 * fVar310 * 0.5;
    fVar349 = -auVar186._4_4_ * fVar145 * fVar145 * 0.5;
    fVar352 = -auVar186._8_4_ * fVar270 * fVar270 * 0.5;
    fVar355 = -auVar186._12_4_ * fVar315 * fVar315 * 0.5;
    fVar358 = -auVar186._16_4_ * fVar149 * fVar149 * 0.5;
    fVar361 = -auVar186._20_4_ * fVar271 * fVar271 * 0.5;
    fVar364 = -auVar186._24_4_ * fVar317 * fVar317 * 0.5;
    local_980 = fVar342 * (float)local_4a0._0_4_ +
                fVar368 * (float)local_4c0._0_4_ + local_320._0_4_ * fVar288 + fVar217 * fVar218;
    fStack_97c = fVar349 * (float)local_4a0._4_4_ +
                 fVar371 * (float)local_4c0._4_4_ + local_320._4_4_ * fVar294 + fVar383 * fVar234;
    fStack_978 = fVar352 * fStack_498 +
                 fVar372 * fStack_4b8 + local_320._8_4_ * fVar296 + fVar386 * fVar235;
    fStack_974 = fVar355 * fStack_494 +
                 fVar373 * fStack_4b4 + local_320._12_4_ * fVar298 + fVar389 * fVar236;
    fStack_970 = fVar358 * fStack_490 +
                 fVar374 * fStack_4b0 + local_320._16_4_ * fVar300 + fVar217 * fVar237;
    fStack_96c = fVar361 * fStack_48c +
                 fVar375 * fStack_4ac + local_320._20_4_ * fVar303 + fVar383 * fVar238;
    fStack_968 = fVar364 * fStack_488 +
                 fVar376 * fStack_4a8 + local_320._24_4_ * fVar306 + fVar386 * fVar239;
    fStack_964 = fVar389 + 2.0 + -fVar93 + fVar324;
    fVar289 = (float)local_1e0._0_4_ * fVar342 +
              fVar368 * (float)local_4e0._0_4_ +
              fVar302 * fVar288 + fVar218 * (float)local_540._0_4_;
    fVar295 = (float)local_1e0._4_4_ * fVar349 +
              fVar371 * (float)local_4e0._4_4_ +
              fVar305 * fVar294 + fVar234 * (float)local_540._4_4_;
    fVar297 = fStack_1d8 * fVar352 + fVar372 * fStack_4d8 + fVar308 * fVar296 + fVar235 * fStack_538
    ;
    fVar299 = fStack_1d4 * fVar355 + fVar373 * fStack_4d4 + fVar146 * fVar298 + fVar236 * fStack_534
    ;
    fVar301 = fStack_1d0 * fVar358 + fVar374 * fStack_4d0 + fVar302 * fVar300 + fVar237 * fStack_530
    ;
    fVar304 = fStack_1cc * fVar361 + fVar375 * fStack_4cc + fVar305 * fVar303 + fVar238 * fStack_52c
    ;
    fVar307 = fStack_1c8 * fVar364 + fVar376 * fStack_4c8 + fVar308 * fVar306 + fVar239 * fStack_528
    ;
    fVar309 = fStack_964 + fVar324 + fVar341;
    fVar148 = (float)local_200._0_4_ * fVar342 +
              fVar368 * (float)local_500._0_4_ +
              fVar288 * (float)local_5a0._0_4_ + fVar218 * (float)local_560._0_4_;
    fVar163 = (float)local_200._4_4_ * fVar349 +
              fVar371 * (float)local_500._4_4_ +
              fVar294 * (float)local_5a0._4_4_ + fVar234 * (float)local_560._4_4_;
    fVar164 = fStack_1f8 * fVar352 +
              fVar372 * fStack_4f8 + fVar296 * fStack_598 + fVar235 * fStack_558;
    fVar165 = fStack_1f4 * fVar355 +
              fVar373 * fStack_4f4 + fVar298 * fStack_594 + fVar236 * fStack_554;
    fVar166 = fStack_1f0 * fVar358 +
              fVar374 * fStack_4f0 + fVar300 * fStack_590 + fVar237 * fStack_550;
    fVar167 = fStack_1ec * fVar361 +
              fVar375 * fStack_4ec + fVar303 * fStack_58c + fVar238 * fStack_54c;
    fVar168 = fStack_1e8 * fVar364 +
              fVar376 * fStack_4e8 + fVar306 * fStack_588 + fVar239 * fStack_548;
    fVar169 = fVar309 + fVar341 + fVar146 + fVar389;
    auVar227._0_4_ =
         (float)local_220._0_4_ * fVar342 +
         fVar368 * (float)local_520._0_4_ +
         fVar288 * (float)local_240._0_4_ + fVar218 * (float)local_580._0_4_;
    auVar227._4_4_ =
         (float)local_220._4_4_ * fVar349 +
         fVar371 * (float)local_520._4_4_ +
         fVar294 * (float)local_240._4_4_ + fVar234 * (float)local_580._4_4_;
    auVar227._8_4_ =
         fStack_218 * fVar352 + fVar372 * fStack_518 + fVar296 * fStack_238 + fVar235 * fStack_578;
    auVar227._12_4_ =
         fStack_214 * fVar355 + fVar373 * fStack_514 + fVar298 * fStack_234 + fVar236 * fStack_574;
    auVar227._16_4_ =
         fStack_210 * fVar358 + fVar374 * fStack_510 + fVar300 * fStack_230 + fVar237 * fStack_570;
    auVar227._20_4_ =
         fStack_20c * fVar361 + fVar375 * fStack_50c + fVar303 * fStack_22c + fVar238 * fStack_56c;
    auVar227._24_4_ =
         fStack_208 * fVar364 + fVar376 * fStack_508 + fVar306 * fStack_228 + fVar239 * fStack_568;
    auVar227._28_4_ = fVar309 + fVar389 + 2.0 + -fVar93 + -3.0;
    fVar355 = auVar186._28_4_ + auVar186._28_4_;
    auVar26._4_4_ = (fVar145 + fVar145) * auVar186._4_4_;
    auVar26._0_4_ = (fVar310 + fVar310) * auVar186._0_4_;
    auVar26._8_4_ = (fVar270 + fVar270) * auVar186._8_4_;
    auVar26._12_4_ = (fVar315 + fVar315) * auVar186._12_4_;
    auVar26._16_4_ = (fVar149 + fVar149) * auVar186._16_4_;
    auVar26._20_4_ = (fVar271 + fVar271) * auVar186._20_4_;
    auVar26._24_4_ = (fVar317 + fVar317) * auVar186._24_4_;
    auVar26._28_4_ = fVar355;
    auVar132 = vsubps_avx(auVar26,auVar162._0_32_);
    auVar22._4_4_ = (fVar145 + fVar145) * (fVar319 + 2.0);
    auVar22._0_4_ = (fVar310 + fVar310) * (fVar274 + 2.0);
    auVar22._8_4_ = (fVar270 + fVar270) * (fVar212 + 2.0);
    auVar22._12_4_ = (fVar315 + fVar315) * (fVar240 + 2.0);
    auVar22._16_4_ = (fVar149 + fVar149) * (fVar251 + 2.0);
    auVar22._20_4_ = (fVar271 + fVar271) * (fVar253 + 2.0);
    auVar22._24_4_ = (fVar317 + fVar317) * (fVar255 + 2.0);
    auVar22._28_4_ = 0x40400000;
    auVar23._4_4_ = fVar145 * fVar145 * 3.0;
    auVar23._0_4_ = fVar310 * fVar310 * 3.0;
    auVar23._8_4_ = fVar270 * fVar270 * 3.0;
    auVar23._12_4_ = fVar315 * fVar315 * 3.0;
    auVar23._16_4_ = fVar149 * fVar149 * 3.0;
    auVar23._20_4_ = fVar271 * fVar271 * 3.0;
    auVar23._24_4_ = fVar317 * fVar317 * 3.0;
    auVar23._28_4_ = fVar93;
    auVar108 = vsubps_avx(auVar22,auVar23);
    auVar26 = vsubps_avx(_local_a60,auVar26);
    fVar303 = auVar132._0_4_ * 0.5;
    fVar306 = auVar132._4_4_ * 0.5;
    fVar324 = auVar132._8_4_ * 0.5;
    fVar341 = auVar132._12_4_ * 0.5;
    fVar342 = auVar132._16_4_ * 0.5;
    fVar349 = auVar132._20_4_ * 0.5;
    fVar352 = auVar132._24_4_ * 0.5;
    fVar236 = (auVar186._0_4_ * fVar274 + (auVar186._0_4_ + auVar186._0_4_) * (fVar274 + -5.0)) *
              0.5;
    fVar239 = (auVar186._4_4_ * fVar319 + (auVar186._4_4_ + auVar186._4_4_) * (fVar319 + -5.0)) *
              0.5;
    fVar288 = (auVar186._8_4_ * fVar212 + (auVar186._8_4_ + auVar186._8_4_) * (fVar212 + -5.0)) *
              0.5;
    fVar294 = (auVar186._12_4_ * fVar240 + (auVar186._12_4_ + auVar186._12_4_) * (fVar240 + -5.0)) *
              0.5;
    fVar296 = (auVar186._16_4_ * fVar251 + (auVar186._16_4_ + auVar186._16_4_) * (fVar251 + -5.0)) *
              0.5;
    fVar298 = (auVar186._20_4_ * fVar253 + (auVar186._20_4_ + auVar186._20_4_) * (fVar253 + -5.0)) *
              0.5;
    fVar300 = (auVar186._24_4_ * fVar255 + (auVar186._24_4_ + auVar186._24_4_) * (fVar255 + -5.0)) *
              0.5;
    fVar310 = auVar108._0_4_ * 0.5;
    fVar145 = auVar108._4_4_ * 0.5;
    fVar270 = auVar108._8_4_ * 0.5;
    fVar315 = auVar108._12_4_ * 0.5;
    fVar317 = auVar108._16_4_ * 0.5;
    fVar274 = auVar108._20_4_ * 0.5;
    fVar240 = auVar108._24_4_ * 0.5;
    fVar149 = auVar26._0_4_ * 0.5;
    fVar271 = auVar26._4_4_ * 0.5;
    fVar319 = auVar26._8_4_ * 0.5;
    fVar251 = auVar26._12_4_ * 0.5;
    fVar253 = auVar26._16_4_ * 0.5;
    fVar234 = auVar26._20_4_ * 0.5;
    fVar235 = auVar26._24_4_ * 0.5;
    fVar238 = auVar186._28_4_ + -4.0 + auVar108._28_4_ + auVar26._28_4_ + 3.0;
    auVar178 = vpermilps_avx(ZEXT416((uint)(auVar175._0_4_ * 0.04761905)),0);
    fVar255 = auVar178._0_4_;
    fVar373 = fVar255 * (fVar303 * (float)local_4a0._0_4_ +
                        fVar236 * (float)local_4c0._0_4_ +
                        fVar310 * fVar217 + local_320._0_4_ * fVar149);
    fVar218 = auVar178._4_4_;
    fVar375 = fVar218 * (fVar306 * (float)local_4a0._4_4_ +
                        fVar239 * (float)local_4c0._4_4_ +
                        fVar145 * fVar383 + local_320._4_4_ * fVar271);
    auVar30._4_4_ = fVar375;
    auVar30._0_4_ = fVar373;
    fVar237 = auVar178._8_4_;
    fVar272 = fVar237 * (fVar324 * fStack_498 +
                        fVar288 * fStack_4b8 + fVar270 * fVar386 + local_320._8_4_ * fVar319);
    auVar30._8_4_ = fVar272;
    fVar212 = auVar178._12_4_;
    fVar275 = fVar212 * (fVar341 * fStack_494 +
                        fVar294 * fStack_4b4 + fVar315 * fVar389 + local_320._12_4_ * fVar251);
    auVar30._12_4_ = fVar275;
    fVar277 = fVar255 * (fVar342 * fStack_490 +
                        fVar296 * fStack_4b0 + fVar317 * fVar217 + local_320._16_4_ * fVar253);
    auVar30._16_4_ = fVar277;
    fVar279 = fVar218 * (fVar349 * fStack_48c +
                        fVar298 * fStack_4ac + fVar274 * fVar383 + local_320._20_4_ * fVar234);
    auVar30._20_4_ = fVar279;
    fVar281 = fVar237 * (fVar352 * fStack_488 +
                        fVar300 * fStack_4a8 + fVar240 * fVar386 + local_320._24_4_ * fVar235);
    auVar30._24_4_ = fVar281;
    auVar30._28_4_ = fVar93 + fVar93 + auVar132._28_4_ + fVar93 + fVar93 + -4.0;
    fVar325 = fVar255 * ((float)local_1e0._0_4_ * fVar303 +
                        fVar236 * (float)local_4e0._0_4_ +
                        fVar310 * (float)local_540._0_4_ + fVar149 * fVar302);
    fVar335 = fVar218 * ((float)local_1e0._4_4_ * fVar306 +
                        fVar239 * (float)local_4e0._4_4_ +
                        fVar145 * (float)local_540._4_4_ + fVar271 * fVar305);
    auVar29._4_4_ = fVar335;
    auVar29._0_4_ = fVar325;
    fVar336 = fVar237 * (fStack_1d8 * fVar324 +
                        fVar288 * fStack_4d8 + fVar270 * fStack_538 + fVar319 * fVar308);
    auVar29._8_4_ = fVar336;
    fVar337 = fVar212 * (fStack_1d4 * fVar341 +
                        fVar294 * fStack_4d4 + fVar315 * fStack_534 + fVar251 * fVar146);
    auVar29._12_4_ = fVar337;
    fVar338 = fVar255 * (fStack_1d0 * fVar342 +
                        fVar296 * fStack_4d0 + fVar317 * fStack_530 + fVar253 * fVar302);
    auVar29._16_4_ = fVar338;
    fVar339 = fVar218 * (fStack_1cc * fVar349 +
                        fVar298 * fStack_4cc + fVar274 * fStack_52c + fVar234 * fVar305);
    auVar29._20_4_ = fVar339;
    fVar340 = fVar237 * (fStack_1c8 * fVar352 +
                        fVar300 * fStack_4c8 + fVar240 * fStack_528 + fVar235 * fVar308);
    auVar29._24_4_ = fVar340;
    auVar29._28_4_ = fStack_1e4;
    fVar343 = fVar255 * ((float)local_200._0_4_ * fVar303 +
                        fVar310 * (float)local_560._0_4_ + fVar149 * (float)local_5a0._0_4_ +
                        fVar236 * (float)local_500._0_4_);
    fVar350 = fVar218 * ((float)local_200._4_4_ * fVar306 +
                        fVar145 * (float)local_560._4_4_ + fVar271 * (float)local_5a0._4_4_ +
                        fVar239 * (float)local_500._4_4_);
    auVar31._4_4_ = fVar350;
    auVar31._0_4_ = fVar343;
    fVar353 = fVar237 * (fStack_1f8 * fVar324 +
                        fVar270 * fStack_558 + fVar319 * fStack_598 + fVar288 * fStack_4f8);
    auVar31._8_4_ = fVar353;
    fVar356 = fVar212 * (fStack_1f4 * fVar341 +
                        fVar315 * fStack_554 + fVar251 * fStack_594 + fVar294 * fStack_4f4);
    auVar31._12_4_ = fVar356;
    fVar359 = fVar255 * (fStack_1f0 * fVar342 +
                        fVar317 * fStack_550 + fVar253 * fStack_590 + fVar296 * fStack_4f0);
    auVar31._16_4_ = fVar359;
    fVar362 = fVar218 * (fStack_1ec * fVar349 +
                        fVar274 * fStack_54c + fVar234 * fStack_58c + fVar298 * fStack_4ec);
    auVar31._20_4_ = fVar362;
    fVar365 = fVar237 * (fStack_1e8 * fVar352 +
                        fVar240 * fStack_548 + fVar235 * fStack_588 + fVar300 * fStack_4e8);
    auVar31._24_4_ = fVar365;
    auVar31._28_4_ = fVar367;
    fVar149 = fVar255 * ((float)local_220._0_4_ * fVar303 +
                        fVar236 * (float)local_520._0_4_ +
                        fVar310 * (float)local_580._0_4_ + (float)local_240._0_4_ * fVar149);
    fVar271 = fVar218 * ((float)local_220._4_4_ * fVar306 +
                        fVar239 * (float)local_520._4_4_ +
                        fVar145 * (float)local_580._4_4_ + (float)local_240._4_4_ * fVar271);
    auVar24._4_4_ = fVar271;
    auVar24._0_4_ = fVar149;
    fVar319 = fVar237 * (fStack_218 * fVar324 +
                        fVar288 * fStack_518 + fVar270 * fStack_578 + fStack_238 * fVar319);
    auVar24._8_4_ = fVar319;
    fVar212 = fVar212 * (fStack_214 * fVar341 +
                        fVar294 * fStack_514 + fVar315 * fStack_574 + fStack_234 * fVar251);
    auVar24._12_4_ = fVar212;
    fVar255 = fVar255 * (fStack_210 * fVar342 +
                        fVar296 * fStack_510 + fVar317 * fStack_570 + fStack_230 * fVar253);
    auVar24._16_4_ = fVar255;
    fVar218 = fVar218 * (fStack_20c * fVar349 +
                        fVar298 * fStack_50c + fVar274 * fStack_56c + fStack_22c * fVar234);
    auVar24._20_4_ = fVar218;
    fVar237 = fVar237 * (fStack_208 * fVar352 +
                        fVar300 * fStack_508 + fVar240 * fStack_568 + fStack_228 * fVar235);
    auVar24._24_4_ = fVar237;
    auVar24._28_4_ = fVar238;
    auVar76._4_4_ = fVar295;
    auVar76._0_4_ = fVar289;
    auVar76._8_4_ = fVar297;
    auVar76._12_4_ = fVar299;
    auVar76._16_4_ = fVar301;
    auVar76._20_4_ = fVar304;
    auVar76._24_4_ = fVar307;
    auVar76._28_4_ = fVar309;
    auVar132 = vperm2f128_avx(auVar76,auVar76,1);
    auVar132 = vshufps_avx(auVar132,auVar76,0x30);
    auVar22 = vshufps_avx(auVar76,auVar132,0x29);
    auVar74._4_4_ = fVar163;
    auVar74._0_4_ = fVar148;
    auVar74._8_4_ = fVar164;
    auVar74._12_4_ = fVar165;
    auVar74._16_4_ = fVar166;
    auVar74._20_4_ = fVar167;
    auVar74._24_4_ = fVar168;
    auVar74._28_4_ = fVar169;
    auVar132 = vperm2f128_avx(auVar74,auVar74,1);
    auVar132 = vshufps_avx(auVar132,auVar74,0x30);
    auVar23 = vshufps_avx(auVar74,auVar132,0x29);
    auVar108 = vsubps_avx(auVar227,auVar24);
    auVar132 = vperm2f128_avx(auVar108,auVar108,1);
    auVar132 = vshufps_avx(auVar132,auVar108,0x30);
    auVar24 = vshufps_avx(auVar108,auVar132,0x29);
    local_2a0 = vsubps_avx(auVar22,auVar76);
    local_280 = vsubps_avx(auVar23,auVar74);
    fVar145 = local_2a0._0_4_;
    fVar317 = local_2a0._4_4_;
    auVar25._4_4_ = fVar350 * fVar317;
    auVar25._0_4_ = fVar343 * fVar145;
    fVar240 = local_2a0._8_4_;
    auVar25._8_4_ = fVar353 * fVar240;
    fVar234 = local_2a0._12_4_;
    auVar25._12_4_ = fVar356 * fVar234;
    fVar239 = local_2a0._16_4_;
    auVar25._16_4_ = fVar359 * fVar239;
    fVar300 = local_2a0._20_4_;
    auVar25._20_4_ = fVar362 * fVar300;
    fVar342 = local_2a0._24_4_;
    auVar25._24_4_ = fVar365 * fVar342;
    auVar25._28_4_ = auVar108._28_4_;
    fVar270 = local_280._0_4_;
    fVar93 = local_280._4_4_;
    auVar27._4_4_ = fVar335 * fVar93;
    auVar27._0_4_ = fVar325 * fVar270;
    fVar251 = local_280._8_4_;
    auVar27._8_4_ = fVar336 * fVar251;
    fVar235 = local_280._12_4_;
    auVar27._12_4_ = fVar337 * fVar235;
    fVar288 = local_280._16_4_;
    auVar27._16_4_ = fVar338 * fVar288;
    fVar303 = local_280._20_4_;
    auVar27._20_4_ = fVar339 * fVar303;
    fVar349 = local_280._24_4_;
    auVar27._24_4_ = fVar340 * fVar349;
    auVar27._28_4_ = auVar132._28_4_;
    auVar27 = vsubps_avx(auVar27,auVar25);
    auVar78._4_4_ = fStack_97c;
    auVar78._0_4_ = local_980;
    auVar78._8_4_ = fStack_978;
    auVar78._12_4_ = fStack_974;
    auVar78._16_4_ = fStack_970;
    auVar78._20_4_ = fStack_96c;
    auVar78._24_4_ = fStack_968;
    auVar78._28_4_ = fStack_964;
    auVar132 = vperm2f128_avx(auVar78,auVar78,1);
    auVar132 = vshufps_avx(auVar132,auVar78,0x30);
    auVar25 = vshufps_avx(auVar78,auVar132,0x29);
    local_5e0 = vsubps_avx(auVar25,auVar78);
    auVar330._4_4_ = fVar375 * fVar93;
    auVar330._0_4_ = fVar373 * fVar270;
    auVar330._8_4_ = fVar272 * fVar251;
    auVar330._12_4_ = fVar275 * fVar235;
    auVar330._16_4_ = fVar277 * fVar288;
    auVar330._20_4_ = fVar279 * fVar303;
    auVar330._24_4_ = fVar281 * fVar349;
    auVar330._28_4_ = auVar132._28_4_;
    fVar315 = local_5e0._0_4_;
    fVar274 = local_5e0._4_4_;
    auVar28._4_4_ = fVar350 * fVar274;
    auVar28._0_4_ = fVar343 * fVar315;
    fVar253 = local_5e0._8_4_;
    auVar28._8_4_ = fVar353 * fVar253;
    fVar236 = local_5e0._12_4_;
    auVar28._12_4_ = fVar356 * fVar236;
    fVar294 = local_5e0._16_4_;
    auVar28._16_4_ = fVar359 * fVar294;
    fVar306 = local_5e0._20_4_;
    auVar28._20_4_ = fVar362 * fVar306;
    fVar352 = local_5e0._24_4_;
    auVar28._24_4_ = fVar365 * fVar352;
    auVar28._28_4_ = fVar169;
    auVar330 = vsubps_avx(auVar28,auVar330);
    auVar293._4_4_ = fVar335 * fVar274;
    auVar293._0_4_ = fVar325 * fVar315;
    auVar293._8_4_ = fVar336 * fVar253;
    auVar293._12_4_ = fVar337 * fVar236;
    auVar293._16_4_ = fVar338 * fVar294;
    auVar293._20_4_ = fVar339 * fVar306;
    auVar293._24_4_ = fVar340 * fVar352;
    auVar293._28_4_ = fVar169;
    auVar32._4_4_ = fVar317 * fVar375;
    auVar32._0_4_ = fVar145 * fVar373;
    auVar32._8_4_ = fVar240 * fVar272;
    auVar32._12_4_ = fVar234 * fVar275;
    auVar32._16_4_ = fVar239 * fVar277;
    auVar32._20_4_ = fVar300 * fVar279;
    auVar32._24_4_ = fVar342 * fVar281;
    auVar32._28_4_ = fVar355;
    auVar28 = vsubps_avx(auVar32,auVar293);
    fVar310 = auVar28._28_4_;
    auVar187._0_4_ = fVar315 * fVar315 + fVar145 * fVar145 + fVar270 * fVar270;
    auVar187._4_4_ = fVar274 * fVar274 + fVar317 * fVar317 + fVar93 * fVar93;
    auVar187._8_4_ = fVar253 * fVar253 + fVar240 * fVar240 + fVar251 * fVar251;
    auVar187._12_4_ = fVar236 * fVar236 + fVar234 * fVar234 + fVar235 * fVar235;
    auVar187._16_4_ = fVar294 * fVar294 + fVar239 * fVar239 + fVar288 * fVar288;
    auVar187._20_4_ = fVar306 * fVar306 + fVar300 * fVar300 + fVar303 * fVar303;
    auVar187._24_4_ = fVar352 * fVar352 + fVar342 * fVar342 + fVar349 * fVar349;
    auVar187._28_4_ = fVar310 + fVar310 + auVar27._28_4_;
    auVar132 = vrcpps_avx(auVar187);
    fVar296 = auVar132._0_4_;
    fVar298 = auVar132._4_4_;
    auVar33._4_4_ = fVar298 * auVar187._4_4_;
    auVar33._0_4_ = fVar296 * auVar187._0_4_;
    fVar324 = auVar132._8_4_;
    auVar33._8_4_ = fVar324 * auVar187._8_4_;
    fVar341 = auVar132._12_4_;
    auVar33._12_4_ = fVar341 * auVar187._12_4_;
    fVar302 = auVar132._16_4_;
    auVar33._16_4_ = fVar302 * auVar187._16_4_;
    fVar305 = auVar132._20_4_;
    auVar33._20_4_ = fVar305 * auVar187._20_4_;
    fVar308 = auVar132._24_4_;
    auVar33._24_4_ = fVar308 * auVar187._24_4_;
    auVar33._28_4_ = fVar355;
    auVar156._8_4_ = 0x3f800000;
    auVar156._0_8_ = 0x3f8000003f800000;
    auVar156._12_4_ = 0x3f800000;
    auVar156._16_4_ = 0x3f800000;
    auVar156._20_4_ = 0x3f800000;
    auVar156._24_4_ = 0x3f800000;
    auVar156._28_4_ = 0x3f800000;
    auVar293 = vsubps_avx(auVar156,auVar33);
    fVar296 = fVar296 + fVar296 * auVar293._0_4_;
    fVar298 = fVar298 + fVar298 * auVar293._4_4_;
    fVar324 = fVar324 + fVar324 * auVar293._8_4_;
    fVar341 = fVar341 + fVar341 * auVar293._12_4_;
    fVar302 = fVar302 + fVar302 * auVar293._16_4_;
    fVar305 = fVar305 + fVar305 * auVar293._20_4_;
    fVar308 = fVar308 + fVar308 * auVar293._24_4_;
    auVar108 = vperm2f128_avx(auVar29,auVar29,1);
    auVar108 = vshufps_avx(auVar108,auVar29,0x30);
    auVar108 = vshufps_avx(auVar29,auVar108,0x29);
    auVar26 = vperm2f128_avx(auVar31,auVar31,1);
    auVar26 = vshufps_avx(auVar26,auVar31,0x30);
    local_9e0 = vshufps_avx(auVar31,auVar26,0x29);
    fVar344 = local_9e0._0_4_;
    fVar351 = local_9e0._4_4_;
    auVar34._4_4_ = fVar351 * fVar317;
    auVar34._0_4_ = fVar344 * fVar145;
    fVar354 = local_9e0._8_4_;
    auVar34._8_4_ = fVar354 * fVar240;
    fVar357 = local_9e0._12_4_;
    auVar34._12_4_ = fVar357 * fVar234;
    fVar360 = local_9e0._16_4_;
    auVar34._16_4_ = fVar360 * fVar239;
    fVar363 = local_9e0._20_4_;
    auVar34._20_4_ = fVar363 * fVar300;
    fVar366 = local_9e0._24_4_;
    auVar34._24_4_ = fVar366 * fVar342;
    auVar34._28_4_ = auVar26._28_4_;
    fVar217 = auVar108._0_4_;
    fVar368 = auVar108._4_4_;
    auVar35._4_4_ = fVar368 * fVar93;
    auVar35._0_4_ = fVar217 * fVar270;
    fVar383 = auVar108._8_4_;
    auVar35._8_4_ = fVar383 * fVar251;
    fVar371 = auVar108._12_4_;
    auVar35._12_4_ = fVar371 * fVar235;
    fVar386 = auVar108._16_4_;
    auVar35._16_4_ = fVar386 * fVar288;
    fVar372 = auVar108._20_4_;
    auVar35._20_4_ = fVar372 * fVar303;
    fVar389 = auVar108._24_4_;
    auVar35._24_4_ = fVar389 * fVar349;
    auVar35._28_4_ = fStack_1e4;
    auVar29 = vsubps_avx(auVar35,auVar34);
    auVar108 = vperm2f128_avx(auVar30,auVar30,1);
    auVar108 = vshufps_avx(auVar108,auVar30,0x30);
    auVar26 = vshufps_avx(auVar30,auVar108,0x29);
    fVar374 = auVar26._0_4_;
    fVar376 = auVar26._4_4_;
    auVar36._4_4_ = fVar376 * fVar93;
    auVar36._0_4_ = fVar374 * fVar270;
    fVar273 = auVar26._8_4_;
    auVar36._8_4_ = fVar273 * fVar251;
    fVar276 = auVar26._12_4_;
    auVar36._12_4_ = fVar276 * fVar235;
    fVar278 = auVar26._16_4_;
    auVar36._16_4_ = fVar278 * fVar288;
    fVar280 = auVar26._20_4_;
    auVar36._20_4_ = fVar280 * fVar303;
    fVar282 = auVar26._24_4_;
    auVar36._24_4_ = fVar282 * fVar349;
    auVar36._28_4_ = auVar108._28_4_;
    auVar37._4_4_ = fVar351 * fVar274;
    auVar37._0_4_ = fVar344 * fVar315;
    auVar37._8_4_ = fVar354 * fVar253;
    auVar37._12_4_ = fVar357 * fVar236;
    auVar37._16_4_ = fVar360 * fVar294;
    auVar37._20_4_ = fVar363 * fVar306;
    uVar91 = local_9e0._28_4_;
    auVar37._24_4_ = fVar366 * fVar352;
    auVar37._28_4_ = uVar91;
    auVar108 = vsubps_avx(auVar37,auVar36);
    auVar38._4_4_ = fVar274 * fVar368;
    auVar38._0_4_ = fVar315 * fVar217;
    auVar38._8_4_ = fVar253 * fVar383;
    auVar38._12_4_ = fVar236 * fVar371;
    auVar38._16_4_ = fVar294 * fVar386;
    auVar38._20_4_ = fVar306 * fVar372;
    auVar38._24_4_ = fVar352 * fVar389;
    auVar38._28_4_ = uVar91;
    auVar39._4_4_ = fVar317 * fVar376;
    auVar39._0_4_ = fVar145 * fVar374;
    auVar39._8_4_ = fVar240 * fVar273;
    auVar39._12_4_ = fVar234 * fVar276;
    auVar39._16_4_ = fVar239 * fVar278;
    auVar39._20_4_ = fVar300 * fVar280;
    auVar39._24_4_ = fVar342 * fVar282;
    auVar39._28_4_ = fStack_1c4;
    auVar30 = vsubps_avx(auVar39,auVar38);
    auVar40._4_4_ =
         fVar298 * (auVar27._4_4_ * auVar27._4_4_ +
                   auVar28._4_4_ * auVar28._4_4_ + auVar330._4_4_ * auVar330._4_4_);
    auVar40._0_4_ =
         fVar296 * (auVar27._0_4_ * auVar27._0_4_ +
                   auVar28._0_4_ * auVar28._0_4_ + auVar330._0_4_ * auVar330._0_4_);
    auVar40._8_4_ =
         fVar324 * (auVar27._8_4_ * auVar27._8_4_ +
                   auVar28._8_4_ * auVar28._8_4_ + auVar330._8_4_ * auVar330._8_4_);
    auVar40._12_4_ =
         fVar341 * (auVar27._12_4_ * auVar27._12_4_ +
                   auVar28._12_4_ * auVar28._12_4_ + auVar330._12_4_ * auVar330._12_4_);
    auVar40._16_4_ =
         fVar302 * (auVar27._16_4_ * auVar27._16_4_ +
                   auVar28._16_4_ * auVar28._16_4_ + auVar330._16_4_ * auVar330._16_4_);
    auVar40._20_4_ =
         fVar305 * (auVar27._20_4_ * auVar27._20_4_ +
                   auVar28._20_4_ * auVar28._20_4_ + auVar330._20_4_ * auVar330._20_4_);
    auVar40._24_4_ =
         fVar308 * (auVar27._24_4_ * auVar27._24_4_ +
                   auVar28._24_4_ * auVar28._24_4_ + auVar330._24_4_ * auVar330._24_4_);
    auVar40._28_4_ = auVar27._28_4_ + fVar310 + auVar330._28_4_;
    auVar41._4_4_ =
         (auVar29._4_4_ * auVar29._4_4_ +
         auVar108._4_4_ * auVar108._4_4_ + auVar30._4_4_ * auVar30._4_4_) * fVar298;
    auVar41._0_4_ =
         (auVar29._0_4_ * auVar29._0_4_ +
         auVar108._0_4_ * auVar108._0_4_ + auVar30._0_4_ * auVar30._0_4_) * fVar296;
    auVar41._8_4_ =
         (auVar29._8_4_ * auVar29._8_4_ +
         auVar108._8_4_ * auVar108._8_4_ + auVar30._8_4_ * auVar30._8_4_) * fVar324;
    auVar41._12_4_ =
         (auVar29._12_4_ * auVar29._12_4_ +
         auVar108._12_4_ * auVar108._12_4_ + auVar30._12_4_ * auVar30._12_4_) * fVar341;
    auVar41._16_4_ =
         (auVar29._16_4_ * auVar29._16_4_ +
         auVar108._16_4_ * auVar108._16_4_ + auVar30._16_4_ * auVar30._16_4_) * fVar302;
    auVar41._20_4_ =
         (auVar29._20_4_ * auVar29._20_4_ +
         auVar108._20_4_ * auVar108._20_4_ + auVar30._20_4_ * auVar30._20_4_) * fVar305;
    auVar41._24_4_ =
         (auVar29._24_4_ * auVar29._24_4_ +
         auVar108._24_4_ * auVar108._24_4_ + auVar30._24_4_ * auVar30._24_4_) * fVar308;
    auVar41._28_4_ = auVar132._28_4_ + auVar293._28_4_;
    auVar132 = vmaxps_avx(auVar40,auVar41);
    auVar108 = vperm2f128_avx(auVar227,auVar227,1);
    auVar108 = vshufps_avx(auVar108,auVar227,0x30);
    auVar27 = vshufps_avx(auVar227,auVar108,0x29);
    local_680._0_4_ = auVar227._0_4_ + fVar149;
    local_680._4_4_ = auVar227._4_4_ + fVar271;
    local_680._8_4_ = auVar227._8_4_ + fVar319;
    local_680._12_4_ = auVar227._12_4_ + fVar212;
    local_680._16_4_ = auVar227._16_4_ + fVar255;
    local_680._20_4_ = auVar227._20_4_ + fVar218;
    local_680._24_4_ = auVar227._24_4_ + fVar237;
    local_680._28_4_ = auVar227._28_4_ + fVar238;
    auVar108 = vmaxps_avx(auVar227,local_680);
    auVar26 = vmaxps_avx(auVar24,auVar27);
    auVar108 = vmaxps_avx(auVar108,auVar26);
    auVar26 = vrsqrtps_avx(auVar187);
    fVar310 = auVar26._0_4_;
    fVar149 = auVar26._4_4_;
    fVar271 = auVar26._8_4_;
    fVar319 = auVar26._12_4_;
    fVar212 = auVar26._16_4_;
    fVar255 = auVar26._20_4_;
    fVar218 = auVar26._24_4_;
    auVar42._4_4_ = fVar149 * fVar149 * fVar149 * auVar187._4_4_ * 0.5;
    auVar42._0_4_ = fVar310 * fVar310 * fVar310 * auVar187._0_4_ * 0.5;
    auVar42._8_4_ = fVar271 * fVar271 * fVar271 * auVar187._8_4_ * 0.5;
    auVar42._12_4_ = fVar319 * fVar319 * fVar319 * auVar187._12_4_ * 0.5;
    auVar42._16_4_ = fVar212 * fVar212 * fVar212 * auVar187._16_4_ * 0.5;
    auVar42._20_4_ = fVar255 * fVar255 * fVar255 * auVar187._20_4_ * 0.5;
    auVar42._24_4_ = fVar218 * fVar218 * fVar218 * auVar187._24_4_ * 0.5;
    auVar42._28_4_ = auVar187._28_4_;
    auVar43._4_4_ = fVar149 * 1.5;
    auVar43._0_4_ = fVar310 * 1.5;
    auVar43._8_4_ = fVar271 * 1.5;
    auVar43._12_4_ = fVar319 * 1.5;
    auVar43._16_4_ = fVar212 * 1.5;
    auVar43._20_4_ = fVar255 * 1.5;
    auVar43._24_4_ = fVar218 * 1.5;
    auVar43._28_4_ = auVar26._28_4_;
    _local_a40 = vsubps_avx(auVar43,auVar42);
    auVar77._4_4_ = fVar295;
    auVar77._0_4_ = fVar289;
    auVar77._8_4_ = fVar297;
    auVar77._12_4_ = fVar299;
    auVar77._16_4_ = fVar301;
    auVar77._20_4_ = fVar304;
    auVar77._24_4_ = fVar307;
    auVar77._28_4_ = fVar309;
    auVar330 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_a20 = vsubps_avx(auVar330,auVar77);
    auVar75._4_4_ = fVar163;
    auVar75._0_4_ = fVar148;
    auVar75._8_4_ = fVar164;
    auVar75._12_4_ = fVar165;
    auVar75._16_4_ = fVar166;
    auVar75._20_4_ = fVar167;
    auVar75._24_4_ = fVar168;
    auVar75._28_4_ = fVar169;
    local_a00 = vsubps_avx(auVar330,auVar75);
    fVar311 = local_a00._0_4_;
    fVar316 = local_a00._4_4_;
    fVar318 = local_a00._8_4_;
    fVar320 = local_a00._12_4_;
    fVar321 = local_a00._16_4_;
    fVar322 = local_a00._20_4_;
    fVar323 = local_a00._24_4_;
    fVar149 = local_a20._0_4_;
    fVar319 = local_a20._4_4_;
    fVar255 = local_a20._8_4_;
    fVar237 = local_a20._12_4_;
    fVar296 = local_a20._16_4_;
    fVar324 = local_a20._20_4_;
    fVar302 = local_a20._24_4_;
    auVar330 = vsubps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar78);
    fVar380 = auVar330._0_4_;
    fVar382 = auVar330._4_4_;
    fVar384 = auVar330._8_4_;
    fVar385 = auVar330._12_4_;
    fVar387 = auVar330._16_4_;
    fVar388 = auVar330._20_4_;
    fVar390 = auVar330._24_4_;
    auVar292._0_4_ =
         fVar380 * (float)local_8e0._0_4_ +
         (float)local_720._0_4_ * fVar149 + fVar311 * (float)local_740._0_4_;
    auVar292._4_4_ =
         fVar382 * (float)local_8e0._4_4_ +
         (float)local_720._4_4_ * fVar319 + fVar316 * (float)local_740._4_4_;
    auVar292._8_4_ = fVar384 * fStack_8d8 + fStack_718 * fVar255 + fVar318 * fStack_738;
    auVar292._12_4_ = fVar385 * fStack_8d4 + fStack_714 * fVar237 + fVar320 * fStack_734;
    auVar292._16_4_ = fVar387 * fStack_8d0 + fStack_710 * fVar296 + fVar321 * fStack_730;
    auVar292._20_4_ = fVar388 * fStack_8cc + fStack_70c * fVar324 + fVar322 * fStack_72c;
    auVar292._24_4_ = fVar390 * fStack_8c8 + fStack_708 * fVar302 + fVar323 * fStack_728;
    auVar292._28_4_ = auVar30._28_4_ + auVar26._28_4_ + auVar187._28_4_;
    auVar347._0_4_ = fVar380 * fVar380 + fVar149 * fVar149 + fVar311 * fVar311;
    auVar347._4_4_ = fVar382 * fVar382 + fVar319 * fVar319 + fVar316 * fVar316;
    auVar347._8_4_ = fVar384 * fVar384 + fVar255 * fVar255 + fVar318 * fVar318;
    auVar347._12_4_ = fVar385 * fVar385 + fVar237 * fVar237 + fVar320 * fVar320;
    auVar347._16_4_ = fVar387 * fVar387 + fVar296 * fVar296 + fVar321 * fVar321;
    auVar347._20_4_ = fVar388 * fVar388 + fVar324 * fVar324 + fVar322 * fVar322;
    auVar347._24_4_ = fVar390 * fVar390 + fVar302 * fVar302 + fVar323 * fVar323;
    auVar347._28_4_ = fStack_1c4 + fStack_1c4 + auVar30._28_4_;
    fVar271 = local_a40._0_4_;
    fVar212 = local_a40._4_4_;
    fVar218 = local_a40._8_4_;
    fVar238 = local_a40._12_4_;
    fVar298 = local_a40._16_4_;
    fVar341 = local_a40._20_4_;
    fVar305 = local_a40._24_4_;
    local_620._0_4_ =
         (float)local_8e0._0_4_ * fVar315 * fVar271 +
         fVar145 * fVar271 * (float)local_720._0_4_ + fVar270 * fVar271 * (float)local_740._0_4_;
    local_620._4_4_ =
         (float)local_8e0._4_4_ * fVar274 * fVar212 +
         fVar317 * fVar212 * (float)local_720._4_4_ + fVar93 * fVar212 * (float)local_740._4_4_;
    local_620._8_4_ =
         fStack_8d8 * fVar253 * fVar218 +
         fVar240 * fVar218 * fStack_718 + fVar251 * fVar218 * fStack_738;
    local_620._12_4_ =
         fStack_8d4 * fVar236 * fVar238 +
         fVar234 * fVar238 * fStack_714 + fVar235 * fVar238 * fStack_734;
    local_620._16_4_ =
         fStack_8d0 * fVar294 * fVar298 +
         fVar239 * fVar298 * fStack_710 + fVar288 * fVar298 * fStack_730;
    local_620._20_4_ =
         fStack_8cc * fVar306 * fVar341 +
         fVar300 * fVar341 * fStack_70c + fVar303 * fVar341 * fStack_72c;
    local_620._24_4_ =
         fStack_8c8 * fVar352 * fVar305 +
         fVar342 * fVar305 * fStack_708 + fVar349 * fVar305 * fStack_728;
    local_620._28_4_ = fStack_8c4 + fStack_704 + fStack_724;
    fVar310 = fStack_8c4 + fStack_704 + fStack_724;
    local_640._0_4_ =
         fVar380 * fVar315 * fVar271 + fVar145 * fVar271 * fVar149 + fVar311 * fVar270 * fVar271;
    local_640._4_4_ =
         fVar382 * fVar274 * fVar212 + fVar317 * fVar212 * fVar319 + fVar316 * fVar93 * fVar212;
    local_640._8_4_ =
         fVar384 * fVar253 * fVar218 + fVar240 * fVar218 * fVar255 + fVar318 * fVar251 * fVar218;
    local_640._12_4_ =
         fVar385 * fVar236 * fVar238 + fVar234 * fVar238 * fVar237 + fVar320 * fVar235 * fVar238;
    local_640._16_4_ =
         fVar387 * fVar294 * fVar298 + fVar239 * fVar298 * fVar296 + fVar321 * fVar288 * fVar298;
    local_640._20_4_ =
         fVar388 * fVar306 * fVar341 + fVar300 * fVar341 * fVar324 + fVar322 * fVar303 * fVar341;
    local_640._24_4_ =
         fVar390 * fVar352 * fVar305 + fVar342 * fVar305 * fVar302 + fVar323 * fVar349 * fVar305;
    local_640._28_4_ = fStack_704 + fVar310;
    auVar44._4_4_ = local_620._4_4_ * local_640._4_4_;
    auVar44._0_4_ = local_620._0_4_ * local_640._0_4_;
    auVar44._8_4_ = local_620._8_4_ * local_640._8_4_;
    auVar44._12_4_ = local_620._12_4_ * local_640._12_4_;
    auVar44._16_4_ = local_620._16_4_ * local_640._16_4_;
    auVar44._20_4_ = local_620._20_4_ * local_640._20_4_;
    auVar44._24_4_ = local_620._24_4_ * local_640._24_4_;
    auVar44._28_4_ = fVar310;
    auVar26 = vsubps_avx(auVar292,auVar44);
    auVar45._4_4_ = local_640._4_4_ * local_640._4_4_;
    auVar45._0_4_ = local_640._0_4_ * local_640._0_4_;
    auVar45._8_4_ = local_640._8_4_ * local_640._8_4_;
    auVar45._12_4_ = local_640._12_4_ * local_640._12_4_;
    auVar45._16_4_ = local_640._16_4_ * local_640._16_4_;
    auVar45._20_4_ = local_640._20_4_ * local_640._20_4_;
    auVar45._24_4_ = local_640._24_4_ * local_640._24_4_;
    auVar45._28_4_ = fStack_704;
    local_6a0 = vsubps_avx(auVar347,auVar45);
    local_700 = vsqrtps_avx(auVar132);
    fVar310 = (local_700._0_4_ + auVar108._0_4_) * 1.0000002;
    fVar308 = (local_700._4_4_ + auVar108._4_4_) * 1.0000002;
    fVar355 = (local_700._8_4_ + auVar108._8_4_) * 1.0000002;
    fVar146 = (local_700._12_4_ + auVar108._12_4_) * 1.0000002;
    fVar358 = (local_700._16_4_ + auVar108._16_4_) * 1.0000002;
    fVar361 = (local_700._20_4_ + auVar108._20_4_) * 1.0000002;
    fVar364 = (local_700._24_4_ + auVar108._24_4_) * 1.0000002;
    auVar46._4_4_ = fVar308 * fVar308;
    auVar46._0_4_ = fVar310 * fVar310;
    auVar46._8_4_ = fVar355 * fVar355;
    auVar46._12_4_ = fVar146 * fVar146;
    auVar46._16_4_ = fVar358 * fVar358;
    auVar46._20_4_ = fVar361 * fVar361;
    auVar46._24_4_ = fVar364 * fVar364;
    auVar46._28_4_ = local_700._28_4_ + auVar108._28_4_;
    local_3c0._0_4_ = auVar26._0_4_ + auVar26._0_4_;
    local_3c0._4_4_ = auVar26._4_4_ + auVar26._4_4_;
    local_3c0._8_4_ = auVar26._8_4_ + auVar26._8_4_;
    local_3c0._12_4_ = auVar26._12_4_ + auVar26._12_4_;
    local_3c0._16_4_ = auVar26._16_4_ + auVar26._16_4_;
    local_3c0._20_4_ = auVar26._20_4_ + auVar26._20_4_;
    local_3c0._24_4_ = auVar26._24_4_ + auVar26._24_4_;
    fVar310 = auVar26._28_4_;
    local_3c0._28_4_ = fVar310 + fVar310;
    auVar108 = vsubps_avx(local_6a0,auVar46);
    auVar47._4_4_ = local_620._4_4_ * local_620._4_4_;
    auVar47._0_4_ = local_620._0_4_ * local_620._0_4_;
    auVar47._8_4_ = local_620._8_4_ * local_620._8_4_;
    auVar47._12_4_ = local_620._12_4_ * local_620._12_4_;
    auVar47._16_4_ = local_620._16_4_ * local_620._16_4_;
    auVar47._20_4_ = local_620._20_4_ * local_620._20_4_;
    auVar47._24_4_ = local_620._24_4_ * local_620._24_4_;
    auVar47._28_4_ = fVar310;
    auVar26 = vsubps_avx(local_260,auVar47);
    local_6c0._4_4_ = local_3c0._4_4_ * local_3c0._4_4_;
    local_6c0._0_4_ = local_3c0._0_4_ * local_3c0._0_4_;
    local_6c0._8_4_ = local_3c0._8_4_ * local_3c0._8_4_;
    local_6c0._12_4_ = local_3c0._12_4_ * local_3c0._12_4_;
    local_6c0._16_4_ = local_3c0._16_4_ * local_3c0._16_4_;
    local_6c0._20_4_ = local_3c0._20_4_ * local_3c0._20_4_;
    local_6c0._24_4_ = local_3c0._24_4_ * local_3c0._24_4_;
    local_6c0._28_4_ = local_260._28_4_;
    fVar310 = auVar26._0_4_;
    local_6e0._0_4_ = fVar310 * 4.0;
    fVar308 = auVar26._4_4_;
    local_6e0._4_4_ = fVar308 * 4.0;
    fVar355 = auVar26._8_4_;
    fStack_6d8 = fVar355 * 4.0;
    fVar146 = auVar26._12_4_;
    fStack_6d4 = fVar146 * 4.0;
    fVar358 = auVar26._16_4_;
    fStack_6d0 = fVar358 * 4.0;
    fVar361 = auVar26._20_4_;
    fStack_6cc = fVar361 * 4.0;
    fVar364 = auVar26._24_4_;
    fStack_6c8 = fVar364 * 4.0;
    uStack_6c4 = 0x40800000;
    auVar48._4_4_ = auVar108._4_4_ * (float)local_6e0._4_4_;
    auVar48._0_4_ = auVar108._0_4_ * (float)local_6e0._0_4_;
    auVar48._8_4_ = auVar108._8_4_ * fStack_6d8;
    auVar48._12_4_ = auVar108._12_4_ * fStack_6d4;
    auVar48._16_4_ = auVar108._16_4_ * fStack_6d0;
    auVar48._20_4_ = auVar108._20_4_ * fStack_6cc;
    auVar48._24_4_ = auVar108._24_4_ * fStack_6c8;
    auVar48._28_4_ = 0x40800000;
    auVar330 = vsubps_avx(local_6c0,auVar48);
    auVar132 = vcmpps_avx(auVar330,ZEXT832(0) << 0x20,5);
    auVar265._8_4_ = 0x7fffffff;
    auVar265._0_8_ = 0x7fffffff7fffffff;
    auVar265._12_4_ = 0x7fffffff;
    auVar265._16_4_ = 0x7fffffff;
    auVar265._20_4_ = 0x7fffffff;
    auVar265._24_4_ = 0x7fffffff;
    auVar265._28_4_ = 0x7fffffff;
    local_3a0 = vandps_avx(auVar47,auVar265);
    local_300._0_4_ = fVar310 + fVar310;
    local_300._4_4_ = fVar308 + fVar308;
    local_300._8_4_ = fVar355 + fVar355;
    local_300._12_4_ = fVar146 + fVar146;
    local_300._16_4_ = fVar358 + fVar358;
    local_300._20_4_ = fVar361 + fVar361;
    local_300._24_4_ = fVar364 + fVar364;
    local_300._28_4_ = auVar26._28_4_ + auVar26._28_4_;
    local_2c0 = vandps_avx(auVar26,auVar265);
    uVar84 = CONCAT44(local_3c0._4_4_,local_3c0._0_4_);
    local_2e0._0_8_ = uVar84 ^ 0x8000000080000000;
    local_2e0._8_4_ = -local_3c0._8_4_;
    local_2e0._12_4_ = -local_3c0._12_4_;
    local_2e0._16_4_ = -local_3c0._16_4_;
    local_2e0._20_4_ = -local_3c0._20_4_;
    local_2e0._24_4_ = -local_3c0._24_4_;
    local_2e0._28_4_ = -local_3c0._28_4_;
    if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar132 >> 0x7f,0) == '\0') &&
          (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar132 >> 0xbf,0) == '\0') &&
        (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar132[0x1f])
    {
      auVar334 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar133._8_4_ = 0xff800000;
      auVar133._0_8_ = 0xff800000ff800000;
      auVar133._12_4_ = 0xff800000;
      auVar133._16_4_ = 0xff800000;
      auVar133._20_4_ = 0xff800000;
      auVar133._24_4_ = 0xff800000;
      auVar133._28_4_ = 0xff800000;
    }
    else {
      auVar293 = vsqrtps_avx(auVar330);
      auVar26 = vrcpps_avx(local_300);
      auVar28 = vcmpps_avx(auVar330,ZEXT832(0) << 0x20,5);
      fVar310 = auVar26._0_4_;
      fVar308 = auVar26._4_4_;
      auVar49._4_4_ = local_300._4_4_ * fVar308;
      auVar49._0_4_ = local_300._0_4_ * fVar310;
      fVar355 = auVar26._8_4_;
      auVar49._8_4_ = local_300._8_4_ * fVar355;
      fVar146 = auVar26._12_4_;
      auVar49._12_4_ = local_300._12_4_ * fVar146;
      fVar358 = auVar26._16_4_;
      auVar49._16_4_ = local_300._16_4_ * fVar358;
      fVar361 = auVar26._20_4_;
      auVar49._20_4_ = local_300._20_4_ * fVar361;
      fVar364 = auVar26._24_4_;
      auVar49._24_4_ = local_300._24_4_ * fVar364;
      auVar49._28_4_ = auVar330._28_4_;
      auVar109._8_4_ = 0x3f800000;
      auVar109._0_8_ = 0x3f8000003f800000;
      auVar109._12_4_ = 0x3f800000;
      auVar109._16_4_ = 0x3f800000;
      auVar109._20_4_ = 0x3f800000;
      auVar109._24_4_ = 0x3f800000;
      auVar109._28_4_ = 0x3f800000;
      auVar330 = vsubps_avx(auVar109,auVar49);
      fVar310 = fVar310 + fVar310 * auVar330._0_4_;
      fVar308 = fVar308 + fVar308 * auVar330._4_4_;
      fVar355 = fVar355 + fVar355 * auVar330._8_4_;
      fVar146 = fVar146 + fVar146 * auVar330._12_4_;
      fVar358 = fVar358 + fVar358 * auVar330._16_4_;
      fVar361 = fVar361 + fVar361 * auVar330._20_4_;
      fVar364 = fVar364 + fVar364 * auVar330._24_4_;
      auVar29 = vsubps_avx(local_2e0,auVar293);
      fVar241 = auVar29._0_4_ * fVar310;
      fVar252 = auVar29._4_4_ * fVar308;
      auVar50._4_4_ = fVar252;
      auVar50._0_4_ = fVar241;
      fVar254 = auVar29._8_4_ * fVar355;
      auVar50._8_4_ = fVar254;
      fVar256 = auVar29._12_4_ * fVar146;
      auVar50._12_4_ = fVar256;
      fVar257 = auVar29._16_4_ * fVar358;
      auVar50._16_4_ = fVar257;
      fVar258 = auVar29._20_4_ * fVar361;
      auVar50._20_4_ = fVar258;
      fVar259 = auVar29._24_4_ * fVar364;
      auVar50._24_4_ = fVar259;
      auVar50._28_4_ = auVar29._28_4_;
      auVar293 = vsubps_avx(auVar293,local_3c0);
      fVar310 = auVar293._0_4_ * fVar310;
      fVar308 = auVar293._4_4_ * fVar308;
      auVar51._4_4_ = fVar308;
      auVar51._0_4_ = fVar310;
      fVar355 = auVar293._8_4_ * fVar355;
      auVar51._8_4_ = fVar355;
      fVar146 = auVar293._12_4_ * fVar146;
      auVar51._12_4_ = fVar146;
      fVar358 = auVar293._16_4_ * fVar358;
      auVar51._16_4_ = fVar358;
      fVar361 = auVar293._20_4_ * fVar361;
      auVar51._20_4_ = fVar361;
      fVar364 = auVar293._24_4_ * fVar364;
      auVar51._24_4_ = fVar364;
      auVar51._28_4_ = auVar26._28_4_ + auVar330._28_4_;
      fStack_364 = local_640._28_4_ + auVar293._28_4_;
      local_380 = fVar271 * (local_640._0_4_ + local_620._0_4_ * fVar241);
      fStack_37c = fVar212 * (local_640._4_4_ + local_620._4_4_ * fVar252);
      fStack_378 = fVar218 * (local_640._8_4_ + local_620._8_4_ * fVar254);
      fStack_374 = fVar238 * (local_640._12_4_ + local_620._12_4_ * fVar256);
      fStack_370 = fVar298 * (local_640._16_4_ + local_620._16_4_ * fVar257);
      fStack_36c = fVar341 * (local_640._20_4_ + local_620._20_4_ * fVar258);
      fStack_368 = fVar305 * (local_640._24_4_ + local_620._24_4_ * fVar259);
      local_360 = fVar271 * (local_640._0_4_ + local_620._0_4_ * fVar310);
      fStack_35c = fVar212 * (local_640._4_4_ + local_620._4_4_ * fVar308);
      fStack_358 = fVar218 * (local_640._8_4_ + local_620._8_4_ * fVar355);
      fStack_354 = fVar238 * (local_640._12_4_ + local_620._12_4_ * fVar146);
      fStack_350 = fVar298 * (local_640._16_4_ + local_620._16_4_ * fVar358);
      fStack_34c = fVar341 * (local_640._20_4_ + local_620._20_4_ * fVar361);
      fStack_348 = fVar305 * (local_640._24_4_ + local_620._24_4_ * fVar364);
      fStack_344 = local_640._28_4_ + fStack_364;
      auVar228._8_4_ = 0x7f800000;
      auVar228._0_8_ = 0x7f8000007f800000;
      auVar228._12_4_ = 0x7f800000;
      auVar228._16_4_ = 0x7f800000;
      auVar228._20_4_ = 0x7f800000;
      auVar228._24_4_ = 0x7f800000;
      auVar228._28_4_ = 0x7f800000;
      auVar26 = vblendvps_avx(auVar228,auVar50,auVar28);
      auVar334 = ZEXT3264(auVar26);
      auVar229._8_4_ = 0xff800000;
      auVar229._0_8_ = 0xff800000ff800000;
      auVar229._12_4_ = 0xff800000;
      auVar229._16_4_ = 0xff800000;
      auVar229._20_4_ = 0xff800000;
      auVar229._24_4_ = 0xff800000;
      auVar229._28_4_ = 0xff800000;
      auVar133 = vblendvps_avx(auVar229,auVar51,auVar28);
      auVar330 = vmaxps_avx(local_600,local_3a0);
      auVar52._4_4_ = auVar330._4_4_ * 1.9073486e-06;
      auVar52._0_4_ = auVar330._0_4_ * 1.9073486e-06;
      auVar52._8_4_ = auVar330._8_4_ * 1.9073486e-06;
      auVar52._12_4_ = auVar330._12_4_ * 1.9073486e-06;
      auVar52._16_4_ = auVar330._16_4_ * 1.9073486e-06;
      auVar52._20_4_ = auVar330._20_4_ * 1.9073486e-06;
      auVar52._24_4_ = auVar330._24_4_ * 1.9073486e-06;
      auVar52._28_4_ = auVar330._28_4_;
      auVar330 = vcmpps_avx(local_2c0,auVar52,1);
      auVar293 = auVar28 & auVar330;
      if ((((((((auVar293 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar293 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar293 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar293 >> 0x7f,0) != '\0') ||
            (auVar293 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar293 >> 0xbf,0) != '\0') ||
          (auVar293 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar293[0x1f] < '\0') {
        auVar132 = vandps_avx(auVar330,auVar28);
        auVar178 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
        auVar330 = vcmpps_avx(auVar108,_DAT_01f7b000,2);
        auVar268._8_4_ = 0xff800000;
        auVar268._0_8_ = 0xff800000ff800000;
        auVar268._12_4_ = 0xff800000;
        auVar268._16_4_ = 0xff800000;
        auVar268._20_4_ = 0xff800000;
        auVar268._24_4_ = 0xff800000;
        auVar268._28_4_ = 0xff800000;
        auVar269._8_4_ = 0x7f800000;
        auVar269._0_8_ = 0x7f8000007f800000;
        auVar269._12_4_ = 0x7f800000;
        auVar269._16_4_ = 0x7f800000;
        auVar269._20_4_ = 0x7f800000;
        auVar269._24_4_ = 0x7f800000;
        auVar269._28_4_ = 0x7f800000;
        auVar108 = vblendvps_avx(auVar269,auVar268,auVar330);
        auVar195 = vpmovsxwd_avx(auVar178);
        auVar178 = vpunpckhwd_avx(auVar178,auVar178);
        auVar233._16_16_ = auVar178;
        auVar233._0_16_ = auVar195;
        auVar108 = vblendvps_avx(auVar26,auVar108,auVar233);
        auVar26 = vblendvps_avx(auVar268,auVar269,auVar330);
        auVar334 = ZEXT3264(auVar108);
        auVar133 = vblendvps_avx(auVar133,auVar26,auVar233);
        auVar210._0_8_ = auVar132._0_8_ ^ 0xffffffffffffffff;
        auVar210._8_4_ = auVar132._8_4_ ^ 0xffffffff;
        auVar210._12_4_ = auVar132._12_4_ ^ 0xffffffff;
        auVar210._16_4_ = auVar132._16_4_ ^ 0xffffffff;
        auVar210._20_4_ = auVar132._20_4_ ^ 0xffffffff;
        auVar210._24_4_ = auVar132._24_4_ ^ 0xffffffff;
        auVar210._28_4_ = auVar132._28_4_ ^ 0xffffffff;
        auVar132 = vorps_avx(auVar330,auVar210);
        auVar132 = vandps_avx(auVar28,auVar132);
      }
    }
    auVar287 = ZEXT3264(local_640);
    auVar108 = local_5c0 & auVar132;
    fVar310 = (float)local_9a0._0_4_;
    fVar308 = (float)local_9a0._4_4_;
    fVar355 = fStack_998;
    fVar146 = fStack_994;
    fVar358 = fStack_990;
    fVar361 = fStack_98c;
    fVar364 = fStack_988;
    fVar241 = fStack_984;
    if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar108 >> 0x7f,0) != '\0') ||
          (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar108 >> 0xbf,0) != '\0') ||
        (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar108[0x1f] < '\0') {
      auVar110 = ZEXT432((uint)*(float *)(ray + k * 4 + 0x80));
      local_3e0 = auVar110;
      auVar178 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_930._0_4_));
      auVar178 = vshufps_avx(auVar178,auVar178,0);
      auVar230._16_16_ = auVar178;
      auVar230._0_16_ = auVar178;
      auVar28 = vminps_avx(auVar230,auVar133);
      auVar111._0_4_ =
           (float)local_8e0._0_4_ * fVar373 +
           (float)local_720._0_4_ * fVar325 + (float)local_740._0_4_ * fVar343;
      auVar111._4_4_ =
           (float)local_8e0._4_4_ * fVar375 +
           (float)local_720._4_4_ * fVar335 + (float)local_740._4_4_ * fVar350;
      auVar111._8_4_ = fStack_8d8 * fVar272 + fStack_718 * fVar336 + fStack_738 * fVar353;
      auVar111._12_4_ = fStack_8d4 * fVar275 + fStack_714 * fVar337 + fStack_734 * fVar356;
      auVar111._16_4_ = fStack_8d0 * fVar277 + fStack_710 * fVar338 + fStack_730 * fVar359;
      auVar111._20_4_ = fStack_8cc * fVar279 + fStack_70c * fVar339 + fStack_72c * fVar362;
      auVar111._24_4_ = fStack_8c8 * fVar281 + fStack_708 * fVar340 + fStack_728 * fVar365;
      auVar111._28_4_ = fVar367 + fStack_1e4 + fVar367;
      auVar330 = vrcpps_avx(auVar111);
      fVar367 = auVar330._0_4_;
      fVar252 = auVar330._4_4_;
      auVar53._4_4_ = auVar111._4_4_ * fVar252;
      auVar53._0_4_ = auVar111._0_4_ * fVar367;
      fVar254 = auVar330._8_4_;
      auVar53._8_4_ = auVar111._8_4_ * fVar254;
      fVar256 = auVar330._12_4_;
      auVar53._12_4_ = auVar111._12_4_ * fVar256;
      fVar257 = auVar330._16_4_;
      auVar53._16_4_ = auVar111._16_4_ * fVar257;
      fVar258 = auVar330._20_4_;
      auVar53._20_4_ = auVar111._20_4_ * fVar258;
      fVar259 = auVar330._24_4_;
      auVar53._24_4_ = auVar111._24_4_ * fVar259;
      auVar53._28_4_ = fStack_984 + auVar178._12_4_;
      auVar284._8_4_ = 0x3f800000;
      auVar284._0_8_ = 0x3f8000003f800000;
      auVar284._12_4_ = 0x3f800000;
      auVar284._16_4_ = 0x3f800000;
      auVar284._20_4_ = 0x3f800000;
      auVar284._24_4_ = 0x3f800000;
      auVar284._28_4_ = 0x3f800000;
      auVar293 = vsubps_avx(auVar284,auVar53);
      auVar266._8_4_ = 0x7fffffff;
      auVar266._0_8_ = 0x7fffffff7fffffff;
      auVar266._12_4_ = 0x7fffffff;
      auVar266._16_4_ = 0x7fffffff;
      auVar266._20_4_ = 0x7fffffff;
      auVar266._24_4_ = 0x7fffffff;
      auVar266._28_4_ = 0x7fffffff;
      auVar108 = vandps_avx(auVar111,auVar266);
      auVar378._8_4_ = 0x219392ef;
      auVar378._0_8_ = 0x219392ef219392ef;
      auVar378._12_4_ = 0x219392ef;
      auVar378._16_4_ = 0x219392ef;
      auVar378._20_4_ = 0x219392ef;
      auVar378._24_4_ = 0x219392ef;
      auVar378._28_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar108,auVar378,1);
      auVar54._4_4_ =
           (fVar252 + fVar252 * auVar293._4_4_) *
           -(fVar375 * fVar382 + fVar335 * fVar319 + fVar350 * fVar316);
      auVar54._0_4_ =
           (fVar367 + fVar367 * auVar293._0_4_) *
           -(fVar373 * fVar380 + fVar325 * fVar149 + fVar343 * fVar311);
      auVar54._8_4_ =
           (fVar254 + fVar254 * auVar293._8_4_) *
           -(fVar272 * fVar384 + fVar336 * fVar255 + fVar353 * fVar318);
      auVar54._12_4_ =
           (fVar256 + fVar256 * auVar293._12_4_) *
           -(fVar275 * fVar385 + fVar337 * fVar237 + fVar356 * fVar320);
      auVar54._16_4_ =
           (fVar257 + fVar257 * auVar293._16_4_) *
           -(fVar277 * fVar387 + fVar338 * fVar296 + fVar359 * fVar321);
      auVar54._20_4_ =
           (fVar258 + fVar258 * auVar293._20_4_) *
           -(fVar279 * fVar388 + fVar339 * fVar324 + fVar362 * fVar322);
      auVar54._24_4_ =
           (fVar259 + fVar259 * auVar293._24_4_) *
           -(fVar281 * fVar390 + fVar340 * fVar302 + fVar365 * fVar323);
      auVar54._28_4_ = auVar330._28_4_ + auVar293._28_4_;
      auVar293 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar108 = vcmpps_avx(auVar111,auVar293,1);
      auVar108 = vorps_avx(auVar26,auVar108);
      auVar348._8_4_ = 0xff800000;
      auVar348._0_8_ = 0xff800000ff800000;
      auVar348._12_4_ = 0xff800000;
      auVar348._16_4_ = 0xff800000;
      auVar348._20_4_ = 0xff800000;
      auVar348._24_4_ = 0xff800000;
      auVar348._28_4_ = 0xff800000;
      auVar108 = vblendvps_avx(auVar54,auVar348,auVar108);
      auVar330 = vcmpps_avx(auVar111,auVar293,6);
      auVar26 = vorps_avx(auVar26,auVar330);
      auVar370._8_4_ = 0x7f800000;
      auVar370._0_8_ = 0x7f8000007f800000;
      auVar370._12_4_ = 0x7f800000;
      auVar370._16_4_ = 0x7f800000;
      auVar370._20_4_ = 0x7f800000;
      auVar370._24_4_ = 0x7f800000;
      auVar370._28_4_ = 0x7f800000;
      auVar26 = vblendvps_avx(auVar54,auVar370,auVar26);
      auVar330 = vmaxps_avx(local_340,auVar334._0_32_);
      auVar330 = vmaxps_avx(auVar330,auVar108);
      auVar28 = vminps_avx(auVar28,auVar26);
      auVar287 = ZEXT3264(auVar28);
      auVar108 = vsubps_avx(auVar293,auVar22);
      auVar26 = vsubps_avx(auVar293,auVar23);
      auVar55._4_4_ = auVar26._4_4_ * -fVar351;
      auVar55._0_4_ = auVar26._0_4_ * -fVar344;
      auVar55._8_4_ = auVar26._8_4_ * -fVar354;
      auVar55._12_4_ = auVar26._12_4_ * -fVar357;
      auVar55._16_4_ = auVar26._16_4_ * -fVar360;
      auVar55._20_4_ = auVar26._20_4_ * -fVar363;
      auVar55._24_4_ = auVar26._24_4_ * -fVar366;
      auVar55._28_4_ = auVar26._28_4_;
      auVar56._4_4_ = fVar368 * auVar108._4_4_;
      auVar56._0_4_ = fVar217 * auVar108._0_4_;
      auVar56._8_4_ = fVar383 * auVar108._8_4_;
      auVar56._12_4_ = fVar371 * auVar108._12_4_;
      auVar56._16_4_ = fVar386 * auVar108._16_4_;
      auVar56._20_4_ = fVar372 * auVar108._20_4_;
      auVar56._24_4_ = fVar389 * auVar108._24_4_;
      auVar56._28_4_ = auVar108._28_4_;
      auVar108 = vsubps_avx(auVar55,auVar56);
      auVar26 = vsubps_avx(auVar293,auVar25);
      auVar57._4_4_ = fVar376 * auVar26._4_4_;
      auVar57._0_4_ = fVar374 * auVar26._0_4_;
      auVar57._8_4_ = fVar273 * auVar26._8_4_;
      auVar57._12_4_ = fVar276 * auVar26._12_4_;
      auVar57._16_4_ = fVar278 * auVar26._16_4_;
      auVar57._20_4_ = fVar280 * auVar26._20_4_;
      uVar89 = auVar26._28_4_;
      auVar57._24_4_ = fVar282 * auVar26._24_4_;
      auVar57._28_4_ = uVar89;
      auVar22 = vsubps_avx(auVar108,auVar57);
      auVar58._4_4_ = (float)local_740._4_4_ * -fVar351;
      auVar58._0_4_ = (float)local_740._0_4_ * -fVar344;
      auVar58._8_4_ = fStack_738 * -fVar354;
      auVar58._12_4_ = fStack_734 * -fVar357;
      auVar58._16_4_ = fStack_730 * -fVar360;
      auVar58._20_4_ = fStack_72c * -fVar363;
      auVar58._24_4_ = fStack_728 * -fVar366;
      auVar58._28_4_ = uVar91 ^ 0x80000000;
      auVar331._8_4_ = 0x3f800000;
      auVar331._0_8_ = 0x3f8000003f800000;
      auVar331._12_4_ = 0x3f800000;
      auVar331._16_4_ = 0x3f800000;
      auVar331._20_4_ = 0x3f800000;
      auVar331._24_4_ = 0x3f800000;
      auVar331._28_4_ = 0x3f800000;
      auVar334 = ZEXT3264(auVar331);
      auVar59._4_4_ = (float)local_720._4_4_ * fVar368;
      auVar59._0_4_ = (float)local_720._0_4_ * fVar217;
      auVar59._8_4_ = fStack_718 * fVar383;
      auVar59._12_4_ = fStack_714 * fVar371;
      auVar59._16_4_ = fStack_710 * fVar386;
      auVar59._20_4_ = fStack_70c * fVar372;
      auVar59._24_4_ = fStack_708 * fVar389;
      auVar59._28_4_ = uVar89;
      auVar108 = vsubps_avx(auVar58,auVar59);
      auVar60._4_4_ = (float)local_8e0._4_4_ * fVar376;
      auVar60._0_4_ = (float)local_8e0._0_4_ * fVar374;
      auVar60._8_4_ = fStack_8d8 * fVar273;
      auVar60._12_4_ = fStack_8d4 * fVar276;
      auVar60._16_4_ = fStack_8d0 * fVar278;
      auVar60._20_4_ = fStack_8cc * fVar280;
      auVar60._24_4_ = fStack_8c8 * fVar282;
      auVar60._28_4_ = uVar89;
      auVar25 = vsubps_avx(auVar108,auVar60);
      auVar108 = vrcpps_avx(auVar25);
      fVar149 = auVar108._0_4_;
      fVar319 = auVar108._4_4_;
      auVar61._4_4_ = auVar25._4_4_ * fVar319;
      auVar61._0_4_ = auVar25._0_4_ * fVar149;
      fVar255 = auVar108._8_4_;
      auVar61._8_4_ = auVar25._8_4_ * fVar255;
      fVar237 = auVar108._12_4_;
      auVar61._12_4_ = auVar25._12_4_ * fVar237;
      fVar296 = auVar108._16_4_;
      auVar61._16_4_ = auVar25._16_4_ * fVar296;
      fVar324 = auVar108._20_4_;
      auVar61._20_4_ = auVar25._20_4_ * fVar324;
      fVar302 = auVar108._24_4_;
      auVar61._24_4_ = auVar25._24_4_ * fVar302;
      auVar61._28_4_ = fStack_8c4;
      auVar293 = vsubps_avx(auVar331,auVar61);
      auVar108 = vandps_avx(auVar25,auVar266);
      auVar112._8_4_ = 0x219392ef;
      auVar112._0_8_ = 0x219392ef219392ef;
      auVar112._12_4_ = 0x219392ef;
      auVar112._16_4_ = 0x219392ef;
      auVar112._20_4_ = 0x219392ef;
      auVar112._24_4_ = 0x219392ef;
      auVar112._28_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar108,auVar112,1);
      auVar62._4_4_ = (fVar319 + fVar319 * auVar293._4_4_) * -auVar22._4_4_;
      auVar62._0_4_ = (fVar149 + fVar149 * auVar293._0_4_) * -auVar22._0_4_;
      auVar62._8_4_ = (fVar255 + fVar255 * auVar293._8_4_) * -auVar22._8_4_;
      auVar62._12_4_ = (fVar237 + fVar237 * auVar293._12_4_) * -auVar22._12_4_;
      auVar62._16_4_ = (fVar296 + fVar296 * auVar293._16_4_) * -auVar22._16_4_;
      auVar62._20_4_ = (fVar324 + fVar324 * auVar293._20_4_) * -auVar22._20_4_;
      auVar62._24_4_ = (fVar302 + fVar302 * auVar293._24_4_) * -auVar22._24_4_;
      auVar62._28_4_ = auVar22._28_4_ ^ 0x80000000;
      auVar108 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,1);
      auVar108 = vorps_avx(auVar26,auVar108);
      auVar108 = vblendvps_avx(auVar62,auVar348,auVar108);
      local_900 = vmaxps_avx(auVar330,auVar108);
      auVar108 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,6);
      auVar108 = vorps_avx(auVar26,auVar108);
      auVar108 = vblendvps_avx(auVar62,auVar370,auVar108);
      auVar132 = vandps_avx(auVar132,local_5c0);
      local_400 = vminps_avx(auVar28,auVar108);
      auVar108 = vcmpps_avx(local_900,local_400,2);
      auVar26 = auVar132 & auVar108;
      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar26 >> 0x7f,0) != '\0') ||
            (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0xbf,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar26[0x1f] < '\0') {
        auVar26 = vminps_avx(auVar227,local_680);
        auVar22 = vminps_avx(auVar24,auVar27);
        auVar26 = vminps_avx(auVar26,auVar22);
        auVar26 = vsubps_avx(auVar26,local_700);
        auVar132 = vandps_avx(auVar108,auVar132);
        auVar79._4_4_ = fStack_37c;
        auVar79._0_4_ = local_380;
        auVar79._8_4_ = fStack_378;
        auVar79._12_4_ = fStack_374;
        auVar79._16_4_ = fStack_370;
        auVar79._20_4_ = fStack_36c;
        auVar79._24_4_ = fStack_368;
        auVar79._28_4_ = fStack_364;
        auVar108 = vminps_avx(auVar79,auVar331);
        auVar204 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar108 = vmaxps_avx(auVar108,ZEXT832(0) << 0x20);
        fVar149 = DAT_01f7b060._28_4_;
        local_1a0[0] = fVar147 + fVar213 * (auVar108._0_4_ + (float)DAT_01f7b060) * 0.125;
        local_1a0[1] = fVar190 + fVar214 * (auVar108._4_4_ + DAT_01f7b060._4_4_) * 0.125;
        local_1a0[2] = fVar211 + fVar215 * (auVar108._8_4_ + DAT_01f7b060._8_4_) * 0.125;
        local_1a0[3] = fStack_a44 + fVar216 * (auVar108._12_4_ + DAT_01f7b060._12_4_) * 0.125;
        fStack_190 = fVar147 + fVar213 * (auVar108._16_4_ + DAT_01f7b060._16_4_) * 0.125;
        fStack_18c = fVar190 + fVar214 * (auVar108._20_4_ + DAT_01f7b060._20_4_) * 0.125;
        fStack_188 = fVar211 + fVar215 * (auVar108._24_4_ + DAT_01f7b060._24_4_) * 0.125;
        fStack_184 = fStack_a44 + auVar108._28_4_ + fVar149;
        auVar80._4_4_ = fStack_35c;
        auVar80._0_4_ = local_360;
        auVar80._8_4_ = fStack_358;
        auVar80._12_4_ = fStack_354;
        auVar80._16_4_ = fStack_350;
        auVar80._20_4_ = fStack_34c;
        auVar80._24_4_ = fStack_348;
        auVar80._28_4_ = fStack_344;
        auVar108 = vminps_avx(auVar80,auVar331);
        auVar108 = vmaxps_avx(auVar108,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar147 + fVar213 * (auVar108._0_4_ + (float)DAT_01f7b060) * 0.125;
        local_1c0[1] = fVar190 + fVar214 * (auVar108._4_4_ + DAT_01f7b060._4_4_) * 0.125;
        local_1c0[2] = fVar211 + fVar215 * (auVar108._8_4_ + DAT_01f7b060._8_4_) * 0.125;
        local_1c0[3] = fStack_a44 + fVar216 * (auVar108._12_4_ + DAT_01f7b060._12_4_) * 0.125;
        fStack_1b0 = fVar147 + fVar213 * (auVar108._16_4_ + DAT_01f7b060._16_4_) * 0.125;
        fStack_1ac = fVar190 + fVar214 * (auVar108._20_4_ + DAT_01f7b060._20_4_) * 0.125;
        fStack_1a8 = fVar211 + fVar215 * (auVar108._24_4_ + DAT_01f7b060._24_4_) * 0.125;
        fStack_1a4 = fStack_a44 + auVar108._28_4_ + fVar149;
        auVar63._4_4_ = auVar26._4_4_ * 0.99999976;
        auVar63._0_4_ = auVar26._0_4_ * 0.99999976;
        auVar63._8_4_ = auVar26._8_4_ * 0.99999976;
        auVar63._12_4_ = auVar26._12_4_ * 0.99999976;
        auVar63._16_4_ = auVar26._16_4_ * 0.99999976;
        auVar63._20_4_ = auVar26._20_4_ * 0.99999976;
        auVar63._24_4_ = auVar26._24_4_ * 0.99999976;
        auVar63._28_4_ = 0x3f7ffffc;
        auVar108 = vmaxps_avx(ZEXT832(0) << 0x20,auVar63);
        auVar64._4_4_ = auVar108._4_4_ * auVar108._4_4_;
        auVar64._0_4_ = auVar108._0_4_ * auVar108._0_4_;
        auVar64._8_4_ = auVar108._8_4_ * auVar108._8_4_;
        auVar64._12_4_ = auVar108._12_4_ * auVar108._12_4_;
        auVar64._16_4_ = auVar108._16_4_ * auVar108._16_4_;
        auVar64._20_4_ = auVar108._20_4_ * auVar108._20_4_;
        auVar64._24_4_ = auVar108._24_4_ * auVar108._24_4_;
        auVar64._28_4_ = auVar108._28_4_;
        auVar26 = vsubps_avx(local_6a0,auVar64);
        auVar65._4_4_ = auVar26._4_4_ * (float)local_6e0._4_4_;
        auVar65._0_4_ = auVar26._0_4_ * (float)local_6e0._0_4_;
        auVar65._8_4_ = auVar26._8_4_ * fStack_6d8;
        auVar65._12_4_ = auVar26._12_4_ * fStack_6d4;
        auVar65._16_4_ = auVar26._16_4_ * fStack_6d0;
        auVar65._20_4_ = auVar26._20_4_ * fStack_6cc;
        auVar65._24_4_ = auVar26._24_4_ * fStack_6c8;
        auVar65._28_4_ = auVar108._28_4_;
        auVar22 = vsubps_avx(local_6c0,auVar65);
        local_960 = vcmpps_avx(auVar22,ZEXT832(0) << 0x20,5);
        auVar108 = local_960;
        if ((((((((local_960 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_960 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_960 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_960 >> 0x7f,0) == '\0') &&
              (local_960 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_960 >> 0xbf,0) == '\0') &&
            (local_960 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_960[0x1f]) {
          auVar264 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar248 = ZEXT1628(ZEXT816(0) << 0x40);
          local_b40 = 0.0;
          fStack_b3c = 0.0;
          fStack_b38 = 0.0;
          fStack_b34 = 0.0;
          fStack_b30 = 0.0;
          fStack_b2c = 0.0;
          fStack_b28 = 0.0;
          fStack_b24 = 0.0;
          auVar225 = SUB6428(ZEXT864(0),0) << 0x20;
          _local_bc0 = SUB3228(ZEXT832(0),0) << 0x20;
          auVar285._8_4_ = 0x7f800000;
          auVar285._0_8_ = 0x7f8000007f800000;
          auVar285._12_4_ = 0x7f800000;
          auVar285._16_4_ = 0x7f800000;
          auVar285._20_4_ = 0x7f800000;
          auVar285._24_4_ = 0x7f800000;
          auVar285._28_4_ = 0x7f800000;
          auVar332._8_4_ = 0xff800000;
          auVar332._0_8_ = 0xff800000ff800000;
          auVar332._12_4_ = 0xff800000;
          auVar332._16_4_ = 0xff800000;
          auVar332._20_4_ = 0xff800000;
          auVar332._24_4_ = 0xff800000;
          auVar332._28_4_ = 0xff800000;
          auVar16 = auVar26;
          _local_a60 = auVar23;
          local_960 = auVar31;
        }
        else {
          auVar23 = vrcpps_avx(local_300);
          fVar319 = auVar23._0_4_;
          auVar205._0_4_ = local_300._0_4_ * fVar319;
          fVar255 = auVar23._4_4_;
          auVar205._4_4_ = local_300._4_4_ * fVar255;
          fVar237 = auVar23._8_4_;
          auVar205._8_4_ = local_300._8_4_ * fVar237;
          fVar296 = auVar23._12_4_;
          auVar205._12_4_ = local_300._12_4_ * fVar296;
          fVar324 = auVar23._16_4_;
          auVar205._16_4_ = local_300._16_4_ * fVar324;
          fVar302 = auVar23._20_4_;
          auVar205._20_4_ = local_300._20_4_ * fVar302;
          fVar147 = auVar23._24_4_;
          auVar205._24_4_ = local_300._24_4_ * fVar147;
          auVar205._28_4_ = 0;
          auVar25 = vsubps_avx(auVar331,auVar205);
          auVar24 = vsqrtps_avx(auVar22);
          fVar319 = fVar319 + fVar319 * auVar25._0_4_;
          fVar255 = fVar255 + fVar255 * auVar25._4_4_;
          fVar237 = fVar237 + fVar237 * auVar25._8_4_;
          fVar296 = fVar296 + fVar296 * auVar25._12_4_;
          fVar324 = fVar324 + fVar324 * auVar25._16_4_;
          fVar302 = fVar302 + fVar302 * auVar25._20_4_;
          fVar147 = fVar147 + fVar147 * auVar25._24_4_;
          auVar27 = vsubps_avx(local_2e0,auVar24);
          fVar368 = auVar27._0_4_ * fVar319;
          fVar383 = auVar27._4_4_ * fVar255;
          auVar66._4_4_ = fVar383;
          auVar66._0_4_ = fVar368;
          fVar371 = auVar27._8_4_ * fVar237;
          auVar66._8_4_ = fVar371;
          fVar386 = auVar27._12_4_ * fVar296;
          auVar66._12_4_ = fVar386;
          fVar372 = auVar27._16_4_ * fVar324;
          auVar66._16_4_ = fVar372;
          fVar389 = auVar27._20_4_ * fVar302;
          auVar66._20_4_ = fVar389;
          fVar373 = auVar27._24_4_ * fVar147;
          auVar66._24_4_ = fVar373;
          auVar66._28_4_ = auVar132._28_4_;
          auVar27 = vsubps_avx(auVar24,local_3c0);
          fVar319 = auVar27._0_4_ * fVar319;
          fVar255 = auVar27._4_4_ * fVar255;
          auVar67._4_4_ = fVar255;
          auVar67._0_4_ = fVar319;
          fVar237 = auVar27._8_4_ * fVar237;
          auVar67._8_4_ = fVar237;
          fVar296 = auVar27._12_4_ * fVar296;
          auVar67._12_4_ = fVar296;
          fVar324 = auVar27._16_4_ * fVar324;
          auVar67._16_4_ = fVar324;
          fVar302 = auVar27._20_4_ * fVar302;
          auVar67._20_4_ = fVar302;
          fVar147 = auVar27._24_4_ * fVar147;
          auVar67._24_4_ = fVar147;
          auVar67._28_4_ = 0x80000000;
          fVar190 = fVar271 * (fVar368 * local_620._0_4_ + local_640._0_4_);
          fVar211 = fVar212 * (fVar383 * local_620._4_4_ + local_640._4_4_);
          fVar213 = fVar218 * (fVar371 * local_620._8_4_ + local_640._8_4_);
          fVar214 = fVar238 * (fVar386 * local_620._12_4_ + local_640._12_4_);
          fVar215 = fVar298 * (fVar372 * local_620._16_4_ + local_640._16_4_);
          fVar216 = fVar341 * (fVar389 * local_620._20_4_ + local_640._20_4_);
          fVar217 = fVar305 * (fVar373 * local_620._24_4_ + local_640._24_4_);
          auVar134._0_4_ = local_980 + fVar190 * fVar315;
          auVar134._4_4_ = fStack_97c + fVar211 * fVar274;
          auVar134._8_4_ = fStack_978 + fVar213 * fVar253;
          auVar134._12_4_ = fStack_974 + fVar214 * fVar236;
          auVar134._16_4_ = fStack_970 + fVar215 * fVar294;
          auVar134._20_4_ = fStack_96c + fVar216 * fVar306;
          auVar134._24_4_ = fStack_968 + fVar217 * fVar352;
          auVar134._28_4_ = fStack_964 + auVar23._28_4_ + auVar25._28_4_ + local_640._28_4_;
          auVar68._4_4_ = fVar383 * (float)local_8e0._4_4_;
          auVar68._0_4_ = fVar368 * (float)local_8e0._0_4_;
          auVar68._8_4_ = fVar371 * fStack_8d8;
          auVar68._12_4_ = fVar386 * fStack_8d4;
          auVar68._16_4_ = fVar372 * fStack_8d0;
          auVar68._20_4_ = fVar389 * fStack_8cc;
          auVar68._24_4_ = fVar373 * fStack_8c8;
          auVar68._28_4_ = auVar24._28_4_;
          auVar25 = vsubps_avx(auVar68,auVar134);
          auVar16._4_4_ = fVar295;
          auVar16._0_4_ = fVar289;
          auVar16._8_4_ = fVar297;
          auVar16._12_4_ = fVar299;
          auVar16._16_4_ = fVar301;
          auVar16._20_4_ = fVar304;
          auVar16._24_4_ = fVar307;
          auVar16._28_4_ = fVar309;
          auVar231._0_4_ = fVar289 + fVar145 * fVar190;
          auVar231._4_4_ = fVar295 + fVar317 * fVar211;
          auVar231._8_4_ = fVar297 + fVar240 * fVar213;
          auVar231._12_4_ = fVar299 + fVar234 * fVar214;
          auVar231._16_4_ = fVar301 + fVar239 * fVar215;
          auVar231._20_4_ = fVar304 + fVar300 * fVar216;
          auVar231._24_4_ = fVar307 + fVar342 * fVar217;
          auVar231._28_4_ = fVar309 + auVar24._28_4_;
          auVar81._4_4_ = (float)local_720._4_4_ * fVar383;
          auVar81._0_4_ = (float)local_720._0_4_ * fVar368;
          auVar81._8_4_ = fStack_718 * fVar371;
          auVar81._12_4_ = fStack_714 * fVar386;
          auVar81._16_4_ = fStack_710 * fVar372;
          auVar81._20_4_ = fStack_70c * fVar389;
          auVar81._24_4_ = fStack_708 * fVar373;
          auVar81._28_4_ = fVar149;
          auVar24 = vsubps_avx(auVar81,auVar231);
          auVar206._0_4_ = fVar148 + fVar270 * fVar190;
          auVar206._4_4_ = fVar163 + fVar93 * fVar211;
          auVar206._8_4_ = fVar164 + fVar251 * fVar213;
          auVar206._12_4_ = fVar165 + fVar235 * fVar214;
          auVar206._16_4_ = fVar166 + fVar288 * fVar215;
          auVar206._20_4_ = fVar167 + fVar303 * fVar216;
          auVar206._24_4_ = fVar168 + fVar349 * fVar217;
          auVar206._28_4_ = fVar169 + auVar27._28_4_;
          auVar69._4_4_ = (float)local_740._4_4_ * fVar383;
          auVar69._0_4_ = (float)local_740._0_4_ * fVar368;
          auVar69._8_4_ = fStack_738 * fVar371;
          auVar69._12_4_ = fStack_734 * fVar386;
          auVar69._16_4_ = fStack_730 * fVar372;
          auVar69._20_4_ = fStack_72c * fVar389;
          auVar69._24_4_ = fStack_728 * fVar373;
          auVar69._28_4_ = fVar149;
          auVar23 = vsubps_avx(auVar69,auVar206);
          _local_bc0 = auVar23._0_28_;
          fVar271 = fVar271 * (fVar319 * local_620._0_4_ + local_640._0_4_);
          fVar212 = fVar212 * (fVar255 * local_620._4_4_ + local_640._4_4_);
          fVar218 = fVar218 * (fVar237 * local_620._8_4_ + local_640._8_4_);
          fVar238 = fVar238 * (fVar296 * local_620._12_4_ + local_640._12_4_);
          fVar298 = fVar298 * (fVar324 * local_620._16_4_ + local_640._16_4_);
          fVar341 = fVar341 * (fVar302 * local_620._20_4_ + local_640._20_4_);
          fVar305 = fVar305 * (fVar147 * local_620._24_4_ + local_640._24_4_);
          auVar207._0_4_ = local_980 + fVar271 * fVar315;
          auVar207._4_4_ = fStack_97c + fVar212 * fVar274;
          auVar207._8_4_ = fStack_978 + fVar218 * fVar253;
          auVar207._12_4_ = fStack_974 + fVar238 * fVar236;
          auVar207._16_4_ = fStack_970 + fVar298 * fVar294;
          auVar207._20_4_ = fStack_96c + fVar341 * fVar306;
          auVar207._24_4_ = fStack_968 + fVar305 * fVar352;
          auVar207._28_4_ = fStack_964 + auVar23._28_4_ + local_640._28_4_;
          auVar70._4_4_ = fVar255 * (float)local_8e0._4_4_;
          auVar70._0_4_ = fVar319 * (float)local_8e0._0_4_;
          auVar70._8_4_ = fVar237 * fStack_8d8;
          auVar70._12_4_ = fVar296 * fStack_8d4;
          auVar70._16_4_ = fVar324 * fStack_8d0;
          auVar70._20_4_ = fVar302 * fStack_8cc;
          auVar70._24_4_ = fVar147 * fStack_8c8;
          auVar70._28_4_ = fStack_8c4;
          auVar23 = vsubps_avx(auVar70,auVar207);
          auVar204 = auVar23._0_28_;
          auVar267._0_4_ = fVar289 + fVar145 * fVar271;
          auVar267._4_4_ = fVar295 + fVar317 * fVar212;
          auVar267._8_4_ = fVar297 + fVar240 * fVar218;
          auVar267._12_4_ = fVar299 + fVar234 * fVar238;
          auVar267._16_4_ = fVar301 + fVar239 * fVar298;
          auVar267._20_4_ = fVar304 + fVar300 * fVar341;
          auVar267._24_4_ = fVar307 + fVar342 * fVar305;
          auVar267._28_4_ = fVar309 + fStack_8c4;
          auVar71._4_4_ = (float)local_720._4_4_ * fVar255;
          auVar71._0_4_ = (float)local_720._0_4_ * fVar319;
          auVar71._8_4_ = fStack_718 * fVar237;
          auVar71._12_4_ = fStack_714 * fVar296;
          auVar71._16_4_ = fStack_710 * fVar324;
          auVar71._20_4_ = fStack_70c * fVar302;
          auVar71._24_4_ = fStack_708 * fVar147;
          auVar71._28_4_ = fStack_704;
          auVar23 = vsubps_avx(auVar71,auVar267);
          auVar264 = auVar23._0_28_;
          auVar249._0_4_ = fVar148 + fVar270 * fVar271;
          auVar249._4_4_ = fVar163 + fVar93 * fVar212;
          auVar249._8_4_ = fVar164 + fVar251 * fVar218;
          auVar249._12_4_ = fVar165 + fVar235 * fVar238;
          auVar249._16_4_ = fVar166 + fVar288 * fVar298;
          auVar249._20_4_ = fVar167 + fVar303 * fVar341;
          auVar249._24_4_ = fVar168 + fVar349 * fVar305;
          auVar249._28_4_ = fVar169 + fVar149;
          auVar72._4_4_ = (float)local_740._4_4_ * fVar255;
          auVar72._0_4_ = (float)local_740._0_4_ * fVar319;
          auVar72._8_4_ = fStack_738 * fVar237;
          auVar72._12_4_ = fStack_734 * fVar296;
          auVar72._16_4_ = fStack_730 * fVar324;
          auVar72._20_4_ = fStack_72c * fVar302;
          auVar72._24_4_ = fStack_728 * fVar147;
          auVar72._28_4_ = fStack_704;
          auVar23 = vsubps_avx(auVar72,auVar249);
          auVar248 = auVar23._0_28_;
          auVar22 = vcmpps_avx(auVar22,ZEXT832(0) << 0x20,5);
          auVar286._8_4_ = 0x7f800000;
          auVar286._0_8_ = 0x7f8000007f800000;
          auVar286._12_4_ = 0x7f800000;
          auVar286._16_4_ = 0x7f800000;
          auVar286._20_4_ = 0x7f800000;
          auVar286._24_4_ = 0x7f800000;
          auVar286._28_4_ = 0x7f800000;
          auVar285 = vblendvps_avx(auVar286,auVar66,auVar22);
          auVar23 = vmaxps_avx(local_600,local_3a0);
          auVar73._4_4_ = auVar23._4_4_ * 1.9073486e-06;
          auVar73._0_4_ = auVar23._0_4_ * 1.9073486e-06;
          auVar73._8_4_ = auVar23._8_4_ * 1.9073486e-06;
          auVar73._12_4_ = auVar23._12_4_ * 1.9073486e-06;
          auVar73._16_4_ = auVar23._16_4_ * 1.9073486e-06;
          auVar73._20_4_ = auVar23._20_4_ * 1.9073486e-06;
          auVar73._24_4_ = auVar23._24_4_ * 1.9073486e-06;
          auVar73._28_4_ = auVar23._28_4_;
          auVar23 = vcmpps_avx(local_2c0,auVar73,1);
          auVar333._8_4_ = 0xff800000;
          auVar333._0_8_ = 0xff800000ff800000;
          auVar333._12_4_ = 0xff800000;
          auVar333._16_4_ = 0xff800000;
          auVar333._20_4_ = 0xff800000;
          auVar333._24_4_ = 0xff800000;
          auVar333._28_4_ = 0xff800000;
          auVar332 = vblendvps_avx(auVar333,auVar67,auVar22);
          auVar27 = auVar22 & auVar23;
          if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0x7f,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar27 >> 0xbf,0) != '\0') ||
              (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar27[0x1f] < '\0') {
            auVar108 = vandps_avx(auVar23,auVar22);
            auVar178 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
            auVar23 = vcmpps_avx(auVar26,_DAT_01f7b000,2);
            auVar142._8_4_ = 0xff800000;
            auVar142._0_8_ = 0xff800000ff800000;
            auVar142._12_4_ = 0xff800000;
            auVar142._16_4_ = 0xff800000;
            auVar142._20_4_ = 0xff800000;
            auVar142._24_4_ = 0xff800000;
            auVar142._28_4_ = 0xff800000;
            auVar161._8_4_ = 0x7f800000;
            auVar161._0_8_ = 0x7f8000007f800000;
            auVar161._12_4_ = 0x7f800000;
            auVar161._16_4_ = 0x7f800000;
            auVar161._20_4_ = 0x7f800000;
            auVar161._24_4_ = 0x7f800000;
            auVar161._28_4_ = 0x7f800000;
            auVar26 = vblendvps_avx(auVar161,auVar142,auVar23);
            auVar195 = vpmovsxwd_avx(auVar178);
            auVar178 = vpunpckhwd_avx(auVar178,auVar178);
            auVar379._16_16_ = auVar178;
            auVar379._0_16_ = auVar195;
            auVar285 = vblendvps_avx(auVar285,auVar26,auVar379);
            auVar26 = vblendvps_avx(auVar142,auVar161,auVar23);
            auVar332 = vblendvps_avx(auVar332,auVar26,auVar379);
            auVar189._0_8_ = auVar108._0_8_ ^ 0xffffffffffffffff;
            auVar189._8_4_ = auVar108._8_4_ ^ 0xffffffff;
            auVar189._12_4_ = auVar108._12_4_ ^ 0xffffffff;
            auVar189._16_4_ = auVar108._16_4_ ^ 0xffffffff;
            auVar189._20_4_ = auVar108._20_4_ ^ 0xffffffff;
            auVar189._24_4_ = auVar108._24_4_ ^ 0xffffffff;
            auVar189._28_4_ = auVar108._28_4_ ^ 0xffffffff;
            auVar16 = vorps_avx(auVar23,auVar189);
            auVar108 = vandps_avx(auVar22,auVar16);
          }
          local_b40 = auVar25._0_4_;
          fStack_b3c = auVar25._4_4_;
          fStack_b38 = auVar25._8_4_;
          fStack_b34 = auVar25._12_4_;
          fStack_b30 = auVar25._16_4_;
          fStack_b2c = auVar25._20_4_;
          fStack_b28 = auVar25._24_4_;
          fStack_b24 = auVar25._28_4_;
          auVar225 = auVar24._0_28_;
          _local_a60 = auVar132;
        }
        _local_460 = local_900;
        local_440 = vminps_avx(local_400,auVar285);
        _local_860 = vmaxps_avx(local_900,auVar332);
        auVar334 = ZEXT3264(_local_860);
        _local_420 = _local_860;
        auVar26 = vcmpps_avx(local_900,local_440,2);
        auVar287 = ZEXT3264(auVar26);
        local_680 = vandps_avx(auVar26,auVar132);
        auVar26 = vcmpps_avx(_local_860,local_400,2);
        local_880 = vandps_avx(auVar132,auVar26);
        auVar132 = vorps_avx(local_880,local_680);
        if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar132 >> 0x7f,0) != '\0') ||
              (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar132 >> 0xbf,0) != '\0') ||
            (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar132[0x1f] < '\0') {
          auVar287 = ZEXT3264(_local_720);
          auVar334 = ZEXT3264(local_680);
          auVar158._0_8_ = auVar108._0_8_ ^ 0xffffffffffffffff;
          auVar158._8_4_ = auVar108._8_4_ ^ 0xffffffff;
          auVar158._12_4_ = auVar108._12_4_ ^ 0xffffffff;
          auVar158._16_4_ = auVar108._16_4_ ^ 0xffffffff;
          auVar158._20_4_ = auVar108._20_4_ ^ 0xffffffff;
          auVar158._24_4_ = auVar108._24_4_ ^ 0xffffffff;
          auVar158._28_4_ = auVar108._28_4_ ^ 0xffffffff;
          auVar114._0_4_ =
               (float)local_8e0._0_4_ * auVar204._0_4_ +
               (float)local_720._0_4_ * auVar264._0_4_ + (float)local_740._0_4_ * auVar248._0_4_;
          auVar114._4_4_ =
               (float)local_8e0._4_4_ * auVar204._4_4_ +
               (float)local_720._4_4_ * auVar264._4_4_ + (float)local_740._4_4_ * auVar248._4_4_;
          auVar114._8_4_ =
               fStack_8d8 * auVar204._8_4_ +
               fStack_718 * auVar264._8_4_ + fStack_738 * auVar248._8_4_;
          auVar114._12_4_ =
               fStack_8d4 * auVar204._12_4_ +
               fStack_714 * auVar264._12_4_ + fStack_734 * auVar248._12_4_;
          auVar114._16_4_ =
               fStack_8d0 * auVar204._16_4_ +
               fStack_710 * auVar264._16_4_ + fStack_730 * auVar248._16_4_;
          auVar114._20_4_ =
               fStack_8cc * auVar204._20_4_ +
               fStack_70c * auVar264._20_4_ + fStack_72c * auVar248._20_4_;
          auVar114._24_4_ =
               fStack_8c8 * auVar204._24_4_ +
               fStack_708 * auVar264._24_4_ + fStack_728 * auVar248._24_4_;
          auVar114._28_4_ = auVar16._28_4_ + local_680._28_4_ + auVar132._28_4_;
          auVar208._8_4_ = 0x7fffffff;
          auVar208._0_8_ = 0x7fffffff7fffffff;
          auVar208._12_4_ = 0x7fffffff;
          auVar208._16_4_ = 0x7fffffff;
          auVar208._20_4_ = 0x7fffffff;
          auVar208._24_4_ = 0x7fffffff;
          auVar208._28_4_ = 0x7fffffff;
          auVar132 = vandps_avx(auVar114,auVar208);
          auVar250._8_4_ = 0x3e99999a;
          auVar250._0_8_ = 0x3e99999a3e99999a;
          auVar250._12_4_ = 0x3e99999a;
          auVar250._16_4_ = 0x3e99999a;
          auVar250._20_4_ = 0x3e99999a;
          auVar250._24_4_ = 0x3e99999a;
          auVar250._28_4_ = 0x3e99999a;
          auVar132 = vcmpps_avx(auVar132,auVar250,1);
          local_6c0 = vorps_avx(auVar132,auVar158);
          auVar115._0_4_ =
               (float)local_8e0._0_4_ * local_b40 +
               (float)local_720._0_4_ * auVar225._0_4_ +
               (float)local_740._0_4_ * (float)local_bc0._0_4_;
          auVar115._4_4_ =
               (float)local_8e0._4_4_ * fStack_b3c +
               (float)local_720._4_4_ * auVar225._4_4_ +
               (float)local_740._4_4_ * (float)local_bc0._4_4_;
          auVar115._8_4_ =
               fStack_8d8 * fStack_b38 + fStack_718 * auVar225._8_4_ + fStack_738 * fStack_bb8;
          auVar115._12_4_ =
               fStack_8d4 * fStack_b34 + fStack_714 * auVar225._12_4_ + fStack_734 * fStack_bb4;
          auVar115._16_4_ =
               fStack_8d0 * fStack_b30 + fStack_710 * auVar225._16_4_ + fStack_730 * fStack_bb0;
          auVar115._20_4_ =
               fStack_8cc * fStack_b2c + fStack_70c * auVar225._20_4_ + fStack_72c * fStack_bac;
          auVar115._24_4_ =
               fStack_8c8 * fStack_b28 + fStack_708 * auVar225._24_4_ + fStack_728 * fStack_ba8;
          auVar115._28_4_ = local_6c0._28_4_ + fStack_b24 + auVar16._28_4_;
          auVar132 = vandps_avx(auVar115,auVar208);
          auVar132 = vcmpps_avx(auVar132,auVar250,1);
          auVar132 = vorps_avx(auVar132,auVar158);
          auVar135._8_4_ = 3;
          auVar135._0_8_ = 0x300000003;
          auVar135._12_4_ = 3;
          auVar135._16_4_ = 3;
          auVar135._20_4_ = 3;
          auVar135._24_4_ = 3;
          auVar135._28_4_ = 3;
          auVar159._8_4_ = 2;
          auVar159._0_8_ = 0x200000002;
          auVar159._12_4_ = 2;
          auVar159._16_4_ = 2;
          auVar159._20_4_ = 2;
          auVar159._24_4_ = 2;
          auVar159._28_4_ = 2;
          auVar132 = vblendvps_avx(auVar159,auVar135,auVar132);
          _local_6e0 = ZEXT432(local_c88);
          auVar195 = vpshufd_avx(ZEXT416(local_c88),0);
          auVar178 = vpcmpgtd_avx(auVar132._16_16_,auVar195);
          local_700._0_16_ = auVar195;
          auVar195 = vpcmpgtd_avx(auVar132._0_16_,auVar195);
          auVar136._16_16_ = auVar178;
          auVar136._0_16_ = auVar195;
          local_6a0 = vblendps_avx(ZEXT1632(auVar195),auVar136,0xf0);
          auVar132 = vandnps_avx(local_6a0,local_680);
          local_8a0._4_4_ = local_900._4_4_ + (float)local_9a0._4_4_;
          local_8a0._0_4_ = local_900._0_4_ + (float)local_9a0._0_4_;
          fStack_898 = local_900._8_4_ + fStack_998;
          fStack_894 = local_900._12_4_ + fStack_994;
          fStack_890 = local_900._16_4_ + fStack_990;
          fStack_88c = local_900._20_4_ + fStack_98c;
          fStack_888 = local_900._24_4_ + fStack_988;
          fStack_884 = local_900._28_4_ + fStack_984;
          while( true ) {
            local_480 = auVar132;
            local_ad0 = auVar21._0_4_;
            fStack_acc = auVar21._4_4_;
            fStack_ac8 = auVar21._8_4_;
            fStack_ac4 = auVar21._12_4_;
            local_ab0 = auVar19._0_4_;
            fStack_aac = auVar19._4_4_;
            fStack_aa8 = auVar19._8_4_;
            fStack_aa4 = auVar19._12_4_;
            local_ac0 = auVar20._0_4_;
            fStack_abc = auVar20._4_4_;
            fStack_ab8 = auVar20._8_4_;
            fStack_ab4 = auVar20._12_4_;
            local_bf0 = auVar18._0_4_;
            fStack_bec = auVar18._4_4_;
            fStack_be8 = auVar18._8_4_;
            fStack_be4 = auVar18._12_4_;
            if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar132 >> 0x7f,0) == '\0') &&
                  (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar132 >> 0xbf,0) == '\0') &&
                (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar132[0x1f]) break;
            auVar137._8_4_ = 0x7f800000;
            auVar137._0_8_ = 0x7f8000007f800000;
            auVar137._12_4_ = 0x7f800000;
            auVar137._16_4_ = 0x7f800000;
            auVar137._20_4_ = 0x7f800000;
            auVar137._24_4_ = 0x7f800000;
            auVar137._28_4_ = 0x7f800000;
            auVar108 = vblendvps_avx(auVar137,local_900,auVar132);
            auVar26 = vshufps_avx(auVar108,auVar108,0xb1);
            auVar26 = vminps_avx(auVar108,auVar26);
            auVar22 = vshufpd_avx(auVar26,auVar26,5);
            auVar26 = vminps_avx(auVar26,auVar22);
            auVar22 = vperm2f128_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar26,auVar22);
            auVar108 = vcmpps_avx(auVar108,auVar26,0);
            auVar26 = auVar132 & auVar108;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar132 = vandps_avx(auVar108,auVar132);
            }
            uVar82 = vmovmskps_avx(auVar132);
            uVar91 = 0;
            if (uVar82 != 0) {
              for (; (uVar82 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
              }
            }
            uVar84 = (ulong)uVar91;
            *(undefined4 *)(local_480 + uVar84 * 4) = 0;
            fVar310 = local_1a0[uVar84];
            uVar91 = *(uint *)(local_460 + uVar84 * 4);
            fVar145 = auVar17._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              auVar287 = ZEXT1664(auVar287._0_16_);
              auVar334 = ZEXT1664(auVar334._0_16_);
              fVar145 = sqrtf((float)local_9c0._0_4_);
            }
            auVar195 = vminps_avx(auVar18,auVar20);
            auVar178 = vmaxps_avx(auVar18,auVar20);
            auVar175 = vminps_avx(auVar19,auVar21);
            auVar100 = vminps_avx(auVar195,auVar175);
            auVar195 = vmaxps_avx(auVar19,auVar21);
            auVar175 = vmaxps_avx(auVar178,auVar195);
            auVar174._8_4_ = 0x7fffffff;
            auVar174._0_8_ = 0x7fffffff7fffffff;
            auVar174._12_4_ = 0x7fffffff;
            auVar178 = vandps_avx(auVar100,auVar174);
            auVar195 = vandps_avx(auVar175,auVar174);
            auVar178 = vmaxps_avx(auVar178,auVar195);
            auVar195 = vmovshdup_avx(auVar178);
            auVar195 = vmaxss_avx(auVar195,auVar178);
            auVar178 = vshufpd_avx(auVar178,auVar178,1);
            auVar178 = vmaxss_avx(auVar178,auVar195);
            local_980 = auVar178._0_4_ * 1.9073486e-06;
            local_960._0_4_ = fVar145 * 1.9073486e-06;
            local_840._0_16_ = vshufps_avx(auVar175,auVar175,0xff);
            auVar178 = vinsertps_avx(ZEXT416(uVar91),ZEXT416((uint)fVar310),0x10);
            auVar162 = ZEXT1664(auVar178);
            lVar87 = 5;
            do {
              do {
                auVar178 = auVar162._0_16_;
                bVar92 = lVar87 == 0;
                lVar87 = lVar87 + -1;
                if (bVar92) goto LAB_0092900a;
                auVar195 = vshufps_avx(auVar178,auVar178,0);
                auVar99._0_4_ = auVar195._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar99._4_4_ = auVar195._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar99._8_4_ = auVar195._8_4_ * fStack_9a8 + 0.0;
                auVar99._12_4_ = auVar195._12_4_ * fStack_9a4 + 0.0;
                auVar195 = vmovshdup_avx(auVar178);
                fVar271 = auVar195._0_4_;
                fVar315 = 1.0 - fVar271;
                fVar145 = fVar271 * 3.0;
                fVar310 = fVar145 + -5.0;
                fVar270 = fVar315 * fVar315;
                auVar195 = ZEXT416((uint)(fVar271 * fVar271 * -fVar315 * 0.5));
                auVar195 = vshufps_avx(auVar195,auVar195,0);
                auVar175 = ZEXT416((uint)((fVar270 * (fVar315 * 3.0 + -5.0) + 2.0) * 0.5));
                auVar175 = vshufps_avx(auVar175,auVar175,0);
                auVar100 = ZEXT416((uint)((fVar271 * fVar271 * fVar310 + 2.0) * 0.5));
                auVar100 = vshufps_avx(auVar100,auVar100,0);
                auVar94 = ZEXT416((uint)(fVar315 * fVar315 * -fVar271 * 0.5));
                auVar94 = vshufps_avx(auVar94,auVar94,0);
                auVar150._0_4_ =
                     auVar94._0_4_ * local_bf0 +
                     auVar100._0_4_ * local_ac0 +
                     auVar175._0_4_ * local_ab0 + auVar195._0_4_ * local_ad0;
                auVar150._4_4_ =
                     auVar94._4_4_ * fStack_bec +
                     auVar100._4_4_ * fStack_abc +
                     auVar175._4_4_ * fStack_aac + auVar195._4_4_ * fStack_acc;
                auVar150._8_4_ =
                     auVar94._8_4_ * fStack_be8 +
                     auVar100._8_4_ * fStack_ab8 +
                     auVar175._8_4_ * fStack_aa8 + auVar195._8_4_ * fStack_ac8;
                auVar150._12_4_ =
                     auVar94._12_4_ * fStack_be4 +
                     auVar100._12_4_ * fStack_ab4 +
                     auVar175._12_4_ * fStack_aa4 + auVar195._12_4_ * fStack_ac4;
                _local_a60 = auVar150;
                auVar195 = vsubps_avx(auVar99,auVar150);
                _local_a40 = auVar195;
                auVar195 = vdpps_avx(auVar195,auVar195,0x7f);
                fVar149 = auVar195._0_4_;
                if (fVar149 < 0.0) {
                  local_9e0._0_4_ = fVar271 * 9.0;
                  local_a00._0_4_ = fVar310;
                  local_a20._0_4_ = fVar270;
                  local_820._0_4_ = fVar315 * -2.0;
                  fVar317 = sqrtf(fVar149);
                  fVar310 = (float)local_a00._0_4_;
                  fVar274 = (float)local_9e0._0_4_;
                  fVar93 = (float)local_820._0_4_;
                  fVar270 = (float)local_a20._0_4_;
                }
                else {
                  auVar175 = vsqrtss_avx(auVar195,auVar195);
                  fVar317 = auVar175._0_4_;
                  fVar274 = fVar271 * 9.0;
                  fVar93 = fVar315 * -2.0;
                }
                auVar175 = ZEXT416((uint)((fVar271 * fVar271 + fVar271 * fVar93) * 0.5));
                auVar175 = vshufps_avx(auVar175,auVar175,0);
                auVar100 = ZEXT416((uint)(((fVar315 + fVar315) * (fVar145 + 2.0) +
                                          fVar315 * fVar315 * -3.0) * 0.5));
                auVar100 = vshufps_avx(auVar100,auVar100,0);
                auVar94 = ZEXT416((uint)((fVar310 * (fVar271 + fVar271) + fVar271 * fVar145) * 0.5))
                ;
                auVar94 = vshufps_avx(auVar94,auVar94,0);
                auVar95 = ZEXT416((uint)((fVar271 * (fVar315 + fVar315) - fVar270) * 0.5));
                auVar95 = vshufps_avx(auVar95,auVar95,0);
                auVar329._0_4_ =
                     local_bf0 * auVar95._0_4_ +
                     local_ac0 * auVar94._0_4_ +
                     local_ad0 * auVar175._0_4_ + local_ab0 * auVar100._0_4_;
                auVar329._4_4_ =
                     fStack_bec * auVar95._4_4_ +
                     fStack_abc * auVar94._4_4_ +
                     fStack_acc * auVar175._4_4_ + fStack_aac * auVar100._4_4_;
                auVar329._8_4_ =
                     fStack_be8 * auVar95._8_4_ +
                     fStack_ab8 * auVar94._8_4_ +
                     fStack_ac8 * auVar175._8_4_ + fStack_aa8 * auVar100._8_4_;
                auVar329._12_4_ =
                     fStack_be4 * auVar95._12_4_ +
                     fStack_ab4 * auVar94._12_4_ +
                     fStack_ac4 * auVar175._12_4_ + fStack_aa4 * auVar100._12_4_;
                auVar95 = vpermilps_avx(ZEXT416((uint)(fVar145 + -1.0)),0);
                auVar96 = vpermilps_avx(ZEXT416((uint)(fVar271 * -9.0 + 4.0)),0);
                auVar175 = vshufps_avx(ZEXT416((uint)(fVar274 + -5.0)),
                                       ZEXT416((uint)(fVar274 + -5.0)),0);
                auVar100 = ZEXT416((uint)(fVar271 * -3.0 + 2.0));
                auVar94 = vshufps_avx(auVar100,auVar100,0);
                auVar100 = vdpps_avx(auVar329,auVar329,0x7f);
                auVar122._0_4_ =
                     local_bf0 * auVar94._0_4_ +
                     local_ac0 * auVar175._0_4_ +
                     local_ab0 * auVar96._0_4_ + local_ad0 * auVar95._0_4_;
                auVar122._4_4_ =
                     fStack_bec * auVar94._4_4_ +
                     fStack_abc * auVar175._4_4_ +
                     fStack_aac * auVar96._4_4_ + fStack_acc * auVar95._4_4_;
                auVar122._8_4_ =
                     fStack_be8 * auVar94._8_4_ +
                     fStack_ab8 * auVar175._8_4_ +
                     fStack_aa8 * auVar96._8_4_ + fStack_ac8 * auVar95._8_4_;
                auVar122._12_4_ =
                     fStack_be4 * auVar94._12_4_ +
                     fStack_ab4 * auVar175._12_4_ +
                     fStack_aa4 * auVar96._12_4_ + fStack_ac4 * auVar95._12_4_;
                auVar175 = vblendps_avx(auVar100,_DAT_01f45a50,0xe);
                auVar94 = vrsqrtss_avx(auVar175,auVar175);
                fVar145 = auVar94._0_4_;
                fVar310 = auVar100._0_4_;
                auVar94 = vdpps_avx(auVar329,auVar122,0x7f);
                auVar95 = vshufps_avx(auVar100,auVar100,0);
                auVar123._0_4_ = auVar122._0_4_ * auVar95._0_4_;
                auVar123._4_4_ = auVar122._4_4_ * auVar95._4_4_;
                auVar123._8_4_ = auVar122._8_4_ * auVar95._8_4_;
                auVar123._12_4_ = auVar122._12_4_ * auVar95._12_4_;
                auVar94 = vshufps_avx(auVar94,auVar94,0);
                auVar196._0_4_ = auVar329._0_4_ * auVar94._0_4_;
                auVar196._4_4_ = auVar329._4_4_ * auVar94._4_4_;
                auVar196._8_4_ = auVar329._8_4_ * auVar94._8_4_;
                auVar196._12_4_ = auVar329._12_4_ * auVar94._12_4_;
                auVar96 = vsubps_avx(auVar123,auVar196);
                auVar94 = vrcpss_avx(auVar175,auVar175);
                auVar175 = vmaxss_avx(ZEXT416((uint)local_980),
                                      ZEXT416((uint)(auVar162._0_4_ * (float)local_960._0_4_)));
                auVar94 = ZEXT416((uint)(auVar94._0_4_ * (2.0 - fVar310 * auVar94._0_4_)));
                auVar94 = vshufps_avx(auVar94,auVar94,0);
                uVar84 = CONCAT44(auVar329._4_4_,auVar329._0_4_);
                auVar221._0_8_ = uVar84 ^ 0x8000000080000000;
                auVar221._8_4_ = -auVar329._8_4_;
                auVar221._12_4_ = -auVar329._12_4_;
                auVar95 = ZEXT416((uint)(fVar145 * 1.5 +
                                        fVar310 * -0.5 * fVar145 * fVar145 * fVar145));
                auVar95 = vshufps_avx(auVar95,auVar95,0);
                auVar176._0_4_ = auVar95._0_4_ * auVar96._0_4_ * auVar94._0_4_;
                auVar176._4_4_ = auVar95._4_4_ * auVar96._4_4_ * auVar94._4_4_;
                auVar176._8_4_ = auVar95._8_4_ * auVar96._8_4_ * auVar94._8_4_;
                auVar176._12_4_ = auVar95._12_4_ * auVar96._12_4_ * auVar94._12_4_;
                auVar246._0_4_ = auVar329._0_4_ * auVar95._0_4_;
                auVar246._4_4_ = auVar329._4_4_ * auVar95._4_4_;
                auVar246._8_4_ = auVar329._8_4_ * auVar95._8_4_;
                auVar246._12_4_ = auVar329._12_4_ * auVar95._12_4_;
                if (fVar310 < 0.0) {
                  fVar310 = sqrtf(fVar310);
                }
                else {
                  auVar100 = vsqrtss_avx(auVar100,auVar100);
                  fVar310 = auVar100._0_4_;
                }
                auVar100 = vdpps_avx(_local_a40,auVar246,0x7f);
                fVar310 = (local_980 / fVar310) * (fVar317 + 1.0) +
                          auVar175._0_4_ + fVar317 * local_980;
                auVar94 = vdpps_avx(auVar221,auVar246,0x7f);
                auVar95 = vdpps_avx(_local_a40,auVar176,0x7f);
                auVar96 = vdpps_avx(_local_9b0,auVar246,0x7f);
                auVar97 = vdpps_avx(_local_a40,auVar221,0x7f);
                fVar145 = auVar94._0_4_ + auVar95._0_4_;
                fVar270 = auVar100._0_4_;
                auVar101._0_4_ = fVar270 * fVar270;
                auVar101._4_4_ = auVar100._4_4_ * auVar100._4_4_;
                auVar101._8_4_ = auVar100._8_4_ * auVar100._8_4_;
                auVar101._12_4_ = auVar100._12_4_ * auVar100._12_4_;
                auVar95 = vsubps_avx(auVar195,auVar101);
                auVar94 = vdpps_avx(_local_a40,_local_9b0,0x7f);
                fVar315 = auVar97._0_4_ - fVar270 * fVar145;
                fVar271 = auVar94._0_4_ - fVar270 * auVar96._0_4_;
                auVar94 = vrsqrtss_avx(auVar95,auVar95);
                fVar317 = auVar95._0_4_;
                fVar270 = auVar94._0_4_;
                fVar270 = fVar270 * 1.5 + fVar317 * -0.5 * fVar270 * fVar270 * fVar270;
                if (fVar317 < 0.0) {
                  local_9e0._0_4_ = fVar315;
                  local_a00._0_4_ = fVar271;
                  local_a20._0_4_ = fVar270;
                  fVar317 = sqrtf(fVar317);
                  fVar270 = (float)local_a20._0_4_;
                  fVar315 = (float)local_9e0._0_4_;
                  fVar271 = (float)local_a00._0_4_;
                }
                else {
                  auVar94 = vsqrtss_avx(auVar95,auVar95);
                  fVar317 = auVar94._0_4_;
                }
                auVar334 = ZEXT1664(auVar100);
                auVar287 = ZEXT1664(auVar329);
                auVar97 = vpermilps_avx(_local_a60,0xff);
                auVar118 = vshufps_avx(auVar329,auVar329,0xff);
                fVar315 = fVar315 * fVar270 - auVar118._0_4_;
                auVar197._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
                auVar197._8_4_ = auVar96._8_4_ ^ 0x80000000;
                auVar197._12_4_ = auVar96._12_4_ ^ 0x80000000;
                auVar222._0_4_ = -fVar315;
                auVar222._4_4_ = 0x80000000;
                auVar222._8_4_ = 0x80000000;
                auVar222._12_4_ = 0x80000000;
                auVar94 = vinsertps_avx(auVar222,ZEXT416((uint)(fVar271 * fVar270)),0x1c);
                auVar96 = vmovsldup_avx(ZEXT416((uint)(fVar145 * fVar271 * fVar270 -
                                                      auVar96._0_4_ * fVar315)));
                auVar94 = vdivps_avx(auVar94,auVar96);
                auVar95 = vinsertps_avx(ZEXT416((uint)fVar145),auVar197,0x10);
                auVar95 = vdivps_avx(auVar95,auVar96);
                auVar96 = vmovsldup_avx(auVar100);
                auVar102 = ZEXT416((uint)(fVar317 - auVar97._0_4_));
                auVar97 = vmovsldup_avx(auVar102);
                auVar151._0_4_ = auVar96._0_4_ * auVar94._0_4_ + auVar97._0_4_ * auVar95._0_4_;
                auVar151._4_4_ = auVar96._4_4_ * auVar94._4_4_ + auVar97._4_4_ * auVar95._4_4_;
                auVar151._8_4_ = auVar96._8_4_ * auVar94._8_4_ + auVar97._8_4_ * auVar95._8_4_;
                auVar151._12_4_ = auVar96._12_4_ * auVar94._12_4_ + auVar97._12_4_ * auVar95._12_4_;
                auVar94 = vsubps_avx(auVar178,auVar151);
                auVar162 = ZEXT1664(auVar94);
                auVar152._8_4_ = 0x7fffffff;
                auVar152._0_8_ = 0x7fffffff7fffffff;
                auVar152._12_4_ = 0x7fffffff;
                auVar178 = vandps_avx(auVar100,auVar152);
              } while (fVar310 <= auVar178._0_4_);
              auVar177._8_4_ = 0x7fffffff;
              auVar177._0_8_ = 0x7fffffff7fffffff;
              auVar177._12_4_ = 0x7fffffff;
              auVar178 = vandps_avx(auVar102,auVar177);
            } while ((float)local_840._0_4_ * 1.9073486e-06 + auVar175._0_4_ + fVar310 <=
                     auVar178._0_4_);
            fVar310 = auVar94._0_4_ + (float)local_930._0_4_;
            if ((fVar260 <= fVar310) &&
               (fVar145 = *(float *)(ray + k * 4 + 0x80), fVar310 <= fVar145)) {
              auVar178 = vmovshdup_avx(auVar94);
              fVar270 = auVar178._0_4_;
              if ((0.0 <= fVar270) && (fVar270 <= 1.0)) {
                auVar178 = vrsqrtss_avx(auVar195,auVar195);
                fVar315 = auVar178._0_4_;
                pGVar9 = (context->scene->geometries).items[uVar86].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar178 = ZEXT416((uint)(fVar315 * 1.5 +
                                           fVar149 * -0.5 * fVar315 * fVar315 * fVar315));
                  auVar178 = vshufps_avx(auVar178,auVar178,0);
                  auVar179._0_4_ = auVar178._0_4_ * (float)local_a40._0_4_;
                  auVar179._4_4_ = auVar178._4_4_ * (float)local_a40._4_4_;
                  auVar179._8_4_ = auVar178._8_4_ * fStack_a38;
                  auVar179._12_4_ = auVar178._12_4_ * fStack_a34;
                  auVar124._0_4_ = auVar329._0_4_ + auVar118._0_4_ * auVar179._0_4_;
                  auVar124._4_4_ = auVar329._4_4_ + auVar118._4_4_ * auVar179._4_4_;
                  auVar124._8_4_ = auVar329._8_4_ + auVar118._8_4_ * auVar179._8_4_;
                  auVar124._12_4_ = auVar329._12_4_ + auVar118._12_4_ * auVar179._12_4_;
                  auVar178 = vshufps_avx(auVar179,auVar179,0xc9);
                  auVar195 = vshufps_avx(auVar329,auVar329,0xc9);
                  auVar180._0_4_ = auVar195._0_4_ * auVar179._0_4_;
                  auVar180._4_4_ = auVar195._4_4_ * auVar179._4_4_;
                  auVar180._8_4_ = auVar195._8_4_ * auVar179._8_4_;
                  auVar180._12_4_ = auVar195._12_4_ * auVar179._12_4_;
                  auVar198._0_4_ = auVar329._0_4_ * auVar178._0_4_;
                  auVar198._4_4_ = auVar329._4_4_ * auVar178._4_4_;
                  auVar198._8_4_ = auVar329._8_4_ * auVar178._8_4_;
                  auVar198._12_4_ = auVar329._12_4_ * auVar178._12_4_;
                  auVar175 = vsubps_avx(auVar198,auVar180);
                  auVar178 = vshufps_avx(auVar175,auVar175,0xc9);
                  auVar195 = vshufps_avx(auVar124,auVar124,0xc9);
                  auVar199._0_4_ = auVar195._0_4_ * auVar178._0_4_;
                  auVar199._4_4_ = auVar195._4_4_ * auVar178._4_4_;
                  auVar199._8_4_ = auVar195._8_4_ * auVar178._8_4_;
                  auVar199._12_4_ = auVar195._12_4_ * auVar178._12_4_;
                  auVar178 = vshufps_avx(auVar175,auVar175,0xd2);
                  auVar125._0_4_ = auVar124._0_4_ * auVar178._0_4_;
                  auVar125._4_4_ = auVar124._4_4_ * auVar178._4_4_;
                  auVar125._8_4_ = auVar124._8_4_ * auVar178._8_4_;
                  auVar125._12_4_ = auVar124._12_4_ * auVar178._12_4_;
                  auVar178 = vsubps_avx(auVar199,auVar125);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar310;
                    uVar89 = vextractps_avx(auVar178,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar89;
                    uVar89 = vextractps_avx(auVar178,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar89;
                    *(int *)(ray + k * 4 + 0xe0) = auVar178._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar270;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_a68;
                    *(uint *)(ray + k * 4 + 0x120) = uVar86;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_7b0 = vshufps_avx(auVar94,auVar94,0x55);
                    auVar195 = vshufps_avx(auVar178,auVar178,0x55);
                    auStack_7d0 = vshufps_avx(auVar178,auVar178,0xaa);
                    local_7c0 = vshufps_avx(auVar178,auVar178,0);
                    local_7e0 = (RTCHitN  [16])auVar195;
                    local_7a0 = ZEXT816(0) << 0x20;
                    local_790 = local_800._0_8_;
                    uStack_788 = local_800._8_8_;
                    local_780 = local_7f0;
                    vcmpps_avx(ZEXT1632(local_7f0),ZEXT1632(local_7f0),0xf);
                    uStack_76c = context->user->instID[0];
                    local_770 = uStack_76c;
                    uStack_768 = uStack_76c;
                    uStack_764 = uStack_76c;
                    uVar91 = context->user->instPrimID[0];
                    auVar126._4_4_ = uVar91;
                    auVar126._0_4_ = uVar91;
                    auVar126._8_4_ = uVar91;
                    auVar126._12_4_ = uVar91;
                    auStack_760 = auVar126;
                    *(float *)(ray + k * 4 + 0x80) = fVar310;
                    local_8c0._0_16_ = *local_a70;
                    local_aa0.valid = (int *)local_8c0;
                    local_aa0.geometryUserPtr = pGVar9->userPtr;
                    local_aa0.context = context->user;
                    local_aa0.hit = local_7e0;
                    local_aa0.N = 4;
                    auVar178 = *local_a70;
                    local_aa0.ray = (RTCRayN *)ray;
                    if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar287 = ZEXT1664(auVar329);
                      auVar334 = ZEXT1664(auVar100);
                      (*pGVar9->intersectionFilterN)(&local_aa0);
                      auVar143._8_56_ = extraout_var;
                      auVar143._0_8_ = extraout_XMM1_Qa;
                      auVar126 = auVar143._0_16_;
                      auVar178 = local_8c0._0_16_;
                    }
                    if (auVar178 == (undefined1  [16])0x0) {
                      auVar195 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar178 = vpcmpeqd_avx(auVar126,auVar126);
                      auVar195 = auVar195 ^ auVar178;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      auVar175 = vpcmpeqd_avx(auVar195,auVar195);
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar287 = ZEXT1664(auVar287._0_16_);
                        auVar334 = ZEXT1664(auVar334._0_16_);
                        (*p_Var13)(&local_aa0);
                        auVar175 = vpcmpeqd_avx(auVar175,auVar175);
                        auVar178 = local_8c0._0_16_;
                      }
                      auVar100 = vpcmpeqd_avx(auVar178,_DAT_01f45a50);
                      auVar195 = auVar100 ^ auVar175;
                      if (auVar178 != (undefined1  [16])0x0) {
                        auVar100 = auVar100 ^ auVar175;
                        auVar178 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])local_aa0.hit);
                        *(undefined1 (*) [16])(local_aa0.ray + 0xc0) = auVar178;
                        auVar178 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])
                                                            (local_aa0.hit + 0x10));
                        *(undefined1 (*) [16])(local_aa0.ray + 0xd0) = auVar178;
                        auVar178 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])
                                                            (local_aa0.hit + 0x20));
                        *(undefined1 (*) [16])(local_aa0.ray + 0xe0) = auVar178;
                        auVar178 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])
                                                            (local_aa0.hit + 0x30));
                        *(undefined1 (*) [16])(local_aa0.ray + 0xf0) = auVar178;
                        auVar178 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])
                                                            (local_aa0.hit + 0x40));
                        *(undefined1 (*) [16])(local_aa0.ray + 0x100) = auVar178;
                        auVar178 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])
                                                            (local_aa0.hit + 0x50));
                        *(undefined1 (*) [16])(local_aa0.ray + 0x110) = auVar178;
                        auVar178 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])
                                                            (local_aa0.hit + 0x60));
                        *(undefined1 (*) [16])(local_aa0.ray + 0x120) = auVar178;
                        auVar178 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])
                                                            (local_aa0.hit + 0x70));
                        *(undefined1 (*) [16])(local_aa0.ray + 0x130) = auVar178;
                        auVar178 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])
                                                            (local_aa0.hit + 0x80));
                        *(undefined1 (*) [16])(local_aa0.ray + 0x140) = auVar178;
                      }
                    }
                    auVar103._8_8_ = 0x100000001;
                    auVar103._0_8_ = 0x100000001;
                    if ((auVar103 & auVar195) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar145;
                    }
                  }
                }
              }
            }
LAB_0092900a:
            uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar110._4_4_ = uVar89;
            auVar110._0_4_ = uVar89;
            auVar110._8_4_ = uVar89;
            auVar110._12_4_ = uVar89;
            auVar110._16_4_ = uVar89;
            auVar110._20_4_ = uVar89;
            auVar110._24_4_ = uVar89;
            auVar110._28_4_ = uVar89;
            auVar132 = vcmpps_avx(_local_8a0,auVar110,2);
            auVar132 = vandps_avx(auVar132,local_480);
          }
          auVar116._0_4_ = (float)local_9a0._0_4_ + (float)local_860._0_4_;
          auVar116._4_4_ = (float)local_9a0._4_4_ + (float)local_860._4_4_;
          auVar116._8_4_ = fStack_998 + fStack_858;
          auVar116._12_4_ = fStack_994 + fStack_854;
          auVar116._16_4_ = fStack_990 + fStack_850;
          auVar116._20_4_ = fStack_98c + fStack_84c;
          auVar116._24_4_ = fStack_988 + fStack_848;
          auVar116._28_4_ = fStack_984 + fStack_844;
          auVar178 = vpshufd_avx(auVar110._0_16_,0);
          auVar138._16_16_ = auVar178;
          auVar138._0_16_ = auVar178;
          auVar132 = vcmpps_avx(auVar116,auVar138,2);
          local_880 = vandps_avx(auVar132,local_880);
          auVar117._8_4_ = 3;
          auVar117._0_8_ = 0x300000003;
          auVar117._12_4_ = 3;
          auVar117._16_4_ = 3;
          auVar117._20_4_ = 3;
          auVar117._24_4_ = 3;
          auVar117._28_4_ = 3;
          auVar139._8_4_ = 2;
          auVar139._0_8_ = 0x200000002;
          auVar139._12_4_ = 2;
          auVar139._16_4_ = 2;
          auVar139._20_4_ = 2;
          auVar139._24_4_ = 2;
          auVar139._28_4_ = 2;
          auVar132 = vblendvps_avx(auVar139,auVar117,local_6c0);
          auVar178 = vpcmpgtd_avx(auVar132._16_16_,local_700._0_16_);
          auVar195 = vpshufd_avx(_local_6e0,0);
          auVar195 = vpcmpgtd_avx(auVar132._0_16_,auVar195);
          auVar140._16_16_ = auVar178;
          auVar140._0_16_ = auVar195;
          _local_8a0 = vblendps_avx(ZEXT1632(auVar195),auVar140,0xf0);
          local_8c0 = vandnps_avx(_local_8a0,local_880);
          local_900 = _local_420;
          local_860._4_4_ = (float)local_9a0._4_4_ + (float)local_420._4_4_;
          local_860._0_4_ = (float)local_9a0._0_4_ + (float)local_420._0_4_;
          fStack_858 = fStack_998 + fStack_418;
          fStack_854 = fStack_994 + fStack_414;
          fStack_850 = fStack_990 + fStack_410;
          fStack_84c = fStack_98c + fStack_40c;
          fStack_848 = fStack_988 + fStack_408;
          fStack_844 = fStack_984 + fStack_404;
          for (; (((((((local_8c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_8c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_8c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_8c0 >> 0x7f,0) != '\0') ||
                   (local_8c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_8c0 >> 0xbf,0) != '\0') ||
                 (local_8c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_8c0[0x1f] < '\0'; local_8c0 = vandps_avx(auVar132,local_8c0)) {
            auVar141._8_4_ = 0x7f800000;
            auVar141._0_8_ = 0x7f8000007f800000;
            auVar141._12_4_ = 0x7f800000;
            auVar141._16_4_ = 0x7f800000;
            auVar141._20_4_ = 0x7f800000;
            auVar141._24_4_ = 0x7f800000;
            auVar141._28_4_ = 0x7f800000;
            auVar132 = vblendvps_avx(auVar141,local_900,local_8c0);
            auVar108 = vshufps_avx(auVar132,auVar132,0xb1);
            auVar108 = vminps_avx(auVar132,auVar108);
            auVar26 = vshufpd_avx(auVar108,auVar108,5);
            auVar108 = vminps_avx(auVar108,auVar26);
            auVar26 = vperm2f128_avx(auVar108,auVar108,1);
            auVar108 = vminps_avx(auVar108,auVar26);
            auVar108 = vcmpps_avx(auVar132,auVar108,0);
            auVar26 = local_8c0 & auVar108;
            auVar132 = local_8c0;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar132 = vandps_avx(auVar108,local_8c0);
            }
            uVar82 = vmovmskps_avx(auVar132);
            uVar91 = 0;
            if (uVar82 != 0) {
              for (; (uVar82 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
              }
            }
            uVar84 = (ulong)uVar91;
            *(undefined4 *)(local_8c0 + uVar84 * 4) = 0;
            fVar310 = local_1c0[uVar84];
            uVar91 = *(uint *)(local_400 + uVar84 * 4);
            fVar145 = auVar120._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              auVar287 = ZEXT1664(auVar287._0_16_);
              fVar145 = sqrtf((float)local_9c0._0_4_);
            }
            auVar195 = vminps_avx(auVar18,auVar20);
            auVar178 = vmaxps_avx(auVar18,auVar20);
            auVar175 = vminps_avx(auVar19,auVar21);
            auVar100 = vminps_avx(auVar195,auVar175);
            auVar195 = vmaxps_avx(auVar19,auVar21);
            auVar175 = vmaxps_avx(auVar178,auVar195);
            auVar181._8_4_ = 0x7fffffff;
            auVar181._0_8_ = 0x7fffffff7fffffff;
            auVar181._12_4_ = 0x7fffffff;
            auVar178 = vandps_avx(auVar100,auVar181);
            auVar195 = vandps_avx(auVar175,auVar181);
            auVar178 = vmaxps_avx(auVar178,auVar195);
            auVar195 = vmovshdup_avx(auVar178);
            auVar195 = vmaxss_avx(auVar195,auVar178);
            auVar178 = vshufpd_avx(auVar178,auVar178,1);
            auVar178 = vmaxss_avx(auVar178,auVar195);
            local_980 = auVar178._0_4_ * 1.9073486e-06;
            local_960._0_4_ = fVar145 * 1.9073486e-06;
            local_840._0_16_ = vshufps_avx(auVar175,auVar175,0xff);
            auVar178 = vinsertps_avx(ZEXT416(uVar91),ZEXT416((uint)fVar310),0x10);
            auVar334 = ZEXT1664(auVar178);
            lVar87 = 5;
            do {
              do {
                auVar178 = auVar334._0_16_;
                bVar92 = lVar87 == 0;
                lVar87 = lVar87 + -1;
                if (bVar92) goto LAB_00929c88;
                auVar195 = vshufps_avx(auVar178,auVar178,0);
                auVar104._0_4_ = auVar195._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar104._4_4_ = auVar195._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar104._8_4_ = auVar195._8_4_ * fStack_9a8 + 0.0;
                auVar104._12_4_ = auVar195._12_4_ * fStack_9a4 + 0.0;
                auVar195 = vmovshdup_avx(auVar178);
                fVar271 = auVar195._0_4_;
                fVar315 = 1.0 - fVar271;
                fVar145 = fVar271 * 3.0;
                fVar310 = fVar145 + -5.0;
                fVar270 = fVar315 * fVar315;
                auVar195 = ZEXT416((uint)(fVar271 * fVar271 * -fVar315 * 0.5));
                auVar195 = vshufps_avx(auVar195,auVar195,0);
                auVar175 = ZEXT416((uint)((fVar270 * (fVar315 * 3.0 + -5.0) + 2.0) * 0.5));
                auVar175 = vshufps_avx(auVar175,auVar175,0);
                auVar100 = ZEXT416((uint)((fVar271 * fVar271 * fVar310 + 2.0) * 0.5));
                auVar100 = vshufps_avx(auVar100,auVar100,0);
                auVar94 = ZEXT416((uint)(fVar315 * fVar315 * -fVar271 * 0.5));
                auVar94 = vshufps_avx(auVar94,auVar94,0);
                auVar153._0_4_ =
                     auVar94._0_4_ * local_bf0 +
                     auVar100._0_4_ * local_ac0 +
                     auVar175._0_4_ * local_ab0 + auVar195._0_4_ * local_ad0;
                auVar153._4_4_ =
                     auVar94._4_4_ * fStack_bec +
                     auVar100._4_4_ * fStack_abc +
                     auVar175._4_4_ * fStack_aac + auVar195._4_4_ * fStack_acc;
                auVar153._8_4_ =
                     auVar94._8_4_ * fStack_be8 +
                     auVar100._8_4_ * fStack_ab8 +
                     auVar175._8_4_ * fStack_aa8 + auVar195._8_4_ * fStack_ac8;
                auVar153._12_4_ =
                     auVar94._12_4_ * fStack_be4 +
                     auVar100._12_4_ * fStack_ab4 +
                     auVar175._12_4_ * fStack_aa4 + auVar195._12_4_ * fStack_ac4;
                _local_a60 = auVar153;
                auVar195 = vsubps_avx(auVar104,auVar153);
                _local_a40 = auVar195;
                auVar195 = vdpps_avx(auVar195,auVar195,0x7f);
                fVar149 = auVar195._0_4_;
                if (fVar149 < 0.0) {
                  local_9e0._0_4_ = fVar271 * 9.0;
                  local_a00._0_4_ = fVar310;
                  local_a20._0_4_ = fVar270;
                  local_820._0_4_ = fVar315 * -2.0;
                  fVar317 = sqrtf(fVar149);
                  fVar310 = (float)local_a00._0_4_;
                  fVar274 = (float)local_9e0._0_4_;
                  fVar93 = (float)local_820._0_4_;
                  fVar270 = (float)local_a20._0_4_;
                }
                else {
                  auVar175 = vsqrtss_avx(auVar195,auVar195);
                  fVar317 = auVar175._0_4_;
                  fVar274 = fVar271 * 9.0;
                  fVar93 = fVar315 * -2.0;
                }
                auVar175 = ZEXT416((uint)((fVar271 * fVar271 + fVar271 * fVar93) * 0.5));
                auVar175 = vshufps_avx(auVar175,auVar175,0);
                auVar100 = ZEXT416((uint)(((fVar315 + fVar315) * (fVar145 + 2.0) +
                                          fVar315 * fVar315 * -3.0) * 0.5));
                auVar100 = vshufps_avx(auVar100,auVar100,0);
                auVar94 = ZEXT416((uint)((fVar310 * (fVar271 + fVar271) + fVar271 * fVar145) * 0.5))
                ;
                auVar94 = vshufps_avx(auVar94,auVar94,0);
                auVar95 = ZEXT416((uint)((fVar271 * (fVar315 + fVar315) - fVar270) * 0.5));
                auVar95 = vshufps_avx(auVar95,auVar95,0);
                auVar314._0_4_ =
                     local_bf0 * auVar95._0_4_ +
                     local_ac0 * auVar94._0_4_ +
                     local_ad0 * auVar175._0_4_ + local_ab0 * auVar100._0_4_;
                auVar314._4_4_ =
                     fStack_bec * auVar95._4_4_ +
                     fStack_abc * auVar94._4_4_ +
                     fStack_acc * auVar175._4_4_ + fStack_aac * auVar100._4_4_;
                auVar314._8_4_ =
                     fStack_be8 * auVar95._8_4_ +
                     fStack_ab8 * auVar94._8_4_ +
                     fStack_ac8 * auVar175._8_4_ + fStack_aa8 * auVar100._8_4_;
                auVar314._12_4_ =
                     fStack_be4 * auVar95._12_4_ +
                     fStack_ab4 * auVar94._12_4_ +
                     fStack_ac4 * auVar175._12_4_ + fStack_aa4 * auVar100._12_4_;
                auVar95 = vpermilps_avx(ZEXT416((uint)(fVar145 + -1.0)),0);
                auVar96 = vpermilps_avx(ZEXT416((uint)(fVar271 * -9.0 + 4.0)),0);
                auVar175 = vshufps_avx(ZEXT416((uint)(fVar274 + -5.0)),
                                       ZEXT416((uint)(fVar274 + -5.0)),0);
                auVar100 = ZEXT416((uint)(fVar271 * -3.0 + 2.0));
                auVar94 = vshufps_avx(auVar100,auVar100,0);
                auVar100 = vdpps_avx(auVar314,auVar314,0x7f);
                auVar127._0_4_ =
                     local_bf0 * auVar94._0_4_ +
                     local_ac0 * auVar175._0_4_ +
                     local_ab0 * auVar96._0_4_ + local_ad0 * auVar95._0_4_;
                auVar127._4_4_ =
                     fStack_bec * auVar94._4_4_ +
                     fStack_abc * auVar175._4_4_ +
                     fStack_aac * auVar96._4_4_ + fStack_acc * auVar95._4_4_;
                auVar127._8_4_ =
                     fStack_be8 * auVar94._8_4_ +
                     fStack_ab8 * auVar175._8_4_ +
                     fStack_aa8 * auVar96._8_4_ + fStack_ac8 * auVar95._8_4_;
                auVar127._12_4_ =
                     fStack_be4 * auVar94._12_4_ +
                     fStack_ab4 * auVar175._12_4_ +
                     fStack_aa4 * auVar96._12_4_ + fStack_ac4 * auVar95._12_4_;
                auVar175 = vblendps_avx(auVar100,_DAT_01f45a50,0xe);
                auVar94 = vrsqrtss_avx(auVar175,auVar175);
                fVar145 = auVar94._0_4_;
                fVar310 = auVar100._0_4_;
                auVar94 = vdpps_avx(auVar314,auVar127,0x7f);
                auVar95 = vshufps_avx(auVar100,auVar100,0);
                auVar128._0_4_ = auVar127._0_4_ * auVar95._0_4_;
                auVar128._4_4_ = auVar127._4_4_ * auVar95._4_4_;
                auVar128._8_4_ = auVar127._8_4_ * auVar95._8_4_;
                auVar128._12_4_ = auVar127._12_4_ * auVar95._12_4_;
                auVar94 = vshufps_avx(auVar94,auVar94,0);
                auVar200._0_4_ = auVar314._0_4_ * auVar94._0_4_;
                auVar200._4_4_ = auVar314._4_4_ * auVar94._4_4_;
                auVar200._8_4_ = auVar314._8_4_ * auVar94._8_4_;
                auVar200._12_4_ = auVar314._12_4_ * auVar94._12_4_;
                auVar96 = vsubps_avx(auVar128,auVar200);
                auVar94 = vrcpss_avx(auVar175,auVar175);
                auVar175 = vmaxss_avx(ZEXT416((uint)local_980),
                                      ZEXT416((uint)(auVar334._0_4_ * (float)local_960._0_4_)));
                auVar94 = ZEXT416((uint)(auVar94._0_4_ * (2.0 - fVar310 * auVar94._0_4_)));
                auVar94 = vshufps_avx(auVar94,auVar94,0);
                uVar84 = CONCAT44(auVar314._4_4_,auVar314._0_4_);
                auVar223._0_8_ = uVar84 ^ 0x8000000080000000;
                auVar223._8_4_ = -auVar314._8_4_;
                auVar223._12_4_ = -auVar314._12_4_;
                auVar95 = ZEXT416((uint)(fVar145 * 1.5 +
                                        fVar310 * -0.5 * fVar145 * fVar145 * fVar145));
                auVar95 = vshufps_avx(auVar95,auVar95,0);
                auVar182._0_4_ = auVar95._0_4_ * auVar96._0_4_ * auVar94._0_4_;
                auVar182._4_4_ = auVar95._4_4_ * auVar96._4_4_ * auVar94._4_4_;
                auVar182._8_4_ = auVar95._8_4_ * auVar96._8_4_ * auVar94._8_4_;
                auVar182._12_4_ = auVar95._12_4_ * auVar96._12_4_ * auVar94._12_4_;
                auVar247._0_4_ = auVar314._0_4_ * auVar95._0_4_;
                auVar247._4_4_ = auVar314._4_4_ * auVar95._4_4_;
                auVar247._8_4_ = auVar314._8_4_ * auVar95._8_4_;
                auVar247._12_4_ = auVar314._12_4_ * auVar95._12_4_;
                if (fVar310 < 0.0) {
                  fVar310 = sqrtf(fVar310);
                }
                else {
                  auVar100 = vsqrtss_avx(auVar100,auVar100);
                  fVar310 = auVar100._0_4_;
                }
                auVar100 = vdpps_avx(_local_a40,auVar247,0x7f);
                fVar310 = (local_980 / fVar310) * (fVar317 + 1.0) +
                          auVar175._0_4_ + fVar317 * local_980;
                auVar94 = vdpps_avx(auVar223,auVar247,0x7f);
                auVar95 = vdpps_avx(_local_a40,auVar182,0x7f);
                auVar96 = vdpps_avx(_local_9b0,auVar247,0x7f);
                auVar97 = vdpps_avx(_local_a40,auVar223,0x7f);
                fVar145 = auVar94._0_4_ + auVar95._0_4_;
                fVar270 = auVar100._0_4_;
                auVar105._0_4_ = fVar270 * fVar270;
                auVar105._4_4_ = auVar100._4_4_ * auVar100._4_4_;
                auVar105._8_4_ = auVar100._8_4_ * auVar100._8_4_;
                auVar105._12_4_ = auVar100._12_4_ * auVar100._12_4_;
                auVar95 = vsubps_avx(auVar195,auVar105);
                auVar94 = vdpps_avx(_local_a40,_local_9b0,0x7f);
                fVar315 = auVar97._0_4_ - fVar270 * fVar145;
                fVar271 = auVar94._0_4_ - fVar270 * auVar96._0_4_;
                auVar94 = vrsqrtss_avx(auVar95,auVar95);
                fVar317 = auVar95._0_4_;
                fVar270 = auVar94._0_4_;
                fVar270 = fVar270 * 1.5 + fVar317 * -0.5 * fVar270 * fVar270 * fVar270;
                if (fVar317 < 0.0) {
                  local_9e0._0_4_ = fVar315;
                  local_a00._0_4_ = fVar271;
                  local_a20._0_4_ = fVar270;
                  fVar317 = sqrtf(fVar317);
                  fVar270 = (float)local_a20._0_4_;
                  fVar315 = (float)local_9e0._0_4_;
                  fVar271 = (float)local_a00._0_4_;
                }
                else {
                  auVar94 = vsqrtss_avx(auVar95,auVar95);
                  fVar317 = auVar94._0_4_;
                }
                auVar287 = ZEXT1664(auVar314);
                auVar97 = vpermilps_avx(_local_a60,0xff);
                auVar118 = vshufps_avx(auVar314,auVar314,0xff);
                fVar315 = fVar315 * fVar270 - auVar118._0_4_;
                auVar201._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
                auVar201._8_4_ = auVar96._8_4_ ^ 0x80000000;
                auVar201._12_4_ = auVar96._12_4_ ^ 0x80000000;
                auVar224._0_4_ = -fVar315;
                auVar224._4_4_ = 0x80000000;
                auVar224._8_4_ = 0x80000000;
                auVar224._12_4_ = 0x80000000;
                auVar94 = vinsertps_avx(auVar224,ZEXT416((uint)(fVar271 * fVar270)),0x1c);
                auVar96 = vmovsldup_avx(ZEXT416((uint)(fVar145 * fVar271 * fVar270 -
                                                      auVar96._0_4_ * fVar315)));
                auVar94 = vdivps_avx(auVar94,auVar96);
                auVar95 = vinsertps_avx(ZEXT416((uint)fVar145),auVar201,0x10);
                auVar95 = vdivps_avx(auVar95,auVar96);
                auVar96 = vmovsldup_avx(auVar100);
                auVar102 = ZEXT416((uint)(fVar317 - auVar97._0_4_));
                auVar97 = vmovsldup_avx(auVar102);
                auVar154._0_4_ = auVar96._0_4_ * auVar94._0_4_ + auVar97._0_4_ * auVar95._0_4_;
                auVar154._4_4_ = auVar96._4_4_ * auVar94._4_4_ + auVar97._4_4_ * auVar95._4_4_;
                auVar154._8_4_ = auVar96._8_4_ * auVar94._8_4_ + auVar97._8_4_ * auVar95._8_4_;
                auVar154._12_4_ = auVar96._12_4_ * auVar94._12_4_ + auVar97._12_4_ * auVar95._12_4_;
                auVar94 = vsubps_avx(auVar178,auVar154);
                auVar334 = ZEXT1664(auVar94);
                auVar155._8_4_ = 0x7fffffff;
                auVar155._0_8_ = 0x7fffffff7fffffff;
                auVar155._12_4_ = 0x7fffffff;
                auVar178 = vandps_avx(auVar100,auVar155);
              } while (fVar310 <= auVar178._0_4_);
              auVar183._8_4_ = 0x7fffffff;
              auVar183._0_8_ = 0x7fffffff7fffffff;
              auVar183._12_4_ = 0x7fffffff;
              auVar178 = vandps_avx(auVar102,auVar183);
            } while ((float)local_840._0_4_ * 1.9073486e-06 + auVar175._0_4_ + fVar310 <=
                     auVar178._0_4_);
            fVar310 = auVar94._0_4_ + (float)local_930._0_4_;
            if ((fVar260 <= fVar310) &&
               (fVar145 = *(float *)(ray + k * 4 + 0x80), fVar310 <= fVar145)) {
              auVar178 = vmovshdup_avx(auVar94);
              fVar270 = auVar178._0_4_;
              if ((0.0 <= fVar270) && (fVar270 <= 1.0)) {
                auVar178 = vrsqrtss_avx(auVar195,auVar195);
                fVar315 = auVar178._0_4_;
                pGVar9 = (context->scene->geometries).items[uVar86].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar178 = ZEXT416((uint)(fVar315 * 1.5 +
                                           fVar149 * -0.5 * fVar315 * fVar315 * fVar315));
                  auVar178 = vshufps_avx(auVar178,auVar178,0);
                  auVar184._0_4_ = auVar178._0_4_ * (float)local_a40._0_4_;
                  auVar184._4_4_ = auVar178._4_4_ * (float)local_a40._4_4_;
                  auVar184._8_4_ = auVar178._8_4_ * fStack_a38;
                  auVar184._12_4_ = auVar178._12_4_ * fStack_a34;
                  auVar129._0_4_ = auVar314._0_4_ + auVar118._0_4_ * auVar184._0_4_;
                  auVar129._4_4_ = auVar314._4_4_ + auVar118._4_4_ * auVar184._4_4_;
                  auVar129._8_4_ = auVar314._8_4_ + auVar118._8_4_ * auVar184._8_4_;
                  auVar129._12_4_ = auVar314._12_4_ + auVar118._12_4_ * auVar184._12_4_;
                  auVar178 = vshufps_avx(auVar184,auVar184,0xc9);
                  auVar195 = vshufps_avx(auVar314,auVar314,0xc9);
                  auVar185._0_4_ = auVar195._0_4_ * auVar184._0_4_;
                  auVar185._4_4_ = auVar195._4_4_ * auVar184._4_4_;
                  auVar185._8_4_ = auVar195._8_4_ * auVar184._8_4_;
                  auVar185._12_4_ = auVar195._12_4_ * auVar184._12_4_;
                  auVar202._0_4_ = auVar314._0_4_ * auVar178._0_4_;
                  auVar202._4_4_ = auVar314._4_4_ * auVar178._4_4_;
                  auVar202._8_4_ = auVar314._8_4_ * auVar178._8_4_;
                  auVar202._12_4_ = auVar314._12_4_ * auVar178._12_4_;
                  auVar175 = vsubps_avx(auVar202,auVar185);
                  auVar178 = vshufps_avx(auVar175,auVar175,0xc9);
                  auVar195 = vshufps_avx(auVar129,auVar129,0xc9);
                  auVar203._0_4_ = auVar195._0_4_ * auVar178._0_4_;
                  auVar203._4_4_ = auVar195._4_4_ * auVar178._4_4_;
                  auVar203._8_4_ = auVar195._8_4_ * auVar178._8_4_;
                  auVar203._12_4_ = auVar195._12_4_ * auVar178._12_4_;
                  auVar178 = vshufps_avx(auVar175,auVar175,0xd2);
                  auVar130._0_4_ = auVar129._0_4_ * auVar178._0_4_;
                  auVar130._4_4_ = auVar129._4_4_ * auVar178._4_4_;
                  auVar130._8_4_ = auVar129._8_4_ * auVar178._8_4_;
                  auVar130._12_4_ = auVar129._12_4_ * auVar178._12_4_;
                  auVar178 = vsubps_avx(auVar203,auVar130);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar310;
                    uVar89 = vextractps_avx(auVar178,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar89;
                    uVar89 = vextractps_avx(auVar178,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar89;
                    *(int *)(ray + k * 4 + 0xe0) = auVar178._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar270;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_a68;
                    *(uint *)(ray + k * 4 + 0x120) = uVar86;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_7b0 = vshufps_avx(auVar94,auVar94,0x55);
                    auVar195 = vshufps_avx(auVar178,auVar178,0x55);
                    auStack_7d0 = vshufps_avx(auVar178,auVar178,0xaa);
                    local_7c0 = vshufps_avx(auVar178,auVar178,0);
                    local_7e0 = (RTCHitN  [16])auVar195;
                    local_7a0 = ZEXT816(0) << 0x20;
                    local_790 = local_800._0_8_;
                    uStack_788 = local_800._8_8_;
                    local_780 = local_7f0;
                    vcmpps_avx(ZEXT1632(local_7f0),ZEXT1632(local_7f0),0xf);
                    uStack_76c = context->user->instID[0];
                    local_770 = uStack_76c;
                    uStack_768 = uStack_76c;
                    uStack_764 = uStack_76c;
                    uVar91 = context->user->instPrimID[0];
                    auVar131._4_4_ = uVar91;
                    auVar131._0_4_ = uVar91;
                    auVar131._8_4_ = uVar91;
                    auVar131._12_4_ = uVar91;
                    auStack_760 = auVar131;
                    *(float *)(ray + k * 4 + 0x80) = fVar310;
                    local_920 = *local_a70;
                    local_aa0.valid = (int *)local_920;
                    local_aa0.geometryUserPtr = pGVar9->userPtr;
                    local_aa0.context = context->user;
                    local_aa0.hit = local_7e0;
                    local_aa0.N = 4;
                    local_aa0.ray = (RTCRayN *)ray;
                    if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar287 = ZEXT1664(auVar314);
                      auVar334 = ZEXT1664(auVar94);
                      (*pGVar9->intersectionFilterN)(&local_aa0);
                      auVar144._8_56_ = extraout_var_00;
                      auVar144._0_8_ = extraout_XMM1_Qa_00;
                      auVar131 = auVar144._0_16_;
                    }
                    if (local_920 == (undefined1  [16])0x0) {
                      auVar178 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar195 = vpcmpeqd_avx(auVar131,auVar131);
                      auVar178 = auVar178 ^ auVar195;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      auVar195 = vpcmpeqd_avx(auVar195,auVar195);
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar287 = ZEXT1664(auVar287._0_16_);
                        auVar334 = ZEXT1664(auVar334._0_16_);
                        (*p_Var13)(&local_aa0);
                        auVar195 = vpcmpeqd_avx(auVar195,auVar195);
                      }
                      auVar175 = vpcmpeqd_avx(local_920,_DAT_01f45a50);
                      auVar178 = auVar175 ^ auVar195;
                      if (local_920 != (undefined1  [16])0x0) {
                        auVar175 = auVar175 ^ auVar195;
                        auVar195 = vmaskmovps_avx(auVar175,*(undefined1 (*) [16])local_aa0.hit);
                        *(undefined1 (*) [16])(local_aa0.ray + 0xc0) = auVar195;
                        auVar195 = vmaskmovps_avx(auVar175,*(undefined1 (*) [16])
                                                            (local_aa0.hit + 0x10));
                        *(undefined1 (*) [16])(local_aa0.ray + 0xd0) = auVar195;
                        auVar195 = vmaskmovps_avx(auVar175,*(undefined1 (*) [16])
                                                            (local_aa0.hit + 0x20));
                        *(undefined1 (*) [16])(local_aa0.ray + 0xe0) = auVar195;
                        auVar195 = vmaskmovps_avx(auVar175,*(undefined1 (*) [16])
                                                            (local_aa0.hit + 0x30));
                        *(undefined1 (*) [16])(local_aa0.ray + 0xf0) = auVar195;
                        auVar195 = vmaskmovps_avx(auVar175,*(undefined1 (*) [16])
                                                            (local_aa0.hit + 0x40));
                        *(undefined1 (*) [16])(local_aa0.ray + 0x100) = auVar195;
                        auVar195 = vmaskmovps_avx(auVar175,*(undefined1 (*) [16])
                                                            (local_aa0.hit + 0x50));
                        *(undefined1 (*) [16])(local_aa0.ray + 0x110) = auVar195;
                        auVar195 = vmaskmovps_avx(auVar175,*(undefined1 (*) [16])
                                                            (local_aa0.hit + 0x60));
                        *(undefined1 (*) [16])(local_aa0.ray + 0x120) = auVar195;
                        auVar195 = vmaskmovps_avx(auVar175,*(undefined1 (*) [16])
                                                            (local_aa0.hit + 0x70));
                        *(undefined1 (*) [16])(local_aa0.ray + 0x130) = auVar195;
                        auVar195 = vmaskmovps_avx(auVar175,*(undefined1 (*) [16])
                                                            (local_aa0.hit + 0x80));
                        *(undefined1 (*) [16])(local_aa0.ray + 0x140) = auVar195;
                      }
                    }
                    auVar106._8_8_ = 0x100000001;
                    auVar106._0_8_ = 0x100000001;
                    if ((auVar106 & auVar178) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar145;
                    }
                  }
                }
              }
            }
LAB_00929c88:
            uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar110._4_4_ = uVar89;
            auVar110._0_4_ = uVar89;
            auVar110._8_4_ = uVar89;
            auVar110._12_4_ = uVar89;
            auVar110._16_4_ = uVar89;
            auVar110._20_4_ = uVar89;
            auVar110._24_4_ = uVar89;
            auVar110._28_4_ = uVar89;
            auVar132 = vcmpps_avx(_local_860,auVar110,2);
          }
          auVar132 = vandps_avx(local_6a0,local_680);
          auVar108 = vandps_avx(_local_8a0,local_880);
          auVar160._0_4_ = (float)local_9a0._0_4_ + local_460._0_4_;
          auVar160._4_4_ = (float)local_9a0._4_4_ + local_460._4_4_;
          auVar160._8_4_ = fStack_998 + local_460._8_4_;
          auVar160._12_4_ = fStack_994 + local_460._12_4_;
          auVar160._16_4_ = fStack_990 + local_460._16_4_;
          auVar160._20_4_ = fStack_98c + local_460._20_4_;
          auVar160._24_4_ = fStack_988 + local_460._24_4_;
          auVar160._28_4_ = fStack_984 + local_460._28_4_;
          auVar178 = vpshufd_avx(auVar110._0_16_,0);
          auVar209._16_16_ = auVar178;
          auVar209._0_16_ = auVar178;
          auVar26 = vcmpps_avx(auVar160,auVar209,2);
          auVar132 = vandps_avx(auVar26,auVar132);
          auVar232._0_4_ = (float)local_9a0._0_4_ + local_420._0_4_;
          auVar232._4_4_ = (float)local_9a0._4_4_ + local_420._4_4_;
          auVar232._8_4_ = fStack_998 + local_420._8_4_;
          auVar232._12_4_ = fStack_994 + local_420._12_4_;
          auVar232._16_4_ = fStack_990 + local_420._16_4_;
          auVar232._20_4_ = fStack_98c + local_420._20_4_;
          auVar232._24_4_ = fStack_988 + local_420._24_4_;
          auVar232._28_4_ = fStack_984 + local_420._28_4_;
          auVar26 = vcmpps_avx(auVar232,auVar209,2);
          auVar108 = vandps_avx(auVar26,auVar108);
          auVar108 = vorps_avx(auVar132,auVar108);
          fVar310 = (float)local_9a0._0_4_;
          fVar308 = (float)local_9a0._4_4_;
          fVar355 = fStack_998;
          fVar146 = fStack_994;
          fVar358 = fStack_990;
          fVar361 = fStack_98c;
          fVar364 = fStack_988;
          fVar241 = fStack_984;
          if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar108 >> 0x7f,0) != '\0') ||
                (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar108 >> 0xbf,0) != '\0') ||
              (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar108[0x1f] < '\0') {
            uVar85 = (ulong)uVar90;
            *(undefined1 (*) [32])(auStack_180 + uVar85 * 0x60) = auVar108;
            auVar132 = vblendvps_avx(_local_420,_local_460,auVar132);
            *(undefined1 (*) [32])(auStack_160 + uVar85 * 0x60) = auVar132;
            uVar84 = vmovlps_avx(local_650);
            (&uStack_140)[uVar85 * 0xc] = uVar84;
            auStack_138[uVar85 * 0x18] = local_c88 + 1;
            uVar90 = uVar90 + 1;
          }
        }
      }
    }
    do {
      uVar91 = uVar90;
      if (uVar91 == 0) {
        uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar107._4_4_ = uVar89;
        auVar107._0_4_ = uVar89;
        auVar107._8_4_ = uVar89;
        auVar107._12_4_ = uVar89;
        auVar14 = vcmpps_avx(local_660,auVar107,2);
        uVar86 = vmovmskps_avx(auVar14);
        uVar83 = (ulong)((uint)uVar83 - 1 & (uint)uVar83 & uVar86);
        goto LAB_00927260;
      }
      uVar84 = (ulong)(uVar91 - 1);
      lVar87 = uVar84 * 0x60;
      auVar132 = *(undefined1 (*) [32])(auStack_160 + lVar87);
      auVar113._0_4_ = fVar310 + auVar132._0_4_;
      auVar113._4_4_ = fVar308 + auVar132._4_4_;
      auVar113._8_4_ = fVar355 + auVar132._8_4_;
      auVar113._12_4_ = fVar146 + auVar132._12_4_;
      auVar113._16_4_ = fVar358 + auVar132._16_4_;
      auVar113._20_4_ = fVar361 + auVar132._20_4_;
      auVar113._24_4_ = fVar364 + auVar132._24_4_;
      auVar113._28_4_ = fVar241 + auVar132._28_4_;
      uVar89 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar188._4_4_ = uVar89;
      auVar188._0_4_ = uVar89;
      auVar188._8_4_ = uVar89;
      auVar188._12_4_ = uVar89;
      auVar188._16_4_ = uVar89;
      auVar188._20_4_ = uVar89;
      auVar188._24_4_ = uVar89;
      auVar188._28_4_ = uVar89;
      auVar26 = vcmpps_avx(auVar113,auVar188,2);
      auVar108 = vandps_avx(auVar26,*(undefined1 (*) [32])(auStack_180 + lVar87));
      _local_7e0 = auVar108;
      auVar26 = *(undefined1 (*) [32])(auStack_180 + lVar87) & auVar26;
      uVar90 = uVar91 - 1;
    } while ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar26 >> 0x7f,0) == '\0') &&
               (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar26 >> 0xbf,0) == '\0') &&
             (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             -1 < auVar26[0x1f]);
    auVar157._8_4_ = 0x7f800000;
    auVar157._0_8_ = 0x7f8000007f800000;
    auVar157._12_4_ = 0x7f800000;
    auVar157._16_4_ = 0x7f800000;
    auVar157._20_4_ = 0x7f800000;
    auVar157._24_4_ = 0x7f800000;
    auVar157._28_4_ = 0x7f800000;
    auVar132 = vblendvps_avx(auVar157,auVar132,auVar108);
    auVar26 = vshufps_avx(auVar132,auVar132,0xb1);
    auVar26 = vminps_avx(auVar132,auVar26);
    auVar22 = vshufpd_avx(auVar26,auVar26,5);
    auVar26 = vminps_avx(auVar26,auVar22);
    auVar22 = vperm2f128_avx(auVar26,auVar26,1);
    auVar26 = vminps_avx(auVar26,auVar22);
    auVar132 = vcmpps_avx(auVar132,auVar26,0);
    auVar26 = auVar108 & auVar132;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar108 = vandps_avx(auVar132,auVar108);
    }
    auVar121._8_8_ = 0;
    auVar121._0_8_ = (&uStack_140)[uVar84 * 0xc];
    local_c88 = auStack_138[uVar84 * 0x18];
    uVar90 = vmovmskps_avx(auVar108);
    uVar82 = 0;
    if (uVar90 != 0) {
      for (; (uVar90 >> uVar82 & 1) == 0; uVar82 = uVar82 + 1) {
      }
    }
    *(undefined4 *)(local_7e0 + (ulong)uVar82 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar87) = _local_7e0;
    uVar90 = uVar91 - 1;
    if ((((((((_local_7e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_7e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_7e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_7e0 >> 0x7f,0) != '\0') ||
          (_local_7e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_7e0 >> 0xbf,0) != '\0') ||
        (_local_7e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_7e0[0x1f] < '\0') {
      uVar90 = uVar91;
    }
    auVar178 = vshufps_avx(auVar121,auVar121,0);
    auVar195 = vshufps_avx(auVar121,auVar121,0x55);
    auVar195 = vsubps_avx(auVar195,auVar178);
    local_460._4_4_ = auVar178._4_4_ + auVar195._4_4_ * 0.14285715;
    local_460._0_4_ = auVar178._0_4_ + auVar195._0_4_ * 0.0;
    fStack_458 = auVar178._8_4_ + auVar195._8_4_ * 0.2857143;
    fStack_454 = auVar178._12_4_ + auVar195._12_4_ * 0.42857146;
    fStack_450 = auVar178._0_4_ + auVar195._0_4_ * 0.5714286;
    fStack_44c = auVar178._4_4_ + auVar195._4_4_ * 0.71428573;
    fStack_448 = auVar178._8_4_ + auVar195._8_4_ * 0.8571429;
    fStack_444 = auVar178._12_4_ + auVar195._12_4_;
    auVar162 = ZEXT864(*(ulong *)(local_460 + (ulong)uVar82 * 4));
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }